

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

bool embree::avx::CurveNiMBIntersectorK<4,8>::
     occluded_t<embree::avx::SweepCurve1IntersectorK<embree::BSplineCurveT,8>,embree::avx::Occluded1KEpilog1<8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  undefined4 uVar8;
  undefined8 uVar9;
  undefined1 auVar10 [32];
  Primitive PVar11;
  Geometry *pGVar12;
  __int_type_conflict _Var13;
  long lVar14;
  long lVar15;
  RTCRayQueryContext *pRVar16;
  RTCFilterFunctionN p_Var17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  bool bVar73;
  bool bVar74;
  undefined1 auVar75 [12];
  bool bVar76;
  bool bVar77;
  bool bVar78;
  bool bVar79;
  bool bVar80;
  bool bVar81;
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  uint uVar96;
  uint uVar97;
  ulong uVar98;
  ulong uVar99;
  uint uVar100;
  byte bVar101;
  uint uVar102;
  long lVar103;
  ulong uVar104;
  ulong uVar105;
  long lVar106;
  float fVar107;
  float fVar143;
  float fVar144;
  vint4 bi_2;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  float fVar146;
  float fVar147;
  float fVar148;
  undefined1 auVar126 [32];
  float fVar145;
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [64];
  undefined1 extraout_var [60];
  float fVar149;
  float fVar184;
  float fVar186;
  vint4 bi_1;
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  float fVar150;
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  float fVar188;
  undefined1 auVar165 [32];
  float fVar185;
  float fVar187;
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  float fVar189;
  float fVar210;
  float fVar211;
  vint4 bi;
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  float fVar212;
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  float fVar213;
  float fVar226;
  float fVar227;
  vint4 ai_1;
  undefined1 auVar214 [16];
  float fVar228;
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [28];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  float fVar229;
  float fVar246;
  float fVar247;
  vint4 ai_2;
  undefined1 auVar230 [16];
  float fVar248;
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar244 [32];
  undefined1 auVar245 [64];
  float fVar249;
  float fVar263;
  float fVar264;
  undefined1 auVar250 [16];
  float fVar265;
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  float fVar266;
  float fVar267;
  float fVar269;
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  float fVar268;
  float fVar270;
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  float fVar271;
  float fVar272;
  float fVar284;
  float fVar288;
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  float fVar285;
  float fVar286;
  float fVar289;
  float fVar290;
  float fVar292;
  float fVar293;
  float fVar294;
  float fVar297;
  float fVar298;
  float fVar301;
  float fVar302;
  float fVar305;
  float fVar306;
  float fVar308;
  undefined1 auVar278 [32];
  float fVar287;
  float fVar291;
  float fVar295;
  float fVar299;
  float fVar303;
  float fVar307;
  undefined1 auVar279 [32];
  undefined1 auVar280 [32];
  undefined1 auVar281 [32];
  undefined1 auVar282 [32];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  float fVar296;
  float fVar300;
  float fVar304;
  undefined1 auVar283 [64];
  float fVar309;
  float fVar319;
  float fVar320;
  vint4 ai;
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  float fVar322;
  undefined1 auVar315 [32];
  float fVar321;
  float fVar323;
  float fVar325;
  float fVar327;
  float fVar329;
  undefined1 auVar316 [32];
  undefined1 auVar317 [32];
  float fVar324;
  float fVar326;
  float fVar328;
  float fVar330;
  undefined1 auVar318 [64];
  float fVar331;
  float fVar343;
  float fVar345;
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  float fVar332;
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [28];
  float fVar344;
  float fVar346;
  float fVar347;
  float fVar348;
  float fVar349;
  float fVar350;
  float fVar351;
  float fVar352;
  float fVar353;
  float fVar354;
  float fVar355;
  float fVar356;
  undefined1 auVar338 [32];
  undefined1 auVar339 [32];
  undefined1 auVar340 [32];
  undefined1 auVar341 [32];
  undefined1 auVar342 [32];
  undefined1 auVar357 [16];
  float fVar359;
  float fVar360;
  float fVar361;
  float fVar362;
  float fVar363;
  undefined1 auVar358 [64];
  undefined1 auVar364 [16];
  undefined1 auVar365 [32];
  undefined1 auVar366 [64];
  float fVar367;
  float fVar372;
  float fVar373;
  undefined1 auVar368 [16];
  undefined1 auVar369 [16];
  float fVar374;
  float fVar375;
  float fVar376;
  float fVar377;
  float fVar378;
  undefined1 auVar370 [32];
  float fVar379;
  float fVar385;
  float fVar386;
  undefined1 auVar380 [16];
  undefined1 auVar381 [16];
  float fVar387;
  float fVar388;
  float fVar389;
  float fVar390;
  undefined1 auVar382 [32];
  undefined1 auVar383 [32];
  float fVar391;
  float fVar399;
  float fVar401;
  undefined1 auVar393 [16];
  undefined1 auVar394 [16];
  float fVar392;
  float fVar400;
  float fVar402;
  float fVar403;
  float fVar404;
  float fVar405;
  float fVar406;
  float fVar407;
  float fVar408;
  float fVar409;
  float fVar410;
  undefined1 auVar395 [32];
  undefined1 auVar396 [32];
  undefined1 auVar397 [32];
  undefined1 auVar398 [32];
  float fVar411;
  float fVar415;
  float fVar416;
  float fVar417;
  float fVar418;
  float fVar419;
  float fVar420;
  undefined1 auVar412 [32];
  undefined1 auVar413 [32];
  undefined1 auVar414 [32];
  float fVar421;
  float fVar424;
  float fVar425;
  float fVar426;
  float fVar427;
  float fVar428;
  float fVar429;
  undefined1 auVar422 [28];
  undefined1 auVar423 [32];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  vboolx_conflict valid;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  bool local_c89;
  undefined1 local_c80 [8];
  float fStack_c78;
  float fStack_c74;
  float fStack_c70;
  float fStack_c6c;
  float fStack_c68;
  float fStack_c64;
  undefined8 local_b60;
  undefined8 uStack_b58;
  undefined8 local_b50;
  undefined8 uStack_b48;
  undefined1 local_b40 [8];
  float fStack_b38;
  float fStack_b34;
  undefined1 local_b30 [8];
  float fStack_b28;
  float fStack_b24;
  undefined1 local_b20 [8];
  float fStack_b18;
  float fStack_b14;
  undefined1 local_b10 [8];
  float fStack_b08;
  float fStack_b04;
  undefined1 local_b00 [8];
  float fStack_af8;
  float fStack_af4;
  float fStack_af0;
  float fStack_aec;
  float fStack_ae8;
  float fStack_ae4;
  undefined1 local_ae0 [8];
  float fStack_ad8;
  float fStack_ad4;
  undefined1 auStack_ad0 [16];
  undefined1 local_ac0 [8];
  float fStack_ab8;
  float fStack_ab4;
  float fStack_ab0;
  float fStack_aac;
  float fStack_aa8;
  float fStack_aa4;
  undefined1 local_aa0 [32];
  undefined1 local_a80 [32];
  undefined8 *local_a50;
  undefined8 *local_a48;
  undefined1 (*local_a40) [32];
  ulong local_a38;
  RTCFilterFunctionNArguments local_a30;
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [8];
  float fStack_998;
  float fStack_994;
  float fStack_990;
  float fStack_98c;
  float fStack_988;
  float fStack_984;
  undefined1 local_980 [16];
  undefined1 local_970 [8];
  float fStack_968;
  float fStack_964;
  undefined1 local_960 [32];
  float local_940;
  float fStack_93c;
  float fStack_938;
  float fStack_934;
  float fStack_930;
  float fStack_92c;
  float fStack_928;
  float fStack_924;
  undefined1 local_920 [8];
  float fStack_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  float fStack_908;
  float fStack_904;
  undefined1 local_8f0 [16];
  undefined1 local_8e0 [16];
  Primitive *local_8d0;
  ulong local_8c8;
  undefined1 local_8c0 [16];
  undefined1 auStack_8b0 [16];
  undefined1 local_8a0 [32];
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  float fStack_864;
  undefined1 local_860 [8];
  float fStack_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  float fStack_844;
  undefined1 local_840 [8];
  float fStack_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  float fStack_824;
  undefined1 local_820 [32];
  undefined1 local_800 [8];
  float fStack_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float fStack_7e8;
  float fStack_7e4;
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [8];
  float fStack_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float fStack_768;
  undefined1 local_760 [8];
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  ulong local_740;
  undefined1 auStack_738 [24];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  float local_660 [4];
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  float local_640 [4];
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  float fStack_624;
  undefined1 local_610 [16];
  RTCHitN local_600 [16];
  undefined1 auStack_5f0 [16];
  undefined1 local_5e0 [16];
  undefined1 local_5d0 [16];
  undefined1 local_5c0 [16];
  undefined1 local_5b0 [16];
  undefined1 local_5a0 [16];
  undefined1 local_590 [16];
  undefined1 local_580 [32];
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  uint local_520;
  uint uStack_51c;
  uint uStack_518;
  uint uStack_514;
  uint uStack_510;
  uint uStack_50c;
  uint uStack_508;
  uint uStack_504;
  uint local_500;
  uint uStack_4fc;
  uint uStack_4f8;
  uint uStack_4f4;
  uint uStack_4f0;
  uint uStack_4ec;
  uint uStack_4e8;
  uint uStack_4e4;
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  undefined1 local_320 [32];
  undefined1 local_300 [8];
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  undefined4 uStack_1a4;
  undefined1 local_1a0 [8];
  float fStack_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  undefined4 uStack_184;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  float afStack_140 [2];
  uint auStack_138 [66];
  undefined1 auVar371 [64];
  undefined1 auVar384 [64];
  
  PVar11 = prim[1];
  uVar98 = (ulong)(byte)PVar11;
  lVar106 = uVar98 * 0x25;
  auVar155 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x10);
  auVar155 = vinsertps_avx(auVar155,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar18 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar18 = vinsertps_avx(auVar18,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  fVar149 = *(float *)(prim + lVar106 + 0x12);
  auVar155 = vsubps_avx(auVar155,*(undefined1 (*) [16])(prim + lVar106 + 6));
  auVar151._0_4_ = fVar149 * auVar155._0_4_;
  auVar151._4_4_ = fVar149 * auVar155._4_4_;
  auVar151._8_4_ = fVar149 * auVar155._8_4_;
  auVar151._12_4_ = fVar149 * auVar155._12_4_;
  auVar310._0_4_ = fVar149 * auVar18._0_4_;
  auVar310._4_4_ = fVar149 * auVar18._4_4_;
  auVar310._8_4_ = fVar149 * auVar18._8_4_;
  auVar310._12_4_ = fVar149 * auVar18._12_4_;
  auVar155 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar98 * 4 + 6)));
  auVar155 = vcvtdq2ps_avx(auVar155);
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar98 * 5 + 6)));
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar158 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar98 * 6 + 6)));
  auVar158 = vcvtdq2ps_avx(auVar158);
  auVar119 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar98 * 0xf + 6)));
  auVar119 = vcvtdq2ps_avx(auVar119);
  auVar114 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar11 * 0x10 + 6)));
  auVar114 = vcvtdq2ps_avx(auVar114);
  auVar121 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar11 * 0x10 + uVar98 + 6)));
  auVar113 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar98 * 0x1a + 6)));
  auVar121 = vcvtdq2ps_avx(auVar121);
  auVar120 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar98 * 0x1b + 6)));
  auVar113 = vcvtdq2ps_avx(auVar113);
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar98 * 0x1c + 6)));
  auVar120 = vcvtdq2ps_avx(auVar120);
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar20 = vshufps_avx(auVar310,auVar310,0);
  auVar21 = vshufps_avx(auVar310,auVar310,0x55);
  auVar22 = vshufps_avx(auVar310,auVar310,0xaa);
  fVar149 = auVar22._0_4_;
  fVar150 = auVar22._4_4_;
  fVar185 = auVar22._8_4_;
  fVar187 = auVar22._12_4_;
  fVar229 = auVar21._0_4_;
  fVar246 = auVar21._4_4_;
  fVar247 = auVar21._8_4_;
  fVar248 = auVar21._12_4_;
  fVar213 = auVar20._0_4_;
  fVar226 = auVar20._4_4_;
  fVar227 = auVar20._8_4_;
  fVar228 = auVar20._12_4_;
  auVar380._0_4_ = fVar213 * auVar155._0_4_ + fVar229 * auVar18._0_4_ + fVar149 * auVar158._0_4_;
  auVar380._4_4_ = fVar226 * auVar155._4_4_ + fVar246 * auVar18._4_4_ + fVar150 * auVar158._4_4_;
  auVar380._8_4_ = fVar227 * auVar155._8_4_ + fVar247 * auVar18._8_4_ + fVar185 * auVar158._8_4_;
  auVar380._12_4_ = fVar228 * auVar155._12_4_ + fVar248 * auVar18._12_4_ + fVar187 * auVar158._12_4_
  ;
  auVar393._0_4_ = fVar213 * auVar119._0_4_ + fVar229 * auVar114._0_4_ + auVar121._0_4_ * fVar149;
  auVar393._4_4_ = fVar226 * auVar119._4_4_ + fVar246 * auVar114._4_4_ + auVar121._4_4_ * fVar150;
  auVar393._8_4_ = fVar227 * auVar119._8_4_ + fVar247 * auVar114._8_4_ + auVar121._8_4_ * fVar185;
  auVar393._12_4_ =
       fVar228 * auVar119._12_4_ + fVar248 * auVar114._12_4_ + auVar121._12_4_ * fVar187;
  auVar311._0_4_ = fVar213 * auVar113._0_4_ + fVar229 * auVar120._0_4_ + auVar19._0_4_ * fVar149;
  auVar311._4_4_ = fVar226 * auVar113._4_4_ + fVar246 * auVar120._4_4_ + auVar19._4_4_ * fVar150;
  auVar311._8_4_ = fVar227 * auVar113._8_4_ + fVar247 * auVar120._8_4_ + auVar19._8_4_ * fVar185;
  auVar311._12_4_ = fVar228 * auVar113._12_4_ + fVar248 * auVar120._12_4_ + auVar19._12_4_ * fVar187
  ;
  auVar20 = vshufps_avx(auVar151,auVar151,0);
  auVar21 = vshufps_avx(auVar151,auVar151,0x55);
  auVar22 = vshufps_avx(auVar151,auVar151,0xaa);
  fVar149 = auVar22._0_4_;
  fVar150 = auVar22._4_4_;
  fVar185 = auVar22._8_4_;
  fVar187 = auVar22._12_4_;
  fVar229 = auVar21._0_4_;
  fVar246 = auVar21._4_4_;
  fVar247 = auVar21._8_4_;
  fVar248 = auVar21._12_4_;
  fVar213 = auVar20._0_4_;
  fVar226 = auVar20._4_4_;
  fVar227 = auVar20._8_4_;
  fVar228 = auVar20._12_4_;
  auVar190._0_4_ = fVar213 * auVar155._0_4_ + fVar229 * auVar18._0_4_ + fVar149 * auVar158._0_4_;
  auVar190._4_4_ = fVar226 * auVar155._4_4_ + fVar246 * auVar18._4_4_ + fVar150 * auVar158._4_4_;
  auVar190._8_4_ = fVar227 * auVar155._8_4_ + fVar247 * auVar18._8_4_ + fVar185 * auVar158._8_4_;
  auVar190._12_4_ = fVar228 * auVar155._12_4_ + fVar248 * auVar18._12_4_ + fVar187 * auVar158._12_4_
  ;
  auVar152._0_4_ = fVar213 * auVar119._0_4_ + auVar121._0_4_ * fVar149 + fVar229 * auVar114._0_4_;
  auVar152._4_4_ = fVar226 * auVar119._4_4_ + auVar121._4_4_ * fVar150 + fVar246 * auVar114._4_4_;
  auVar152._8_4_ = fVar227 * auVar119._8_4_ + auVar121._8_4_ * fVar185 + fVar247 * auVar114._8_4_;
  auVar152._12_4_ =
       fVar228 * auVar119._12_4_ + auVar121._12_4_ * fVar187 + fVar248 * auVar114._12_4_;
  auVar108._0_4_ = fVar213 * auVar113._0_4_ + fVar229 * auVar120._0_4_ + auVar19._0_4_ * fVar149;
  auVar108._4_4_ = fVar226 * auVar113._4_4_ + fVar246 * auVar120._4_4_ + auVar19._4_4_ * fVar150;
  auVar108._8_4_ = fVar227 * auVar113._8_4_ + fVar247 * auVar120._8_4_ + auVar19._8_4_ * fVar185;
  auVar108._12_4_ = fVar228 * auVar113._12_4_ + fVar248 * auVar120._12_4_ + auVar19._12_4_ * fVar187
  ;
  auVar273._8_4_ = 0x7fffffff;
  auVar273._0_8_ = 0x7fffffff7fffffff;
  auVar273._12_4_ = 0x7fffffff;
  auVar155 = vandps_avx(auVar380,auVar273);
  auVar230._8_4_ = 0x219392ef;
  auVar230._0_8_ = 0x219392ef219392ef;
  auVar230._12_4_ = 0x219392ef;
  auVar155 = vcmpps_avx(auVar155,auVar230,1);
  auVar18 = vblendvps_avx(auVar380,auVar230,auVar155);
  auVar155 = vandps_avx(auVar393,auVar273);
  auVar155 = vcmpps_avx(auVar155,auVar230,1);
  auVar158 = vblendvps_avx(auVar393,auVar230,auVar155);
  auVar155 = vandps_avx(auVar311,auVar273);
  auVar155 = vcmpps_avx(auVar155,auVar230,1);
  auVar155 = vblendvps_avx(auVar311,auVar230,auVar155);
  auVar119 = vrcpps_avx(auVar18);
  fVar213 = auVar119._0_4_;
  auVar214._0_4_ = fVar213 * auVar18._0_4_;
  fVar226 = auVar119._4_4_;
  auVar214._4_4_ = fVar226 * auVar18._4_4_;
  fVar227 = auVar119._8_4_;
  auVar214._8_4_ = fVar227 * auVar18._8_4_;
  fVar228 = auVar119._12_4_;
  auVar214._12_4_ = fVar228 * auVar18._12_4_;
  auVar312._8_4_ = 0x3f800000;
  auVar312._0_8_ = &DAT_3f8000003f800000;
  auVar312._12_4_ = 0x3f800000;
  auVar18 = vsubps_avx(auVar312,auVar214);
  fVar213 = fVar213 + fVar213 * auVar18._0_4_;
  fVar226 = fVar226 + fVar226 * auVar18._4_4_;
  fVar227 = fVar227 + fVar227 * auVar18._8_4_;
  fVar228 = fVar228 + fVar228 * auVar18._12_4_;
  auVar18 = vrcpps_avx(auVar158);
  fVar229 = auVar18._0_4_;
  auVar250._0_4_ = fVar229 * auVar158._0_4_;
  fVar246 = auVar18._4_4_;
  auVar250._4_4_ = fVar246 * auVar158._4_4_;
  fVar247 = auVar18._8_4_;
  auVar250._8_4_ = fVar247 * auVar158._8_4_;
  fVar248 = auVar18._12_4_;
  auVar250._12_4_ = fVar248 * auVar158._12_4_;
  auVar18 = vsubps_avx(auVar312,auVar250);
  fVar229 = fVar229 + fVar229 * auVar18._0_4_;
  fVar246 = fVar246 + fVar246 * auVar18._4_4_;
  fVar247 = fVar247 + fVar247 * auVar18._8_4_;
  fVar248 = fVar248 + fVar248 * auVar18._12_4_;
  auVar18 = vrcpps_avx(auVar155);
  fVar249 = auVar18._0_4_;
  auVar274._0_4_ = fVar249 * auVar155._0_4_;
  fVar263 = auVar18._4_4_;
  auVar274._4_4_ = fVar263 * auVar155._4_4_;
  fVar264 = auVar18._8_4_;
  auVar274._8_4_ = fVar264 * auVar155._8_4_;
  fVar265 = auVar18._12_4_;
  auVar274._12_4_ = fVar265 * auVar155._12_4_;
  auVar155 = vsubps_avx(auVar312,auVar274);
  fVar249 = fVar249 + fVar249 * auVar155._0_4_;
  fVar263 = fVar263 + fVar263 * auVar155._4_4_;
  fVar264 = fVar264 + fVar264 * auVar155._8_4_;
  fVar265 = fVar265 + fVar265 * auVar155._12_4_;
  auVar155 = ZEXT416((uint)((*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar106 + 0x16)) *
                           *(float *)(prim + lVar106 + 0x1a)));
  auVar158 = vshufps_avx(auVar155,auVar155,0);
  auVar155._8_8_ = 0;
  auVar155._0_8_ = *(ulong *)(prim + uVar98 * 7 + 6);
  auVar155 = vpmovsxwd_avx(auVar155);
  auVar155 = vcvtdq2ps_avx(auVar155);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar98 * 0xb + 6);
  auVar18 = vpmovsxwd_avx(auVar18);
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar18 = vsubps_avx(auVar18,auVar155);
  fVar149 = auVar158._0_4_;
  fVar150 = auVar158._4_4_;
  fVar185 = auVar158._8_4_;
  fVar187 = auVar158._12_4_;
  auVar313._0_4_ = auVar18._0_4_ * fVar149 + auVar155._0_4_;
  auVar313._4_4_ = auVar18._4_4_ * fVar150 + auVar155._4_4_;
  auVar313._8_4_ = auVar18._8_4_ * fVar185 + auVar155._8_4_;
  auVar313._12_4_ = auVar18._12_4_ * fVar187 + auVar155._12_4_;
  auVar158._8_8_ = 0;
  auVar158._0_8_ = *(ulong *)(prim + uVar98 * 9 + 6);
  auVar155 = vpmovsxwd_avx(auVar158);
  auVar155 = vcvtdq2ps_avx(auVar155);
  auVar119._8_8_ = 0;
  auVar119._0_8_ = *(ulong *)(prim + uVar98 * 0xd + 6);
  auVar18 = vpmovsxwd_avx(auVar119);
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar18 = vsubps_avx(auVar18,auVar155);
  auVar333._0_4_ = auVar18._0_4_ * fVar149 + auVar155._0_4_;
  auVar333._4_4_ = auVar18._4_4_ * fVar150 + auVar155._4_4_;
  auVar333._8_4_ = auVar18._8_4_ * fVar185 + auVar155._8_4_;
  auVar333._12_4_ = auVar18._12_4_ * fVar187 + auVar155._12_4_;
  auVar114._8_8_ = 0;
  auVar114._0_8_ = *(ulong *)(prim + uVar98 * 0x12 + 6);
  auVar155 = vpmovsxwd_avx(auVar114);
  auVar155 = vcvtdq2ps_avx(auVar155);
  uVar105 = (ulong)(uint)((int)(uVar98 * 5) << 2);
  auVar121._8_8_ = 0;
  auVar121._0_8_ = *(ulong *)(prim + uVar98 * 2 + uVar105 + 6);
  auVar18 = vpmovsxwd_avx(auVar121);
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar18 = vsubps_avx(auVar18,auVar155);
  auVar357._0_4_ = auVar18._0_4_ * fVar149 + auVar155._0_4_;
  auVar357._4_4_ = auVar18._4_4_ * fVar150 + auVar155._4_4_;
  auVar357._8_4_ = auVar18._8_4_ * fVar185 + auVar155._8_4_;
  auVar357._12_4_ = auVar18._12_4_ * fVar187 + auVar155._12_4_;
  auVar113._8_8_ = 0;
  auVar113._0_8_ = *(ulong *)(prim + uVar105 + 6);
  auVar155 = vpmovsxwd_avx(auVar113);
  auVar120._8_8_ = 0;
  auVar120._0_8_ = *(ulong *)(prim + uVar98 * 0x18 + 6);
  auVar18 = vpmovsxwd_avx(auVar120);
  auVar155 = vcvtdq2ps_avx(auVar155);
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar18 = vsubps_avx(auVar18,auVar155);
  auVar364._0_4_ = auVar18._0_4_ * fVar149 + auVar155._0_4_;
  auVar364._4_4_ = auVar18._4_4_ * fVar150 + auVar155._4_4_;
  auVar364._8_4_ = auVar18._8_4_ * fVar185 + auVar155._8_4_;
  auVar364._12_4_ = auVar18._12_4_ * fVar187 + auVar155._12_4_;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar98 * 0x1d + 6);
  auVar155 = vpmovsxwd_avx(auVar19);
  auVar155 = vcvtdq2ps_avx(auVar155);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar98 + (ulong)(byte)PVar11 * 0x20 + 6);
  auVar18 = vpmovsxwd_avx(auVar20);
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar158 = vsubps_avx(auVar18,auVar155);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar11 * 0x20 - uVar98) + 6);
  auVar18 = vpmovsxwd_avx(auVar21);
  auVar368._0_4_ = auVar158._0_4_ * fVar149 + auVar155._0_4_;
  auVar368._4_4_ = auVar158._4_4_ * fVar150 + auVar155._4_4_;
  auVar368._8_4_ = auVar158._8_4_ * fVar185 + auVar155._8_4_;
  auVar368._12_4_ = auVar158._12_4_ * fVar187 + auVar155._12_4_;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar98 * 0x23 + 6);
  auVar158 = vpmovsxwd_avx(auVar22);
  auVar155 = vcvtdq2ps_avx(auVar18);
  auVar18 = vcvtdq2ps_avx(auVar158);
  auVar18 = vsubps_avx(auVar18,auVar155);
  auVar275._0_4_ = auVar155._0_4_ + auVar18._0_4_ * fVar149;
  auVar275._4_4_ = auVar155._4_4_ + auVar18._4_4_ * fVar150;
  auVar275._8_4_ = auVar155._8_4_ + auVar18._8_4_ * fVar185;
  auVar275._12_4_ = auVar155._12_4_ + auVar18._12_4_ * fVar187;
  auVar155 = vsubps_avx(auVar313,auVar190);
  auVar314._0_4_ = fVar213 * auVar155._0_4_;
  auVar314._4_4_ = fVar226 * auVar155._4_4_;
  auVar314._8_4_ = fVar227 * auVar155._8_4_;
  auVar314._12_4_ = fVar228 * auVar155._12_4_;
  auVar155 = vsubps_avx(auVar333,auVar190);
  auVar191._0_4_ = fVar213 * auVar155._0_4_;
  auVar191._4_4_ = fVar226 * auVar155._4_4_;
  auVar191._8_4_ = fVar227 * auVar155._8_4_;
  auVar191._12_4_ = fVar228 * auVar155._12_4_;
  auVar155 = vsubps_avx(auVar357,auVar152);
  auVar215._0_4_ = fVar229 * auVar155._0_4_;
  auVar215._4_4_ = fVar246 * auVar155._4_4_;
  auVar215._8_4_ = fVar247 * auVar155._8_4_;
  auVar215._12_4_ = fVar248 * auVar155._12_4_;
  auVar155 = vsubps_avx(auVar364,auVar152);
  auVar153._0_4_ = fVar229 * auVar155._0_4_;
  auVar153._4_4_ = fVar246 * auVar155._4_4_;
  auVar153._8_4_ = fVar247 * auVar155._8_4_;
  auVar153._12_4_ = fVar248 * auVar155._12_4_;
  auVar155 = vsubps_avx(auVar368,auVar108);
  auVar231._0_4_ = fVar249 * auVar155._0_4_;
  auVar231._4_4_ = fVar263 * auVar155._4_4_;
  auVar231._8_4_ = fVar264 * auVar155._8_4_;
  auVar231._12_4_ = fVar265 * auVar155._12_4_;
  auVar155 = vsubps_avx(auVar275,auVar108);
  auVar109._0_4_ = fVar249 * auVar155._0_4_;
  auVar109._4_4_ = fVar263 * auVar155._4_4_;
  auVar109._8_4_ = fVar264 * auVar155._8_4_;
  auVar109._12_4_ = fVar265 * auVar155._12_4_;
  auVar155 = vpminsd_avx(auVar314,auVar191);
  auVar18 = vpminsd_avx(auVar215,auVar153);
  auVar155 = vmaxps_avx(auVar155,auVar18);
  auVar18 = vpminsd_avx(auVar231,auVar109);
  uVar8 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar334._4_4_ = uVar8;
  auVar334._0_4_ = uVar8;
  auVar334._8_4_ = uVar8;
  auVar334._12_4_ = uVar8;
  auVar18 = vmaxps_avx(auVar18,auVar334);
  auVar155 = vmaxps_avx(auVar155,auVar18);
  local_610._0_4_ = auVar155._0_4_ * 0.99999964;
  local_610._4_4_ = auVar155._4_4_ * 0.99999964;
  local_610._8_4_ = auVar155._8_4_ * 0.99999964;
  local_610._12_4_ = auVar155._12_4_ * 0.99999964;
  auVar155 = vpmaxsd_avx(auVar314,auVar191);
  auVar18 = vpmaxsd_avx(auVar215,auVar153);
  auVar155 = vminps_avx(auVar155,auVar18);
  auVar18 = vpmaxsd_avx(auVar231,auVar109);
  uVar8 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar192._4_4_ = uVar8;
  auVar192._0_4_ = uVar8;
  auVar192._8_4_ = uVar8;
  auVar192._12_4_ = uVar8;
  auVar18 = vminps_avx(auVar18,auVar192);
  auVar155 = vminps_avx(auVar155,auVar18);
  auVar110._0_4_ = auVar155._0_4_ * 1.0000004;
  auVar110._4_4_ = auVar155._4_4_ * 1.0000004;
  auVar110._8_4_ = auVar155._8_4_ * 1.0000004;
  auVar110._12_4_ = auVar155._12_4_ * 1.0000004;
  auVar155 = vpshufd_avx(ZEXT116((byte)PVar11),0);
  auVar18 = vpcmpgtd_avx(auVar155,_DAT_01ff0cf0);
  auVar155 = vcmpps_avx(local_610,auVar110,2);
  auVar155 = vandps_avx(auVar155,auVar18);
  uVar96 = vmovmskps_avx(auVar155);
  local_c89 = uVar96 != 0;
  if (uVar96 == 0) {
    return local_c89;
  }
  uVar96 = uVar96 & 0xff;
  auVar131._16_16_ = mm_lookupmask_ps._240_16_;
  auVar131._0_16_ = mm_lookupmask_ps._240_16_;
  local_480 = vblendps_avx(auVar131,ZEXT832(0) << 0x20,0x80);
  uVar100 = 1 << ((byte)k & 0x1f);
  local_a40 = (undefined1 (*) [32])&local_520;
  local_a48 = (undefined8 *)(mm_lookupmask_ps + ((uVar100 & 0xf) << 4));
  local_a50 = (undefined8 *)(mm_lookupmask_ps + (long)((int)uVar100 >> 4) * 0x10);
  local_8d0 = prim;
LAB_01015759:
  local_8c8 = (ulong)uVar96;
  lVar106 = 0;
  if (local_8c8 != 0) {
    for (; (uVar96 >> lVar106 & 1) == 0; lVar106 = lVar106 + 1) {
    }
  }
  local_a38 = (ulong)*(uint *)(local_8d0 + 2);
  pGVar12 = (context->scene->geometries).items[local_a38].ptr;
  uVar105 = (ulong)*(uint *)(*(long *)&pGVar12->field_0x58 +
                            (ulong)*(uint *)(local_8d0 + lVar106 * 4 + 6) *
                            pGVar12[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                            _M_i);
  fVar149 = (pGVar12->time_range).lower;
  fVar149 = pGVar12->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0xe0) - fVar149) / ((pGVar12->time_range).upper - fVar149));
  auVar155 = vroundss_avx(ZEXT416((uint)fVar149),ZEXT416((uint)fVar149),9);
  auVar155 = vminss_avx(auVar155,ZEXT416((uint)(pGVar12->fnumTimeSegments + -1.0)));
  auVar155 = vmaxss_avx(ZEXT816(0) << 0x20,auVar155);
  fVar149 = fVar149 - auVar155._0_4_;
  _Var13 = pGVar12[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar103 = (long)(int)auVar155._0_4_ * 0x38;
  lVar14 = *(long *)(_Var13 + 0x10 + lVar103);
  uVar98 = *(ulong *)(_Var13 + 0x38 + lVar103);
  lVar15 = *(long *)(_Var13 + 0x48 + lVar103);
  auVar155 = vshufps_avx(ZEXT416((uint)fVar149),ZEXT416((uint)fVar149),0);
  pfVar1 = (float *)(uVar98 + uVar105 * lVar15);
  fVar226 = auVar155._0_4_;
  fVar227 = auVar155._4_4_;
  fVar228 = auVar155._8_4_;
  fVar229 = auVar155._12_4_;
  pfVar2 = (float *)(uVar98 + (uVar105 + 1) * lVar15);
  pfVar3 = (float *)(uVar98 + (uVar105 + 2) * lVar15);
  pfVar4 = (float *)(uVar98 + lVar15 * (uVar105 + 3));
  lVar15 = *(long *)(_Var13 + lVar103);
  auVar155 = vshufps_avx(ZEXT416((uint)(1.0 - fVar149)),ZEXT416((uint)(1.0 - fVar149)),0);
  pfVar5 = (float *)(lVar15 + lVar14 * uVar105);
  fVar150 = auVar155._0_4_;
  fVar185 = auVar155._4_4_;
  fVar187 = auVar155._8_4_;
  fVar213 = auVar155._12_4_;
  pfVar6 = (float *)(lVar15 + lVar14 * (uVar105 + 1));
  pfVar7 = (float *)(lVar15 + lVar14 * (uVar105 + 2));
  auVar193._0_4_ = fVar226 * *pfVar1 + fVar150 * *pfVar5;
  auVar193._4_4_ = fVar227 * pfVar1[1] + fVar185 * pfVar5[1];
  auVar193._8_4_ = fVar228 * pfVar1[2] + fVar187 * pfVar5[2];
  auVar193._12_4_ = fVar229 * pfVar1[3] + fVar213 * pfVar5[3];
  auVar154._0_4_ = fVar150 * *pfVar6 + fVar226 * *pfVar2;
  auVar154._4_4_ = fVar185 * pfVar6[1] + fVar227 * pfVar2[1];
  auVar154._8_4_ = fVar187 * pfVar6[2] + fVar228 * pfVar2[2];
  auVar154._12_4_ = fVar213 * pfVar6[3] + fVar229 * pfVar2[3];
  pfVar1 = (float *)(lVar15 + lVar14 * (uVar105 + 3));
  auVar216._0_4_ = fVar150 * *pfVar7 + fVar226 * *pfVar3;
  auVar216._4_4_ = fVar185 * pfVar7[1] + fVar227 * pfVar3[1];
  auVar216._8_4_ = fVar187 * pfVar7[2] + fVar228 * pfVar3[2];
  auVar216._12_4_ = fVar213 * pfVar7[3] + fVar229 * pfVar3[3];
  auVar155 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x1c);
  auVar18 = vinsertps_avx(auVar155,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  fVar149 = *(float *)(ray + k * 4 + 0x80);
  auVar369._4_4_ = fVar149;
  auVar369._0_4_ = fVar149;
  auVar369._8_4_ = fVar149;
  auVar369._12_4_ = fVar149;
  fStack_830 = fVar149;
  _local_840 = auVar369;
  fStack_82c = fVar149;
  fStack_828 = fVar149;
  fStack_824 = fVar149;
  auVar371 = ZEXT3264(_local_840);
  auVar251._0_4_ = fVar150 * *pfVar1 + fVar226 * *pfVar4;
  auVar251._4_4_ = fVar185 * pfVar1[1] + fVar227 * pfVar4[1];
  auVar251._8_4_ = fVar187 * pfVar1[2] + fVar228 * pfVar4[2];
  auVar251._12_4_ = fVar213 * pfVar1[3] + fVar229 * pfVar4[3];
  fVar150 = *(float *)(ray + k * 4 + 0xa0);
  auVar381._4_4_ = fVar150;
  auVar381._0_4_ = fVar150;
  auVar381._8_4_ = fVar150;
  auVar381._12_4_ = fVar150;
  fStack_af0 = fVar150;
  _local_b00 = auVar381;
  fStack_aec = fVar150;
  fStack_ae8 = fVar150;
  fStack_ae4 = fVar150;
  auVar384 = ZEXT3264(_local_b00);
  auVar155 = vunpcklps_avx(auVar369,auVar381);
  fVar185 = *(float *)(ray + k * 4 + 0xc0);
  auVar394._4_4_ = fVar185;
  auVar394._0_4_ = fVar185;
  auVar394._8_4_ = fVar185;
  auVar394._12_4_ = fVar185;
  fStack_910 = fVar185;
  _local_920 = auVar394;
  fStack_90c = fVar185;
  fStack_908 = fVar185;
  fStack_904 = fVar185;
  _local_970 = vinsertps_avx(auVar155,auVar394,0x28);
  auVar358 = ZEXT1664(_local_970);
  auVar111._0_4_ = (auVar193._0_4_ + auVar154._0_4_ + auVar216._0_4_ + auVar251._0_4_) * 0.25;
  auVar111._4_4_ = (auVar193._4_4_ + auVar154._4_4_ + auVar216._4_4_ + auVar251._4_4_) * 0.25;
  auVar111._8_4_ = (auVar193._8_4_ + auVar154._8_4_ + auVar216._8_4_ + auVar251._8_4_) * 0.25;
  auVar111._12_4_ = (auVar193._12_4_ + auVar154._12_4_ + auVar216._12_4_ + auVar251._12_4_) * 0.25;
  auVar155 = vsubps_avx(auVar111,auVar18);
  auVar155 = vdpps_avx(auVar155,_local_970,0x7f);
  local_980 = vdpps_avx(_local_970,_local_970,0x7f);
  auVar366 = ZEXT1664(local_980);
  auVar158 = vrcpss_avx(local_980,local_980);
  fVar187 = auVar155._0_4_ * auVar158._0_4_ * (2.0 - local_980._0_4_ * auVar158._0_4_);
  auVar318 = ZEXT464((uint)fVar187);
  auVar158 = vshufps_avx(ZEXT416((uint)fVar187),ZEXT416((uint)fVar187),0);
  auVar232._0_4_ = auVar18._0_4_ + local_970._0_4_ * auVar158._0_4_;
  auVar232._4_4_ = auVar18._4_4_ + local_970._4_4_ * auVar158._4_4_;
  auVar232._8_4_ = auVar18._8_4_ + local_970._8_4_ * auVar158._8_4_;
  auVar232._12_4_ = auVar18._12_4_ + local_970._12_4_ * auVar158._12_4_;
  auVar155 = vblendps_avx(auVar232,_DAT_01feba10,8);
  _local_b10 = vsubps_avx(auVar193,auVar155);
  auVar283 = ZEXT1664(_local_b10);
  _local_b20 = vsubps_avx(auVar216,auVar155);
  _local_b30 = vsubps_avx(auVar154,auVar155);
  _local_b40 = vsubps_avx(auVar251,auVar155);
  auVar155 = vshufps_avx(_local_b10,_local_b10,0);
  register0x00001250 = auVar155;
  _local_360 = auVar155;
  auVar155 = vshufps_avx(_local_b10,_local_b10,0x55);
  register0x00001250 = auVar155;
  _local_1a0 = auVar155;
  auVar155 = vshufps_avx(_local_b10,_local_b10,0xaa);
  register0x00001250 = auVar155;
  _local_1c0 = auVar155;
  auVar155 = vshufps_avx(_local_b10,_local_b10,0xff);
  register0x00001290 = auVar155;
  _local_1e0 = auVar155;
  auVar155 = vshufps_avx(_local_b30,_local_b30,0);
  register0x00001290 = auVar155;
  _local_380 = auVar155;
  auVar155 = vshufps_avx(_local_b30,_local_b30,0x55);
  register0x00001290 = auVar155;
  _local_3a0 = auVar155;
  auVar155 = vshufps_avx(_local_b30,_local_b30,0xaa);
  register0x00001290 = auVar155;
  _local_3c0 = auVar155;
  auVar155 = vshufps_avx(_local_b30,_local_b30,0xff);
  register0x00001290 = auVar155;
  _local_200 = auVar155;
  auVar155 = vshufps_avx(_local_b20,_local_b20,0);
  register0x00001290 = auVar155;
  _local_3e0 = auVar155;
  auVar155 = vshufps_avx(_local_b20,_local_b20,0x55);
  register0x00001290 = auVar155;
  _local_400 = auVar155;
  auVar155 = vshufps_avx(_local_b20,_local_b20,0xaa);
  register0x00001290 = auVar155;
  _local_420 = auVar155;
  auVar155 = vshufps_avx(_local_b20,_local_b20,0xff);
  register0x00001290 = auVar155;
  _local_440 = auVar155;
  auVar155 = vshufps_avx(_local_b40,_local_b40,0);
  register0x00001290 = auVar155;
  _local_220 = auVar155;
  auVar155 = vshufps_avx(_local_b40,_local_b40,0x55);
  register0x00001290 = auVar155;
  _local_240 = auVar155;
  auVar155 = vshufps_avx(_local_b40,_local_b40,0xaa);
  register0x00001290 = auVar155;
  _local_260 = auVar155;
  auVar155 = vshufps_avx(_local_b40,_local_b40,0xff);
  register0x00001290 = auVar155;
  _local_460 = auVar155;
  auVar155 = ZEXT416((uint)(fVar149 * fVar149 + fVar150 * fVar150 + fVar185 * fVar185));
  auVar155 = vshufps_avx(auVar155,auVar155,0);
  local_280._16_16_ = auVar155;
  local_280._0_16_ = auVar155;
  fVar149 = *(float *)(ray + k * 4 + 0x60);
  local_8f0 = ZEXT416((uint)fVar187);
  auVar155 = vshufps_avx(ZEXT416((uint)(fVar149 - fVar187)),ZEXT416((uint)(fVar149 - fVar187)),0);
  local_2a0._16_16_ = auVar155;
  local_2a0._0_16_ = auVar155;
  auVar155 = vpshufd_avx(ZEXT416(*(uint *)(local_8d0 + 2)),0);
  local_4c0._16_16_ = auVar155;
  local_4c0._0_16_ = auVar155;
  auVar155 = vpshufd_avx(ZEXT416(*(uint *)(local_8d0 + lVar106 * 4 + 6)),0);
  local_4e0._16_16_ = auVar155;
  local_4e0._0_16_ = auVar155;
  register0x00001210 = auVar158;
  _local_9a0 = auVar158;
  uVar96 = 0;
  uVar104 = 0;
  uVar105 = 1;
  auVar126._8_4_ = 0x7fffffff;
  auVar126._0_8_ = 0x7fffffff7fffffff;
  auVar126._12_4_ = 0x7fffffff;
  auVar126._16_4_ = 0x7fffffff;
  auVar126._20_4_ = 0x7fffffff;
  auVar126._24_4_ = 0x7fffffff;
  auVar126._28_4_ = 0x7fffffff;
  local_4a0 = vandps_avx(local_280,auVar126);
  auVar155 = vsqrtss_avx(local_980,local_980);
  auVar18 = vsqrtss_avx(local_980,local_980);
  local_8e0 = ZEXT816(0x3f80000000000000);
  do {
    auVar158 = vmovshdup_avx(local_8e0);
    fVar229 = auVar158._0_4_ - local_8e0._0_4_;
    auVar158 = vshufps_avx(local_8e0,local_8e0,0);
    local_7c0._16_16_ = auVar158;
    local_7c0._0_16_ = auVar158;
    auVar119 = vshufps_avx(ZEXT416((uint)fVar229),ZEXT416((uint)fVar229),0);
    local_7e0._16_16_ = auVar119;
    local_7e0._0_16_ = auVar119;
    fVar330 = auVar119._0_4_;
    fVar184 = auVar119._4_4_;
    fVar186 = auVar119._8_4_;
    fVar188 = auVar119._12_4_;
    fVar189 = auVar158._0_4_;
    auVar222._0_4_ = fVar189 + fVar330 * 0.0;
    fVar210 = auVar158._4_4_;
    auVar222._4_4_ = fVar210 + fVar184 * 0.14285715;
    fVar211 = auVar158._8_4_;
    auVar222._8_4_ = fVar211 + fVar186 * 0.2857143;
    fVar212 = auVar158._12_4_;
    auVar222._12_4_ = fVar212 + fVar188 * 0.42857146;
    auVar222._16_4_ = fVar189 + fVar330 * 0.5714286;
    auVar222._20_4_ = fVar210 + fVar184 * 0.71428573;
    auVar222._24_4_ = fVar211 + fVar186 * 0.8571429;
    auVar222._28_4_ = fVar212 + fVar188;
    auVar165._8_4_ = 0x3f800000;
    auVar165._0_8_ = &DAT_3f8000003f800000;
    auVar165._12_4_ = 0x3f800000;
    auVar165._16_4_ = 0x3f800000;
    auVar165._20_4_ = 0x3f800000;
    auVar165._24_4_ = 0x3f800000;
    auVar165._28_4_ = 0x3f800000;
    auVar131 = vsubps_avx(auVar165,auVar222);
    fVar150 = auVar131._0_4_;
    fVar185 = auVar131._4_4_;
    fVar187 = auVar131._8_4_;
    fVar213 = auVar131._12_4_;
    fVar226 = auVar131._16_4_;
    fVar227 = auVar131._20_4_;
    fVar228 = auVar131._24_4_;
    fVar247 = fVar150 * fVar150 * fVar150;
    fVar284 = fVar185 * fVar185 * fVar185;
    fVar288 = fVar187 * fVar187 * fVar187;
    fVar292 = fVar213 * fVar213 * fVar213;
    fVar296 = fVar226 * fVar226 * fVar226;
    fVar300 = fVar227 * fVar227 * fVar227;
    fVar304 = fVar228 * fVar228 * fVar228;
    fVar309 = auVar222._0_4_ * auVar222._0_4_ * auVar222._0_4_;
    fVar319 = auVar222._4_4_ * auVar222._4_4_ * auVar222._4_4_;
    fVar320 = auVar222._8_4_ * auVar222._8_4_ * auVar222._8_4_;
    fVar322 = auVar222._12_4_ * auVar222._12_4_ * auVar222._12_4_;
    fVar324 = auVar222._16_4_ * auVar222._16_4_ * auVar222._16_4_;
    fVar326 = auVar222._20_4_ * auVar222._20_4_ * auVar222._20_4_;
    fVar328 = auVar222._24_4_ * auVar222._24_4_ * auVar222._24_4_;
    fVar246 = auVar222._0_4_ * fVar150;
    fVar249 = auVar222._4_4_ * fVar185;
    fVar263 = auVar222._8_4_ * fVar187;
    fVar264 = auVar222._12_4_ * fVar213;
    fVar265 = auVar222._16_4_ * fVar226;
    fVar267 = auVar222._20_4_ * fVar227;
    fVar269 = auVar222._24_4_ * fVar228;
    fVar248 = auVar366._28_4_ + auVar384._28_4_;
    fVar355 = auVar318._28_4_ + 1.0 + fVar248;
    fVar362 = fVar248 + auVar283._28_4_ + auVar371._28_4_ + auVar358._28_4_;
    fVar248 = fVar247 * 0.16666667;
    fVar285 = fVar284 * 0.16666667;
    fVar289 = fVar288 * 0.16666667;
    fVar293 = fVar292 * 0.16666667;
    fVar297 = fVar296 * 0.16666667;
    fVar301 = fVar300 * 0.16666667;
    fVar305 = fVar304 * 0.16666667;
    fVar331 = (fVar309 + fVar247 * 4.0 + fVar150 * fVar246 * 12.0 + auVar222._0_4_ * fVar246 * 6.0)
              * 0.16666667;
    fVar343 = (fVar319 + fVar284 * 4.0 + fVar185 * fVar249 * 12.0 + auVar222._4_4_ * fVar249 * 6.0)
              * 0.16666667;
    fVar345 = (fVar320 + fVar288 * 4.0 + fVar187 * fVar263 * 12.0 + auVar222._8_4_ * fVar263 * 6.0)
              * 0.16666667;
    fVar347 = (fVar322 + fVar292 * 4.0 + fVar213 * fVar264 * 12.0 + auVar222._12_4_ * fVar264 * 6.0)
              * 0.16666667;
    fVar349 = (fVar324 + fVar296 * 4.0 + fVar226 * fVar265 * 12.0 + auVar222._16_4_ * fVar265 * 6.0)
              * 0.16666667;
    fVar351 = (fVar326 + fVar300 * 4.0 + fVar227 * fVar267 * 12.0 + auVar222._20_4_ * fVar267 * 6.0)
              * 0.16666667;
    fVar353 = (fVar328 + fVar304 * 4.0 + fVar228 * fVar269 * 12.0 + auVar222._24_4_ * fVar269 * 6.0)
              * 0.16666667;
    fVar247 = (fVar309 * 4.0 + fVar247 + auVar222._0_4_ * fVar246 * 12.0 + fVar150 * fVar246 * 6.0)
              * 0.16666667;
    fVar284 = (fVar319 * 4.0 + fVar284 + auVar222._4_4_ * fVar249 * 12.0 + fVar185 * fVar249 * 6.0)
              * 0.16666667;
    fVar288 = (fVar320 * 4.0 + fVar288 + auVar222._8_4_ * fVar263 * 12.0 + fVar187 * fVar263 * 6.0)
              * 0.16666667;
    fVar292 = (fVar322 * 4.0 + fVar292 + auVar222._12_4_ * fVar264 * 12.0 + fVar213 * fVar264 * 6.0)
              * 0.16666667;
    fVar296 = (fVar324 * 4.0 + fVar296 + auVar222._16_4_ * fVar265 * 12.0 + fVar226 * fVar265 * 6.0)
              * 0.16666667;
    fVar300 = (fVar326 * 4.0 + fVar300 + auVar222._20_4_ * fVar267 * 12.0 + fVar227 * fVar267 * 6.0)
              * 0.16666667;
    fVar304 = (fVar328 * 4.0 + fVar304 + auVar222._24_4_ * fVar269 * 12.0 + fVar228 * fVar269 * 6.0)
              * 0.16666667;
    fVar309 = fVar309 * 0.16666667;
    fVar319 = fVar319 * 0.16666667;
    fVar320 = fVar320 * 0.16666667;
    fVar322 = fVar322 * 0.16666667;
    fVar324 = fVar324 * 0.16666667;
    fVar326 = fVar326 * 0.16666667;
    fVar328 = fVar328 * 0.16666667;
    fVar378 = auVar371._28_4_ + 12.0;
    fVar363 = fVar362 + 12.166667;
    fVar332 = fVar248 * (float)local_360._0_4_ +
              fVar331 * (float)local_380._0_4_ +
              (float)local_220._0_4_ * fVar309 + fVar247 * (float)local_3e0._0_4_;
    fVar344 = fVar285 * (float)local_360._4_4_ +
              fVar343 * (float)local_380._4_4_ +
              (float)local_220._4_4_ * fVar319 + fVar284 * (float)local_3e0._4_4_;
    fVar346 = fVar289 * fStack_358 +
              fVar345 * fStack_378 + fStack_218 * fVar320 + fVar288 * fStack_3d8;
    fVar348 = fVar293 * fStack_354 +
              fVar347 * fStack_374 + fStack_214 * fVar322 + fVar292 * fStack_3d4;
    fVar350 = fVar297 * fStack_350 +
              fVar349 * fStack_370 + fStack_210 * fVar324 + fVar296 * fStack_3d0;
    fVar352 = fVar301 * fStack_34c +
              fVar351 * fStack_36c + fStack_20c * fVar326 + fVar300 * fStack_3cc;
    fVar354 = fVar305 * fStack_348 +
              fVar353 * fStack_368 + fStack_208 * fVar328 + fVar304 * fStack_3c8;
    fVar356 = fVar355 + fVar363;
    local_940 = (float)local_1a0._0_4_ * fVar248 +
                fVar331 * (float)local_3a0._0_4_ +
                (float)local_240._0_4_ * fVar309 + fVar247 * (float)local_400._0_4_;
    fStack_93c = (float)local_1a0._4_4_ * fVar285 +
                 fVar343 * (float)local_3a0._4_4_ +
                 (float)local_240._4_4_ * fVar319 + fVar284 * (float)local_400._4_4_;
    fStack_938 = fStack_198 * fVar289 +
                 fVar345 * fStack_398 + fStack_238 * fVar320 + fVar288 * fStack_3f8;
    fStack_934 = fStack_194 * fVar293 +
                 fVar347 * fStack_394 + fStack_234 * fVar322 + fVar292 * fStack_3f4;
    fStack_930 = fStack_190 * fVar297 +
                 fVar349 * fStack_390 + fStack_230 * fVar324 + fVar296 * fStack_3f0;
    fStack_92c = fStack_18c * fVar301 +
                 fVar351 * fStack_38c + fStack_22c * fVar326 + fVar300 * fStack_3ec;
    fStack_928 = fStack_188 * fVar305 +
                 fVar353 * fStack_388 + fStack_228 * fVar328 + fVar304 * fStack_3e8;
    fStack_924 = fVar356 + fVar378 + 12.166667;
    fVar107 = (float)local_1c0._0_4_ * fVar248 +
              fVar331 * (float)local_3c0._0_4_ +
              fVar247 * (float)local_420._0_4_ + (float)local_260._0_4_ * fVar309;
    fVar143 = (float)local_1c0._4_4_ * fVar285 +
              fVar343 * (float)local_3c0._4_4_ +
              fVar284 * (float)local_420._4_4_ + (float)local_260._4_4_ * fVar319;
    fVar144 = fStack_1b8 * fVar289 +
              fVar345 * fStack_3b8 + fVar288 * fStack_418 + fStack_258 * fVar320;
    fVar145 = fStack_1b4 * fVar293 +
              fVar347 * fStack_3b4 + fVar292 * fStack_414 + fStack_254 * fVar322;
    fVar146 = fStack_1b0 * fVar297 +
              fVar349 * fStack_3b0 + fVar296 * fStack_410 + fStack_250 * fVar324;
    fVar147 = fStack_1ac * fVar301 +
              fVar351 * fStack_3ac + fVar300 * fStack_40c + fStack_24c * fVar326;
    fVar148 = fStack_1a8 * fVar305 +
              fVar353 * fStack_3a8 + fVar304 * fStack_408 + fStack_248 * fVar328;
    fVar378 = fStack_924 + fVar378 + 16.0;
    local_c80._0_4_ =
         (float)local_1e0._0_4_ * fVar248 +
         (float)local_200._0_4_ * fVar331 +
         fVar247 * (float)local_440._0_4_ + fVar309 * (float)local_460._0_4_;
    local_c80._4_4_ =
         (float)local_1e0._4_4_ * fVar285 +
         (float)local_200._4_4_ * fVar343 +
         fVar284 * (float)local_440._4_4_ + fVar319 * (float)local_460._4_4_;
    fStack_c78 = fStack_1d8 * fVar289 +
                 fStack_1f8 * fVar345 + fVar288 * fStack_438 + fVar320 * fStack_458;
    fStack_c74 = fStack_1d4 * fVar293 +
                 fStack_1f4 * fVar347 + fVar292 * fStack_434 + fVar322 * fStack_454;
    fStack_c70 = fStack_1d0 * fVar297 +
                 fStack_1f0 * fVar349 + fVar296 * fStack_430 + fVar324 * fStack_450;
    fStack_c6c = fStack_1cc * fVar301 +
                 fStack_1ec * fVar351 + fVar300 * fStack_42c + fVar326 * fStack_44c;
    fStack_c68 = fStack_1c8 * fVar305 +
                 fStack_1e8 * fVar353 + fVar304 * fStack_428 + fVar328 * fStack_448;
    fStack_c64 = auVar283._28_4_ + fVar355 + fVar362 + auVar318._28_4_;
    auVar25._4_4_ = auVar222._4_4_ * -auVar222._4_4_;
    auVar25._0_4_ = auVar222._0_4_ * -auVar222._0_4_;
    auVar25._8_4_ = auVar222._8_4_ * -auVar222._8_4_;
    auVar25._12_4_ = auVar222._12_4_ * -auVar222._12_4_;
    auVar25._16_4_ = auVar222._16_4_ * -auVar222._16_4_;
    auVar25._20_4_ = auVar222._20_4_ * -auVar222._20_4_;
    auVar25._24_4_ = auVar222._24_4_ * -auVar222._24_4_;
    auVar25._28_4_ = auVar222._28_4_;
    auVar167._4_4_ = fVar249 * 4.0;
    auVar167._0_4_ = fVar246 * 4.0;
    auVar167._8_4_ = fVar263 * 4.0;
    auVar167._12_4_ = fVar264 * 4.0;
    auVar167._16_4_ = fVar265 * 4.0;
    auVar167._20_4_ = fVar267 * 4.0;
    auVar167._24_4_ = fVar269 * 4.0;
    auVar167._28_4_ = 0x3f800000;
    auVar131 = vsubps_avx(auVar25,auVar167);
    fVar289 = fVar150 * -fVar150 * 0.5;
    fVar301 = fVar185 * -fVar185 * 0.5;
    fVar304 = fVar187 * -fVar187 * 0.5;
    fVar305 = fVar213 * -fVar213 * 0.5;
    fVar309 = fVar226 * -fVar226 * 0.5;
    fVar320 = fVar227 * -fVar227 * 0.5;
    fVar322 = fVar228 * -fVar228 * 0.5;
    fVar248 = auVar131._0_4_ * 0.5;
    fVar285 = auVar131._4_4_ * 0.5;
    fVar288 = auVar131._8_4_ * 0.5;
    fVar292 = auVar131._12_4_ * 0.5;
    fVar293 = auVar131._16_4_ * 0.5;
    fVar296 = auVar131._20_4_ * 0.5;
    fVar297 = auVar131._24_4_ * 0.5;
    fVar247 = (fVar150 * fVar150 + fVar246 * 4.0) * 0.5;
    fVar249 = (fVar185 * fVar185 + fVar249 * 4.0) * 0.5;
    fVar263 = (fVar187 * fVar187 + fVar263 * 4.0) * 0.5;
    fVar264 = (fVar213 * fVar213 + fVar264 * 4.0) * 0.5;
    fVar265 = (fVar226 * fVar226 + fVar265 * 4.0) * 0.5;
    fVar284 = (fVar227 * fVar227 + fVar267 * 4.0) * 0.5;
    fVar269 = (fVar228 * fVar228 + fVar269 * 4.0) * 0.5;
    fVar150 = auVar222._0_4_ * auVar222._0_4_ * 0.5;
    fVar185 = auVar222._4_4_ * auVar222._4_4_ * 0.5;
    fVar187 = auVar222._8_4_ * auVar222._8_4_ * 0.5;
    fVar213 = auVar222._12_4_ * auVar222._12_4_ * 0.5;
    fVar226 = auVar222._16_4_ * auVar222._16_4_ * 0.5;
    fVar228 = auVar222._20_4_ * auVar222._20_4_ * 0.5;
    fVar246 = auVar222._24_4_ * auVar222._24_4_ * 0.5;
    fVar308 = fStack_924 + fVar363 + fVar363 + 4.0;
    auVar158 = vpermilps_avx(ZEXT416((uint)(fVar229 * 0.04761905)),0);
    fVar227 = auVar158._0_4_;
    fVar271 = fVar227 * (fVar289 * (float)local_360._0_4_ +
                        fVar248 * (float)local_380._0_4_ +
                        fVar247 * (float)local_3e0._0_4_ + (float)local_220._0_4_ * fVar150);
    fVar267 = auVar158._4_4_;
    fVar286 = fVar267 * (fVar301 * (float)local_360._4_4_ +
                        fVar285 * (float)local_380._4_4_ +
                        fVar249 * (float)local_3e0._4_4_ + (float)local_220._4_4_ * fVar185);
    local_960._4_4_ = fVar286;
    local_960._0_4_ = fVar271;
    fVar300 = auVar158._8_4_;
    fVar290 = fVar300 * (fVar304 * fStack_358 +
                        fVar288 * fStack_378 + fVar263 * fStack_3d8 + fStack_218 * fVar187);
    local_960._8_4_ = fVar290;
    fVar328 = auVar158._12_4_;
    fVar294 = fVar328 * (fVar305 * fStack_354 +
                        fVar292 * fStack_374 + fVar264 * fStack_3d4 + fStack_214 * fVar213);
    local_960._12_4_ = fVar294;
    fVar298 = fVar227 * (fVar309 * fStack_350 +
                        fVar293 * fStack_370 + fVar265 * fStack_3d0 + fStack_210 * fVar226);
    local_960._16_4_ = fVar298;
    fVar302 = fVar267 * (fVar320 * fStack_34c +
                        fVar296 * fStack_36c + fVar284 * fStack_3cc + fStack_20c * fVar228);
    local_960._20_4_ = fVar302;
    fVar306 = fVar300 * (fVar322 * fStack_348 +
                        fVar297 * fStack_368 + fVar269 * fStack_3c8 + fStack_208 * fVar246);
    local_960._24_4_ = fVar306;
    local_960._28_4_ = fVar308;
    fVar379 = fVar227 * ((float)local_1a0._0_4_ * fVar289 +
                        fVar248 * (float)local_3a0._0_4_ +
                        fVar247 * (float)local_400._0_4_ + (float)local_240._0_4_ * fVar150);
    fVar385 = fVar267 * ((float)local_1a0._4_4_ * fVar301 +
                        fVar285 * (float)local_3a0._4_4_ +
                        fVar249 * (float)local_400._4_4_ + (float)local_240._4_4_ * fVar185);
    auVar23._4_4_ = fVar385;
    auVar23._0_4_ = fVar379;
    fVar386 = fVar300 * (fStack_198 * fVar304 +
                        fVar288 * fStack_398 + fVar263 * fStack_3f8 + fStack_238 * fVar187);
    auVar23._8_4_ = fVar386;
    fVar387 = fVar328 * (fStack_194 * fVar305 +
                        fVar292 * fStack_394 + fVar264 * fStack_3f4 + fStack_234 * fVar213);
    auVar23._12_4_ = fVar387;
    fVar388 = fVar227 * (fStack_190 * fVar309 +
                        fVar293 * fStack_390 + fVar265 * fStack_3f0 + fStack_230 * fVar226);
    auVar23._16_4_ = fVar388;
    fVar389 = fVar267 * (fStack_18c * fVar320 +
                        fVar296 * fStack_38c + fVar284 * fStack_3ec + fStack_22c * fVar228);
    auVar23._20_4_ = fVar389;
    fVar390 = fVar300 * (fStack_188 * fVar322 +
                        fVar297 * fStack_388 + fVar269 * fStack_3e8 + fStack_228 * fVar246);
    auVar23._24_4_ = fVar390;
    auVar23._28_4_ = fStack_204;
    fVar391 = fVar227 * ((float)local_1c0._0_4_ * fVar289 +
                        (float)local_260._0_4_ * fVar150 + fVar247 * (float)local_420._0_4_ +
                        fVar248 * (float)local_3c0._0_4_);
    fVar399 = fVar267 * ((float)local_1c0._4_4_ * fVar301 +
                        (float)local_260._4_4_ * fVar185 + fVar249 * (float)local_420._4_4_ +
                        fVar285 * (float)local_3c0._4_4_);
    auVar169._4_4_ = fVar399;
    auVar169._0_4_ = fVar391;
    fVar401 = fVar300 * (fStack_1b8 * fVar304 +
                        fStack_258 * fVar187 + fVar263 * fStack_418 + fVar288 * fStack_3b8);
    auVar169._8_4_ = fVar401;
    fVar403 = fVar328 * (fStack_1b4 * fVar305 +
                        fStack_254 * fVar213 + fVar264 * fStack_414 + fVar292 * fStack_3b4);
    auVar169._12_4_ = fVar403;
    fVar405 = fVar227 * (fStack_1b0 * fVar309 +
                        fStack_250 * fVar226 + fVar265 * fStack_410 + fVar293 * fStack_3b0);
    auVar169._16_4_ = fVar405;
    fVar407 = fVar267 * (fStack_1ac * fVar320 +
                        fStack_24c * fVar228 + fVar284 * fStack_40c + fVar296 * fStack_3ac);
    auVar169._20_4_ = fVar407;
    fVar409 = fVar300 * (fStack_1a8 * fVar322 +
                        fStack_248 * fVar246 + fVar269 * fStack_408 + fVar297 * fStack_3a8);
    auVar169._24_4_ = fVar409;
    auVar169._28_4_ = uStack_184;
    fVar248 = fVar227 * ((float)local_1e0._0_4_ * fVar289 +
                        (float)local_200._0_4_ * fVar248 +
                        fVar150 * (float)local_460._0_4_ + fVar247 * (float)local_440._0_4_);
    fVar289 = fVar267 * ((float)local_1e0._4_4_ * fVar301 +
                        (float)local_200._4_4_ * fVar285 +
                        fVar185 * (float)local_460._4_4_ + fVar249 * (float)local_440._4_4_);
    auVar26._4_4_ = fVar289;
    auVar26._0_4_ = fVar248;
    fVar319 = fVar300 * (fStack_1d8 * fVar304 +
                        fStack_1f8 * fVar288 + fVar187 * fStack_458 + fVar263 * fStack_438);
    auVar26._8_4_ = fVar319;
    fVar345 = fVar328 * (fStack_1d4 * fVar305 +
                        fStack_1f4 * fVar292 + fVar213 * fStack_454 + fVar264 * fStack_434);
    auVar26._12_4_ = fVar345;
    fVar227 = fVar227 * (fStack_1d0 * fVar309 +
                        fStack_1f0 * fVar293 + fVar226 * fStack_450 + fVar265 * fStack_430);
    auVar26._16_4_ = fVar227;
    fVar267 = fVar267 * (fStack_1cc * fVar320 +
                        fStack_1ec * fVar296 + fVar228 * fStack_44c + fVar284 * fStack_42c);
    auVar26._20_4_ = fVar267;
    fVar300 = fVar300 * (fStack_1c8 * fVar322 +
                        fStack_1e8 * fVar297 + fVar246 * fStack_448 + fVar269 * fStack_428);
    auVar26._24_4_ = fVar300;
    auVar26._28_4_ = fVar328;
    auVar93._4_4_ = fStack_93c;
    auVar93._0_4_ = local_940;
    auVar93._8_4_ = fStack_938;
    auVar93._12_4_ = fStack_934;
    auVar93._16_4_ = fStack_930;
    auVar93._20_4_ = fStack_92c;
    auVar93._24_4_ = fStack_928;
    auVar93._28_4_ = fStack_924;
    auVar131 = vperm2f128_avx(auVar93,auVar93,1);
    auVar131 = vshufps_avx(auVar131,auVar93,0x30);
    _local_ae0 = vshufps_avx(auVar93,auVar131,0x29);
    auVar84._4_4_ = fVar143;
    auVar84._0_4_ = fVar107;
    auVar84._8_4_ = fVar144;
    auVar84._12_4_ = fVar145;
    auVar84._16_4_ = fVar146;
    auVar84._20_4_ = fVar147;
    auVar84._24_4_ = fVar148;
    auVar84._28_4_ = fVar378;
    auVar131 = vperm2f128_avx(auVar84,auVar84,1);
    auVar131 = vshufps_avx(auVar131,auVar84,0x30);
    auVar165 = vshufps_avx(auVar84,auVar131,0x29);
    auVar126 = vsubps_avx(_local_c80,auVar26);
    auVar131 = vperm2f128_avx(auVar126,auVar126,1);
    auVar131 = vshufps_avx(auVar131,auVar126,0x30);
    _local_800 = vshufps_avx(auVar126,auVar131,0x29);
    auVar25 = vsubps_avx(_local_ae0,auVar93);
    auVar167 = vsubps_avx(auVar165,auVar84);
    fVar185 = auVar25._0_4_;
    fVar228 = auVar25._4_4_;
    auVar27._4_4_ = fVar399 * fVar228;
    auVar27._0_4_ = fVar391 * fVar185;
    fVar249 = auVar25._8_4_;
    auVar27._8_4_ = fVar401 * fVar249;
    fVar284 = auVar25._12_4_;
    auVar27._12_4_ = fVar403 * fVar284;
    fVar292 = auVar25._16_4_;
    auVar27._16_4_ = fVar405 * fVar292;
    fVar301 = auVar25._20_4_;
    auVar27._20_4_ = fVar407 * fVar301;
    fVar320 = auVar25._24_4_;
    auVar27._24_4_ = fVar409 * fVar320;
    auVar27._28_4_ = auVar126._28_4_;
    fVar187 = auVar167._0_4_;
    fVar229 = auVar167._4_4_;
    auVar397._4_4_ = fVar385 * fVar229;
    auVar397._0_4_ = fVar379 * fVar187;
    fVar263 = auVar167._8_4_;
    auVar397._8_4_ = fVar386 * fVar263;
    fVar269 = auVar167._12_4_;
    auVar397._12_4_ = fVar387 * fVar269;
    fVar293 = auVar167._16_4_;
    auVar397._16_4_ = fVar388 * fVar293;
    fVar304 = auVar167._20_4_;
    auVar397._20_4_ = fVar389 * fVar304;
    fVar322 = auVar167._24_4_;
    auVar397._24_4_ = fVar390 * fVar322;
    auVar397._28_4_ = auVar131._28_4_;
    auVar167 = vsubps_avx(auVar397,auVar27);
    auVar82._4_4_ = fVar344;
    auVar82._0_4_ = fVar332;
    auVar82._8_4_ = fVar346;
    auVar82._12_4_ = fVar348;
    auVar82._16_4_ = fVar350;
    auVar82._20_4_ = fVar352;
    auVar82._24_4_ = fVar354;
    auVar82._28_4_ = fVar356;
    auVar131 = vperm2f128_avx(auVar82,auVar82,1);
    auVar131 = vshufps_avx(auVar131,auVar82,0x30);
    local_7a0 = vshufps_avx(auVar82,auVar131,0x29);
    auVar126 = vsubps_avx(local_7a0,auVar82);
    auVar28._4_4_ = fVar229 * fVar286;
    auVar28._0_4_ = fVar187 * fVar271;
    auVar28._8_4_ = fVar263 * fVar290;
    auVar28._12_4_ = fVar269 * fVar294;
    auVar28._16_4_ = fVar293 * fVar298;
    auVar28._20_4_ = fVar304 * fVar302;
    auVar28._24_4_ = fVar322 * fVar306;
    auVar28._28_4_ = local_7a0._28_4_;
    fVar213 = auVar126._0_4_;
    fVar246 = auVar126._4_4_;
    auVar29._4_4_ = fVar399 * fVar246;
    auVar29._0_4_ = fVar391 * fVar213;
    fVar264 = auVar126._8_4_;
    auVar29._8_4_ = fVar401 * fVar264;
    fVar285 = auVar126._12_4_;
    auVar29._12_4_ = fVar403 * fVar285;
    fVar296 = auVar126._16_4_;
    auVar29._16_4_ = fVar405 * fVar296;
    fVar305 = auVar126._20_4_;
    auVar29._20_4_ = fVar407 * fVar305;
    fVar324 = auVar126._24_4_;
    auVar29._24_4_ = fVar409 * fVar324;
    auVar29._28_4_ = fVar356;
    auVar26 = vsubps_avx(auVar29,auVar28);
    auVar168._4_4_ = fVar385 * fVar246;
    auVar168._0_4_ = fVar379 * fVar213;
    auVar168._8_4_ = fVar386 * fVar264;
    auVar168._12_4_ = fVar387 * fVar285;
    auVar168._16_4_ = fVar388 * fVar296;
    auVar168._20_4_ = fVar389 * fVar305;
    auVar168._24_4_ = fVar390 * fVar324;
    auVar168._28_4_ = fVar356;
    auVar341._4_4_ = fVar286 * fVar228;
    auVar341._0_4_ = fVar271 * fVar185;
    auVar341._8_4_ = fVar290 * fVar249;
    auVar341._12_4_ = fVar294 * fVar284;
    auVar341._16_4_ = fVar298 * fVar292;
    auVar341._20_4_ = fVar302 * fVar301;
    auVar341._24_4_ = fVar306 * fVar320;
    auVar341._28_4_ = uStack_1a4;
    auVar27 = vsubps_avx(auVar341,auVar168);
    fVar150 = auVar27._28_4_;
    auVar166._0_4_ = fVar213 * fVar213 + fVar185 * fVar185 + fVar187 * fVar187;
    auVar166._4_4_ = fVar246 * fVar246 + fVar228 * fVar228 + fVar229 * fVar229;
    auVar166._8_4_ = fVar264 * fVar264 + fVar249 * fVar249 + fVar263 * fVar263;
    auVar166._12_4_ = fVar285 * fVar285 + fVar284 * fVar284 + fVar269 * fVar269;
    auVar166._16_4_ = fVar296 * fVar296 + fVar292 * fVar292 + fVar293 * fVar293;
    auVar166._20_4_ = fVar305 * fVar305 + fVar301 * fVar301 + fVar304 * fVar304;
    auVar166._24_4_ = fVar324 * fVar324 + fVar320 * fVar320 + fVar322 * fVar322;
    auVar166._28_4_ = fVar150 + fVar150 + auVar167._28_4_;
    auVar131 = vrcpps_avx(auVar166);
    fVar347 = auVar131._0_4_;
    fVar349 = auVar131._4_4_;
    auVar24._4_4_ = fVar349 * auVar166._4_4_;
    auVar24._0_4_ = fVar347 * auVar166._0_4_;
    fVar351 = auVar131._8_4_;
    auVar24._8_4_ = fVar351 * auVar166._8_4_;
    fVar353 = auVar131._12_4_;
    auVar24._12_4_ = fVar353 * auVar166._12_4_;
    fVar355 = auVar131._16_4_;
    auVar24._16_4_ = fVar355 * auVar166._16_4_;
    fVar362 = auVar131._20_4_;
    auVar24._20_4_ = fVar362 * auVar166._20_4_;
    fVar363 = auVar131._24_4_;
    auVar24._24_4_ = fVar363 * auVar166._24_4_;
    auVar24._28_4_ = uStack_1a4;
    auVar412._8_4_ = 0x3f800000;
    auVar412._0_8_ = &DAT_3f8000003f800000;
    auVar412._12_4_ = 0x3f800000;
    auVar412._16_4_ = 0x3f800000;
    auVar412._20_4_ = 0x3f800000;
    auVar412._24_4_ = 0x3f800000;
    auVar412._28_4_ = 0x3f800000;
    auVar397 = vsubps_avx(auVar412,auVar24);
    fVar347 = auVar397._0_4_ * fVar347 + fVar347;
    fVar349 = auVar397._4_4_ * fVar349 + fVar349;
    fVar351 = auVar397._8_4_ * fVar351 + fVar351;
    fVar353 = auVar397._12_4_ * fVar353 + fVar353;
    fVar355 = auVar397._16_4_ * fVar355 + fVar355;
    fVar362 = auVar397._20_4_ * fVar362 + fVar362;
    fVar363 = auVar397._24_4_ * fVar363 + fVar363;
    auVar25 = vperm2f128_avx(auVar23,auVar23,1);
    auVar25 = vshufps_avx(auVar25,auVar23,0x30);
    auVar23 = vshufps_avx(auVar23,auVar25,0x29);
    auVar25 = vperm2f128_avx(auVar169,auVar169,1);
    auVar25 = vshufps_avx(auVar25,auVar169,0x30);
    local_aa0 = vshufps_avx(auVar169,auVar25,0x29);
    fVar392 = local_aa0._0_4_;
    fVar400 = local_aa0._4_4_;
    auVar30._4_4_ = fVar400 * fVar228;
    auVar30._0_4_ = fVar392 * fVar185;
    fVar402 = local_aa0._8_4_;
    auVar30._8_4_ = fVar402 * fVar249;
    fVar404 = local_aa0._12_4_;
    auVar30._12_4_ = fVar404 * fVar284;
    fVar406 = local_aa0._16_4_;
    auVar30._16_4_ = fVar406 * fVar292;
    fVar408 = local_aa0._20_4_;
    auVar30._20_4_ = fVar408 * fVar301;
    fVar410 = local_aa0._24_4_;
    auVar30._24_4_ = fVar410 * fVar320;
    auVar30._28_4_ = auVar25._28_4_;
    fVar411 = auVar23._0_4_;
    fVar415 = auVar23._4_4_;
    auVar31._4_4_ = fVar415 * fVar229;
    auVar31._0_4_ = fVar411 * fVar187;
    fVar416 = auVar23._8_4_;
    auVar31._8_4_ = fVar416 * fVar263;
    fVar417 = auVar23._12_4_;
    auVar31._12_4_ = fVar417 * fVar269;
    fVar418 = auVar23._16_4_;
    auVar31._16_4_ = fVar418 * fVar293;
    fVar419 = auVar23._20_4_;
    auVar31._20_4_ = fVar419 * fVar304;
    fVar420 = auVar23._24_4_;
    auVar31._24_4_ = fVar420 * fVar322;
    auVar31._28_4_ = fStack_204;
    auVar169 = vsubps_avx(auVar31,auVar30);
    auVar25 = vperm2f128_avx(local_960,local_960,1);
    auVar25 = vshufps_avx(auVar25,local_960,0x30);
    local_a80 = vshufps_avx(local_960,auVar25,0x29);
    fVar226 = local_a80._0_4_;
    fVar247 = local_a80._4_4_;
    auVar32._4_4_ = fVar229 * fVar247;
    auVar32._0_4_ = fVar187 * fVar226;
    fVar265 = local_a80._8_4_;
    auVar32._8_4_ = fVar263 * fVar265;
    fVar288 = local_a80._12_4_;
    auVar32._12_4_ = fVar269 * fVar288;
    fVar297 = local_a80._16_4_;
    auVar32._16_4_ = fVar293 * fVar297;
    fVar309 = local_a80._20_4_;
    auVar32._20_4_ = fVar304 * fVar309;
    fVar326 = local_a80._24_4_;
    auVar32._24_4_ = fVar322 * fVar326;
    auVar32._28_4_ = auVar25._28_4_;
    auVar33._4_4_ = fVar400 * fVar246;
    auVar33._0_4_ = fVar392 * fVar213;
    auVar33._8_4_ = fVar402 * fVar264;
    auVar33._12_4_ = fVar404 * fVar285;
    auVar33._16_4_ = fVar406 * fVar296;
    auVar33._20_4_ = fVar408 * fVar305;
    uVar100 = local_aa0._28_4_;
    auVar33._24_4_ = fVar410 * fVar324;
    auVar33._28_4_ = uVar100;
    auVar28 = vsubps_avx(auVar33,auVar32);
    auVar34._4_4_ = fVar415 * fVar246;
    auVar34._0_4_ = fVar411 * fVar213;
    auVar34._8_4_ = fVar416 * fVar264;
    auVar34._12_4_ = fVar417 * fVar285;
    auVar34._16_4_ = fVar418 * fVar296;
    auVar34._20_4_ = fVar419 * fVar305;
    auVar34._24_4_ = fVar420 * fVar324;
    auVar34._28_4_ = uVar100;
    auVar35._4_4_ = fVar247 * fVar228;
    auVar35._0_4_ = fVar226 * fVar185;
    auVar35._8_4_ = fVar265 * fVar249;
    auVar35._12_4_ = fVar288 * fVar284;
    auVar35._16_4_ = fVar297 * fVar292;
    auVar35._20_4_ = fVar309 * fVar301;
    fVar331 = auVar23._28_4_;
    auVar35._24_4_ = fVar326 * fVar320;
    auVar35._28_4_ = fVar331;
    auVar25 = vsubps_avx(auVar35,auVar34);
    fVar343 = auVar25._28_4_;
    auVar36._4_4_ =
         (auVar167._4_4_ * auVar167._4_4_ +
         auVar26._4_4_ * auVar26._4_4_ + auVar27._4_4_ * auVar27._4_4_) * fVar349;
    auVar36._0_4_ =
         (auVar167._0_4_ * auVar167._0_4_ +
         auVar26._0_4_ * auVar26._0_4_ + auVar27._0_4_ * auVar27._0_4_) * fVar347;
    auVar36._8_4_ =
         (auVar167._8_4_ * auVar167._8_4_ +
         auVar26._8_4_ * auVar26._8_4_ + auVar27._8_4_ * auVar27._8_4_) * fVar351;
    auVar36._12_4_ =
         (auVar167._12_4_ * auVar167._12_4_ +
         auVar26._12_4_ * auVar26._12_4_ + auVar27._12_4_ * auVar27._12_4_) * fVar353;
    auVar36._16_4_ =
         (auVar167._16_4_ * auVar167._16_4_ +
         auVar26._16_4_ * auVar26._16_4_ + auVar27._16_4_ * auVar27._16_4_) * fVar355;
    auVar36._20_4_ =
         (auVar167._20_4_ * auVar167._20_4_ +
         auVar26._20_4_ * auVar26._20_4_ + auVar27._20_4_ * auVar27._20_4_) * fVar362;
    auVar36._24_4_ =
         (auVar167._24_4_ * auVar167._24_4_ +
         auVar26._24_4_ * auVar26._24_4_ + auVar27._24_4_ * auVar27._24_4_) * fVar363;
    auVar36._28_4_ = auVar167._28_4_ + auVar26._28_4_ + fVar150;
    auVar37._4_4_ =
         (auVar169._4_4_ * auVar169._4_4_ +
         auVar28._4_4_ * auVar28._4_4_ + auVar25._4_4_ * auVar25._4_4_) * fVar349;
    auVar37._0_4_ =
         (auVar169._0_4_ * auVar169._0_4_ +
         auVar28._0_4_ * auVar28._0_4_ + auVar25._0_4_ * auVar25._0_4_) * fVar347;
    auVar37._8_4_ =
         (auVar169._8_4_ * auVar169._8_4_ +
         auVar28._8_4_ * auVar28._8_4_ + auVar25._8_4_ * auVar25._8_4_) * fVar351;
    auVar37._12_4_ =
         (auVar169._12_4_ * auVar169._12_4_ +
         auVar28._12_4_ * auVar28._12_4_ + auVar25._12_4_ * auVar25._12_4_) * fVar353;
    auVar37._16_4_ =
         (auVar169._16_4_ * auVar169._16_4_ +
         auVar28._16_4_ * auVar28._16_4_ + auVar25._16_4_ * auVar25._16_4_) * fVar355;
    auVar37._20_4_ =
         (auVar169._20_4_ * auVar169._20_4_ +
         auVar28._20_4_ * auVar28._20_4_ + auVar25._20_4_ * auVar25._20_4_) * fVar362;
    auVar37._24_4_ =
         (auVar169._24_4_ * auVar169._24_4_ +
         auVar28._24_4_ * auVar28._24_4_ + auVar25._24_4_ * auVar25._24_4_) * fVar363;
    auVar37._28_4_ = auVar397._28_4_ + auVar131._28_4_;
    auVar131 = vmaxps_avx(auVar36,auVar37);
    auVar25 = vperm2f128_avx(_local_c80,_local_c80,1);
    auVar25 = vshufps_avx(auVar25,_local_c80,0x30);
    local_820 = vshufps_avx(_local_c80,auVar25,0x29);
    auVar127._0_4_ = (float)local_c80._0_4_ + fVar248;
    auVar127._4_4_ = (float)local_c80._4_4_ + fVar289;
    auVar127._8_4_ = fStack_c78 + fVar319;
    auVar127._12_4_ = fStack_c74 + fVar345;
    auVar127._16_4_ = fStack_c70 + fVar227;
    auVar127._20_4_ = fStack_c6c + fVar267;
    auVar127._24_4_ = fStack_c68 + fVar300;
    auVar127._28_4_ = fStack_c64 + fVar328;
    auVar25 = vmaxps_avx(_local_c80,auVar127);
    auVar167 = vmaxps_avx(_local_800,local_820);
    auVar25 = vmaxps_avx(auVar25,auVar167);
    auVar167 = vrsqrtps_avx(auVar166);
    fVar150 = auVar167._0_4_;
    fVar227 = auVar167._4_4_;
    fVar248 = auVar167._8_4_;
    fVar267 = auVar167._12_4_;
    fVar289 = auVar167._16_4_;
    fVar300 = auVar167._20_4_;
    fVar319 = auVar167._24_4_;
    auVar38._4_4_ = fVar227 * fVar227 * fVar227 * auVar166._4_4_ * 0.5;
    auVar38._0_4_ = fVar150 * fVar150 * fVar150 * auVar166._0_4_ * 0.5;
    auVar38._8_4_ = fVar248 * fVar248 * fVar248 * auVar166._8_4_ * 0.5;
    auVar38._12_4_ = fVar267 * fVar267 * fVar267 * auVar166._12_4_ * 0.5;
    auVar38._16_4_ = fVar289 * fVar289 * fVar289 * auVar166._16_4_ * 0.5;
    auVar38._20_4_ = fVar300 * fVar300 * fVar300 * auVar166._20_4_ * 0.5;
    auVar38._24_4_ = fVar319 * fVar319 * fVar319 * auVar166._24_4_ * 0.5;
    auVar38._28_4_ = auVar166._28_4_;
    auVar39._4_4_ = fVar227 * 1.5;
    auVar39._0_4_ = fVar150 * 1.5;
    auVar39._8_4_ = fVar248 * 1.5;
    auVar39._12_4_ = fVar267 * 1.5;
    auVar39._16_4_ = fVar289 * 1.5;
    auVar39._20_4_ = fVar300 * 1.5;
    auVar39._24_4_ = fVar319 * 1.5;
    auVar39._28_4_ = auVar167._28_4_;
    auVar26 = vsubps_avx(auVar39,auVar38);
    auVar167 = ZEXT1232(ZEXT412(0)) << 0x20;
    auVar27 = vsubps_avx(auVar167,auVar93);
    auVar397 = vsubps_avx(auVar167,auVar84);
    fVar227 = auVar397._0_4_;
    fVar248 = auVar397._4_4_;
    fVar267 = auVar397._8_4_;
    fVar289 = auVar397._12_4_;
    fVar300 = auVar397._16_4_;
    fVar319 = auVar397._20_4_;
    fVar328 = auVar397._24_4_;
    fVar367 = auVar27._0_4_;
    fVar372 = auVar27._4_4_;
    fVar373 = auVar27._8_4_;
    fVar374 = auVar27._12_4_;
    fVar375 = auVar27._16_4_;
    fVar376 = auVar27._20_4_;
    fVar377 = auVar27._24_4_;
    auVar83._4_4_ = fVar344;
    auVar83._0_4_ = fVar332;
    auVar83._8_4_ = fVar346;
    auVar83._12_4_ = fVar348;
    auVar83._16_4_ = fVar350;
    auVar83._20_4_ = fVar352;
    auVar83._24_4_ = fVar354;
    auVar83._28_4_ = fVar356;
    auVar168 = ZEXT1232(ZEXT412(0)) << 0x20;
    auVar167 = vsubps_avx(auVar168,auVar83);
    fVar421 = auVar167._0_4_;
    fVar424 = auVar167._4_4_;
    fVar425 = auVar167._8_4_;
    fVar426 = auVar167._12_4_;
    fVar427 = auVar167._16_4_;
    fVar428 = auVar167._20_4_;
    fVar429 = auVar167._24_4_;
    auVar382._0_4_ =
         fVar421 * (float)local_840._0_4_ +
         fVar367 * (float)local_b00._0_4_ + (float)local_920._0_4_ * fVar227;
    auVar382._4_4_ =
         fVar424 * (float)local_840._4_4_ +
         fVar372 * (float)local_b00._4_4_ + (float)local_920._4_4_ * fVar248;
    auVar382._8_4_ = fVar425 * fStack_838 + fVar373 * fStack_af8 + fStack_918 * fVar267;
    auVar382._12_4_ = fVar426 * fStack_834 + fVar374 * fStack_af4 + fStack_914 * fVar289;
    auVar382._16_4_ = fVar427 * fStack_830 + fVar375 * fStack_af0 + fStack_910 * fVar300;
    auVar382._20_4_ = fVar428 * fStack_82c + fVar376 * fStack_aec + fStack_90c * fVar319;
    auVar382._24_4_ = fVar429 * fStack_828 + fVar377 * fStack_ae8 + fStack_908 * fVar328;
    auVar382._28_4_ = fVar343 + fVar343 + auVar28._28_4_ + fVar343;
    auVar395._0_4_ = fVar421 * fVar421 + fVar367 * fVar367 + fVar227 * fVar227;
    auVar395._4_4_ = fVar424 * fVar424 + fVar372 * fVar372 + fVar248 * fVar248;
    auVar395._8_4_ = fVar425 * fVar425 + fVar373 * fVar373 + fVar267 * fVar267;
    auVar395._12_4_ = fVar426 * fVar426 + fVar374 * fVar374 + fVar289 * fVar289;
    auVar395._16_4_ = fVar427 * fVar427 + fVar375 * fVar375 + fVar300 * fVar300;
    auVar395._20_4_ = fVar428 * fVar428 + fVar376 * fVar376 + fVar319 * fVar319;
    auVar395._24_4_ = fVar429 * fVar429 + fVar377 * fVar377 + fVar328 * fVar328;
    auVar395._28_4_ = fVar331 + fVar331 + fVar343;
    fVar353 = auVar26._0_4_;
    fVar355 = auVar26._4_4_;
    fVar362 = auVar26._8_4_;
    fVar363 = auVar26._12_4_;
    fVar266 = auVar26._16_4_;
    fVar268 = auVar26._20_4_;
    fVar270 = auVar26._24_4_;
    local_ac0._0_4_ =
         (float)local_840._0_4_ * fVar213 * fVar353 +
         fVar353 * fVar185 * (float)local_b00._0_4_ + fVar187 * fVar353 * (float)local_920._0_4_;
    local_ac0._4_4_ =
         (float)local_840._4_4_ * fVar246 * fVar355 +
         fVar355 * fVar228 * (float)local_b00._4_4_ + fVar229 * fVar355 * (float)local_920._4_4_;
    fStack_ab8 = fStack_838 * fVar264 * fVar362 +
                 fVar362 * fVar249 * fStack_af8 + fVar263 * fVar362 * fStack_918;
    fStack_ab4 = fStack_834 * fVar285 * fVar363 +
                 fVar363 * fVar284 * fStack_af4 + fVar269 * fVar363 * fStack_914;
    fStack_ab0 = fStack_830 * fVar296 * fVar266 +
                 fVar266 * fVar292 * fStack_af0 + fVar293 * fVar266 * fStack_910;
    fStack_aac = fStack_82c * fVar305 * fVar268 +
                 fVar268 * fVar301 * fStack_aec + fVar304 * fVar268 * fStack_90c;
    fStack_aa8 = fStack_828 * fVar324 * fVar270 +
                 fVar270 * fVar320 * fStack_ae8 + fVar322 * fVar270 * fStack_908;
    fStack_aa4 = fStack_824 + fStack_ae4 + fStack_904;
    fVar150 = fStack_824 + fStack_ae4 + fStack_904;
    local_9e0._0_4_ =
         fVar421 * fVar213 * fVar353 + fVar367 * fVar353 * fVar185 + fVar187 * fVar353 * fVar227;
    local_9e0._4_4_ =
         fVar424 * fVar246 * fVar355 + fVar372 * fVar355 * fVar228 + fVar229 * fVar355 * fVar248;
    local_9e0._8_4_ =
         fVar425 * fVar264 * fVar362 + fVar373 * fVar362 * fVar249 + fVar263 * fVar362 * fVar267;
    local_9e0._12_4_ =
         fVar426 * fVar285 * fVar363 + fVar374 * fVar363 * fVar284 + fVar269 * fVar363 * fVar289;
    local_9e0._16_4_ =
         fVar427 * fVar296 * fVar266 + fVar375 * fVar266 * fVar292 + fVar293 * fVar266 * fVar300;
    local_9e0._20_4_ =
         fVar428 * fVar305 * fVar268 + fVar376 * fVar268 * fVar301 + fVar304 * fVar268 * fVar319;
    local_9e0._24_4_ =
         fVar429 * fVar324 * fVar270 + fVar377 * fVar270 * fVar320 + fVar322 * fVar270 * fVar328;
    local_9e0._28_4_ = fStack_ae4 + fVar150;
    auVar40._4_4_ = (float)local_ac0._4_4_ * local_9e0._4_4_;
    auVar40._0_4_ = (float)local_ac0._0_4_ * (float)local_9e0._0_4_;
    auVar40._8_4_ = fStack_ab8 * local_9e0._8_4_;
    auVar40._12_4_ = fStack_ab4 * local_9e0._12_4_;
    auVar40._16_4_ = fStack_ab0 * local_9e0._16_4_;
    auVar40._20_4_ = fStack_aac * local_9e0._20_4_;
    auVar40._24_4_ = fStack_aa8 * local_9e0._24_4_;
    auVar40._28_4_ = fVar150;
    auVar169 = vsubps_avx(auVar382,auVar40);
    auVar41._4_4_ = local_9e0._4_4_ * local_9e0._4_4_;
    auVar41._0_4_ = (float)local_9e0._0_4_ * (float)local_9e0._0_4_;
    auVar41._8_4_ = local_9e0._8_4_ * local_9e0._8_4_;
    auVar41._12_4_ = local_9e0._12_4_ * local_9e0._12_4_;
    auVar41._16_4_ = local_9e0._16_4_ * local_9e0._16_4_;
    auVar41._20_4_ = local_9e0._20_4_ * local_9e0._20_4_;
    auVar41._24_4_ = local_9e0._24_4_ * local_9e0._24_4_;
    auVar41._28_4_ = fStack_ae4;
    auVar28 = vsubps_avx(auVar395,auVar41);
    auVar167 = vsqrtps_avx(auVar131);
    fVar150 = (auVar167._0_4_ + auVar25._0_4_) * 1.0000002;
    fVar331 = (auVar167._4_4_ + auVar25._4_4_) * 1.0000002;
    fVar343 = (auVar167._8_4_ + auVar25._8_4_) * 1.0000002;
    fVar345 = (auVar167._12_4_ + auVar25._12_4_) * 1.0000002;
    fVar347 = (auVar167._16_4_ + auVar25._16_4_) * 1.0000002;
    fVar349 = (auVar167._20_4_ + auVar25._20_4_) * 1.0000002;
    fVar351 = (auVar167._24_4_ + auVar25._24_4_) * 1.0000002;
    auVar42._4_4_ = fVar331 * fVar331;
    auVar42._0_4_ = fVar150 * fVar150;
    auVar42._8_4_ = fVar343 * fVar343;
    auVar42._12_4_ = fVar345 * fVar345;
    auVar42._16_4_ = fVar347 * fVar347;
    auVar42._20_4_ = fVar349 * fVar349;
    auVar42._24_4_ = fVar351 * fVar351;
    auVar42._28_4_ = auVar167._28_4_ + auVar25._28_4_;
    fVar331 = auVar169._0_4_ + auVar169._0_4_;
    fVar343 = auVar169._4_4_ + auVar169._4_4_;
    local_2c0._0_8_ = CONCAT44(fVar343,fVar331);
    local_2c0._8_4_ = auVar169._8_4_ + auVar169._8_4_;
    local_2c0._12_4_ = auVar169._12_4_ + auVar169._12_4_;
    local_2c0._16_4_ = auVar169._16_4_ + auVar169._16_4_;
    local_2c0._20_4_ = auVar169._20_4_ + auVar169._20_4_;
    local_2c0._24_4_ = auVar169._24_4_ + auVar169._24_4_;
    fVar150 = auVar169._28_4_;
    local_2c0._28_4_ = fVar150 + fVar150;
    auVar169 = vsubps_avx(auVar28,auVar42);
    auVar43._4_4_ = (float)local_ac0._4_4_ * (float)local_ac0._4_4_;
    auVar43._0_4_ = (float)local_ac0._0_4_ * (float)local_ac0._0_4_;
    auVar43._8_4_ = fStack_ab8 * fStack_ab8;
    auVar43._12_4_ = fStack_ab4 * fStack_ab4;
    auVar43._16_4_ = fStack_ab0 * fStack_ab0;
    auVar43._20_4_ = fStack_aac * fStack_aac;
    auVar43._24_4_ = fStack_aa8 * fStack_aa8;
    auVar43._28_4_ = auVar395._28_4_;
    auVar366 = ZEXT3264(local_280);
    auVar29 = vsubps_avx(local_280,auVar43);
    auVar358 = ZEXT3264(auVar29);
    auVar44._4_4_ = fVar343 * fVar343;
    auVar44._0_4_ = fVar331 * fVar331;
    auVar44._8_4_ = local_2c0._8_4_ * local_2c0._8_4_;
    auVar44._12_4_ = local_2c0._12_4_ * local_2c0._12_4_;
    auVar44._16_4_ = local_2c0._16_4_ * local_2c0._16_4_;
    auVar44._20_4_ = local_2c0._20_4_ * local_2c0._20_4_;
    auVar44._24_4_ = local_2c0._24_4_ * local_2c0._24_4_;
    auVar44._28_4_ = fVar150;
    fVar345 = auVar29._0_4_;
    fVar347 = auVar29._4_4_;
    fVar349 = auVar29._8_4_;
    fVar351 = auVar29._12_4_;
    fVar359 = auVar29._16_4_;
    fVar360 = auVar29._20_4_;
    fVar361 = auVar29._24_4_;
    auVar45._4_4_ = fVar347 * 4.0 * auVar169._4_4_;
    auVar45._0_4_ = fVar345 * 4.0 * auVar169._0_4_;
    auVar45._8_4_ = fVar349 * 4.0 * auVar169._8_4_;
    auVar45._12_4_ = fVar351 * 4.0 * auVar169._12_4_;
    auVar45._16_4_ = fVar359 * 4.0 * auVar169._16_4_;
    auVar45._20_4_ = fVar360 * 4.0 * auVar169._20_4_;
    auVar45._24_4_ = fVar361 * 4.0 * auVar169._24_4_;
    auVar45._28_4_ = 0x40800000;
    auVar25 = vsubps_avx(auVar44,auVar45);
    auVar131 = vcmpps_avx(auVar25,auVar168,5);
    fVar150 = auVar29._28_4_;
    if ((((((((auVar131 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar131 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar131 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar131 >> 0x7f,0) == '\0') &&
          (auVar131 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar131 >> 0xbf,0) == '\0') &&
        (auVar131 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar131[0x1f])
    {
      local_9c0._8_4_ = 0x7f800000;
      local_9c0._0_8_ = 0x7f8000007f800000;
      local_9c0._12_4_ = 0x7f800000;
      local_9c0._16_4_ = 0x7f800000;
      local_9c0._20_4_ = 0x7f800000;
      local_9c0._24_4_ = 0x7f800000;
      local_9c0._28_4_ = 0x7f800000;
      auVar413._8_4_ = 0xff800000;
      auVar413._0_8_ = 0xff800000ff800000;
      auVar413._12_4_ = 0xff800000;
      auVar413._16_4_ = 0xff800000;
      auVar413._20_4_ = 0xff800000;
      auVar413._24_4_ = 0xff800000;
      auVar413._28_4_ = 0xff800000;
      fVar331 = 0.0;
    }
    else {
      auVar24 = vsqrtps_avx(auVar25);
      auVar278._0_4_ = fVar345 + fVar345;
      auVar278._4_4_ = fVar347 + fVar347;
      auVar278._8_4_ = fVar349 + fVar349;
      auVar278._12_4_ = fVar351 + fVar351;
      auVar278._16_4_ = fVar359 + fVar359;
      auVar278._20_4_ = fVar360 + fVar360;
      auVar278._24_4_ = fVar361 + fVar361;
      auVar278._28_4_ = fVar150 + fVar150;
      auVar341 = vrcpps_avx(auVar278);
      auVar25 = vcmpps_avx(auVar25,auVar168,5);
      fVar272 = auVar341._0_4_;
      fVar287 = auVar341._4_4_;
      auVar46._4_4_ = auVar278._4_4_ * fVar287;
      auVar46._0_4_ = auVar278._0_4_ * fVar272;
      fVar291 = auVar341._8_4_;
      auVar46._8_4_ = auVar278._8_4_ * fVar291;
      fVar295 = auVar341._12_4_;
      auVar46._12_4_ = auVar278._12_4_ * fVar295;
      fVar299 = auVar341._16_4_;
      auVar46._16_4_ = auVar278._16_4_ * fVar299;
      fVar303 = auVar341._20_4_;
      auVar46._20_4_ = auVar278._20_4_ * fVar303;
      fVar307 = auVar341._24_4_;
      auVar46._24_4_ = auVar278._24_4_ * fVar307;
      auVar46._28_4_ = auVar278._28_4_;
      auVar338._8_4_ = 0x3f800000;
      auVar338._0_8_ = &DAT_3f8000003f800000;
      auVar338._12_4_ = 0x3f800000;
      auVar338._16_4_ = 0x3f800000;
      auVar338._20_4_ = 0x3f800000;
      auVar338._24_4_ = 0x3f800000;
      auVar338._28_4_ = 0x3f800000;
      auVar168 = vsubps_avx(auVar338,auVar46);
      fVar272 = fVar272 + fVar272 * auVar168._0_4_;
      fVar287 = fVar287 + fVar287 * auVar168._4_4_;
      fVar291 = fVar291 + fVar291 * auVar168._8_4_;
      fVar295 = fVar295 + fVar295 * auVar168._12_4_;
      fVar299 = fVar299 + fVar299 * auVar168._16_4_;
      fVar303 = fVar303 + fVar303 * auVar168._20_4_;
      fVar307 = fVar307 + fVar307 * auVar168._24_4_;
      auVar315._0_8_ = CONCAT44(fVar343,fVar331) ^ 0x8000000080000000;
      auVar315._8_4_ = -local_2c0._8_4_;
      auVar315._12_4_ = -local_2c0._12_4_;
      auVar315._16_4_ = -local_2c0._16_4_;
      auVar315._20_4_ = -local_2c0._20_4_;
      auVar315._24_4_ = -local_2c0._24_4_;
      auVar315._28_4_ = -local_2c0._28_4_;
      auVar30 = vsubps_avx(auVar315,auVar24);
      fVar331 = auVar30._0_4_ * fVar272;
      fVar343 = auVar30._4_4_ * fVar287;
      auVar47._4_4_ = fVar343;
      auVar47._0_4_ = fVar331;
      fVar321 = auVar30._8_4_ * fVar291;
      auVar47._8_4_ = fVar321;
      fVar323 = auVar30._12_4_ * fVar295;
      auVar47._12_4_ = fVar323;
      fVar325 = auVar30._16_4_ * fVar299;
      auVar47._16_4_ = fVar325;
      fVar327 = auVar30._20_4_ * fVar303;
      auVar47._20_4_ = fVar327;
      fVar329 = auVar30._24_4_ * fVar307;
      auVar47._24_4_ = fVar329;
      auVar47._28_4_ = auVar30._28_4_;
      auVar24 = vsubps_avx(auVar24,local_2c0);
      fVar272 = auVar24._0_4_ * fVar272;
      fVar287 = auVar24._4_4_ * fVar287;
      auVar48._4_4_ = fVar287;
      auVar48._0_4_ = fVar272;
      fVar291 = auVar24._8_4_ * fVar291;
      auVar48._8_4_ = fVar291;
      fVar295 = auVar24._12_4_ * fVar295;
      auVar48._12_4_ = fVar295;
      fVar299 = auVar24._16_4_ * fVar299;
      auVar48._16_4_ = fVar299;
      fVar303 = auVar24._20_4_ * fVar303;
      auVar48._20_4_ = fVar303;
      fVar307 = auVar24._24_4_ * fVar307;
      auVar48._24_4_ = fVar307;
      auVar48._28_4_ = auVar24._28_4_;
      fStack_624 = local_9e0._28_4_ + auVar341._28_4_ + auVar168._28_4_;
      local_640[0] = fVar353 * ((float)local_9e0._0_4_ + (float)local_ac0._0_4_ * fVar331);
      local_640[1] = fVar355 * (local_9e0._4_4_ + (float)local_ac0._4_4_ * fVar343);
      local_640[2] = fVar362 * (local_9e0._8_4_ + fStack_ab8 * fVar321);
      local_640[3] = fVar363 * (local_9e0._12_4_ + fStack_ab4 * fVar323);
      fStack_630 = fVar266 * (local_9e0._16_4_ + fStack_ab0 * fVar325);
      fStack_62c = fVar268 * (local_9e0._20_4_ + fStack_aac * fVar327);
      fStack_628 = fVar270 * (local_9e0._24_4_ + fStack_aa8 * fVar329);
      local_660[0] = fVar353 * ((float)local_9e0._0_4_ + (float)local_ac0._0_4_ * fVar272);
      local_660[1] = fVar355 * (local_9e0._4_4_ + (float)local_ac0._4_4_ * fVar287);
      local_660[2] = fVar362 * (local_9e0._8_4_ + fStack_ab8 * fVar291);
      local_660[3] = fVar363 * (local_9e0._12_4_ + fStack_ab4 * fVar295);
      fStack_650 = fVar266 * (local_9e0._16_4_ + fStack_ab0 * fVar299);
      fStack_64c = fVar268 * (local_9e0._20_4_ + fStack_aac * fVar303);
      fStack_648 = fVar270 * (local_9e0._24_4_ + fStack_aa8 * fVar307);
      fStack_644 = local_9e0._28_4_ + fStack_624;
      auVar279._8_4_ = 0x7f800000;
      auVar279._0_8_ = 0x7f8000007f800000;
      auVar279._12_4_ = 0x7f800000;
      auVar279._16_4_ = 0x7f800000;
      auVar279._20_4_ = 0x7f800000;
      auVar279._24_4_ = 0x7f800000;
      auVar279._28_4_ = 0x7f800000;
      local_9c0 = vblendvps_avx(auVar279,auVar47,auVar25);
      auVar316._8_4_ = 0x7fffffff;
      auVar316._0_8_ = 0x7fffffff7fffffff;
      auVar316._12_4_ = 0x7fffffff;
      auVar316._16_4_ = 0x7fffffff;
      auVar316._20_4_ = 0x7fffffff;
      auVar316._24_4_ = 0x7fffffff;
      auVar316._28_4_ = 0x7fffffff;
      auVar168 = vandps_avx(auVar43,auVar316);
      auVar168 = vmaxps_avx(local_4a0,auVar168);
      auVar49._4_4_ = auVar168._4_4_ * 1.9073486e-06;
      auVar49._0_4_ = auVar168._0_4_ * 1.9073486e-06;
      auVar49._8_4_ = auVar168._8_4_ * 1.9073486e-06;
      auVar49._12_4_ = auVar168._12_4_ * 1.9073486e-06;
      auVar49._16_4_ = auVar168._16_4_ * 1.9073486e-06;
      auVar49._20_4_ = auVar168._20_4_ * 1.9073486e-06;
      auVar49._24_4_ = auVar168._24_4_ * 1.9073486e-06;
      auVar49._28_4_ = auVar168._28_4_;
      auVar168 = vandps_avx(auVar29,auVar316);
      auVar168 = vcmpps_avx(auVar168,auVar49,1);
      auVar280._8_4_ = 0xff800000;
      auVar280._0_8_ = 0xff800000ff800000;
      auVar280._12_4_ = 0xff800000;
      auVar280._16_4_ = 0xff800000;
      auVar280._20_4_ = 0xff800000;
      auVar280._24_4_ = 0xff800000;
      auVar280._28_4_ = 0xff800000;
      auVar413 = vblendvps_avx(auVar280,auVar48,auVar25);
      auVar341 = auVar25 & auVar168;
      fVar331 = local_2c0._28_4_;
      if ((((((((auVar341 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar341 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar341 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar341 >> 0x7f,0) != '\0') ||
            (auVar341 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar341 >> 0xbf,0) != '\0') ||
          (auVar341 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar341[0x1f] < '\0') {
        auVar131 = vandps_avx(auVar168,auVar25);
        auVar158 = vpackssdw_avx(auVar131._0_16_,auVar131._16_16_);
        auVar341 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar168 = vcmpps_avx(auVar169,auVar341,2);
        auVar365._8_4_ = 0xff800000;
        auVar365._0_8_ = 0xff800000ff800000;
        auVar365._12_4_ = 0xff800000;
        auVar365._16_4_ = 0xff800000;
        auVar365._20_4_ = 0xff800000;
        auVar365._24_4_ = 0xff800000;
        auVar365._28_4_ = 0xff800000;
        auVar366 = ZEXT3264(auVar365);
        auVar398._8_4_ = 0x7f800000;
        auVar398._0_8_ = 0x7f8000007f800000;
        auVar398._12_4_ = 0x7f800000;
        auVar398._16_4_ = 0x7f800000;
        auVar398._20_4_ = 0x7f800000;
        auVar398._24_4_ = 0x7f800000;
        auVar398._28_4_ = 0x7f800000;
        auVar169 = vblendvps_avx(auVar398,auVar365,auVar168);
        auVar119 = vpmovsxwd_avx(auVar158);
        auVar158 = vpunpckhwd_avx(auVar158,auVar158);
        auVar262._16_16_ = auVar158;
        auVar262._0_16_ = auVar119;
        local_9c0 = vblendvps_avx(local_9c0,auVar169,auVar262);
        auVar169 = vblendvps_avx(auVar365,auVar398,auVar168);
        auVar413 = vblendvps_avx(auVar413,auVar169,auVar262);
        auVar169 = vcmpps_avx(auVar341,ZEXT1232(ZEXT812(0)) << 0x20,0xf);
        auVar140._0_4_ = auVar131._0_4_ ^ auVar169._0_4_;
        auVar140._4_4_ = auVar131._4_4_ ^ auVar169._4_4_;
        auVar140._8_4_ = auVar131._8_4_ ^ auVar169._8_4_;
        auVar140._12_4_ = auVar131._12_4_ ^ auVar169._12_4_;
        auVar140._16_4_ = auVar131._16_4_ ^ auVar169._16_4_;
        auVar140._20_4_ = auVar131._20_4_ ^ auVar169._20_4_;
        auVar140._24_4_ = auVar131._24_4_ ^ auVar169._24_4_;
        auVar140._28_4_ = auVar131._28_4_ ^ auVar169._28_4_;
        auVar131 = vorps_avx(auVar168,auVar140);
        auVar131 = vandps_avx(auVar25,auVar131);
      }
    }
    auVar384 = ZEXT3264(auVar25);
    auVar371 = ZEXT3264(auVar27);
    auVar318 = ZEXT3264(local_9e0);
    auVar283 = ZEXT3264(local_2c0);
    auVar25 = local_480 & auVar131;
    if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar25 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar25 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar25 >> 0x7f,0) != '\0') ||
          (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar25 >> 0xbf,0) != '\0') ||
        (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar25[0x1f] < '\0')
    {
      auVar158 = vshufps_avx(ZEXT416((uint)(*(float *)(ray + k * 4 + 0x100) - (float)local_8f0._0_4_
                                           )),
                             ZEXT416((uint)(*(float *)(ray + k * 4 + 0x100) - (float)local_8f0._0_4_
                                           )),0);
      auVar241._16_16_ = auVar158;
      auVar241._0_16_ = auVar158;
      auVar169 = vminps_avx(auVar241,auVar413);
      fVar303 = auVar397._28_4_;
      auVar422 = local_920._0_28_;
      auVar202._0_4_ =
           (float)local_840._0_4_ * fVar271 +
           (float)local_b00._0_4_ * fVar379 + (float)local_920._0_4_ * fVar391;
      auVar202._4_4_ =
           (float)local_840._4_4_ * fVar286 +
           (float)local_b00._4_4_ * fVar385 + (float)local_920._4_4_ * fVar399;
      auVar202._8_4_ = fStack_838 * fVar290 + fStack_af8 * fVar386 + fStack_918 * fVar401;
      auVar202._12_4_ = fStack_834 * fVar294 + fStack_af4 * fVar387 + fStack_914 * fVar403;
      auVar202._16_4_ = fStack_830 * fVar298 + fStack_af0 * fVar388 + fStack_910 * fVar405;
      auVar202._20_4_ = fStack_82c * fVar302 + fStack_aec * fVar389 + fStack_90c * fVar407;
      auVar202._24_4_ = fStack_828 * fVar306 + fStack_ae8 * fVar390 + fStack_908 * fVar409;
      auVar202._28_4_ = fVar308 + fStack_204 + fVar303;
      auVar25 = vrcpps_avx(auVar202);
      fVar343 = auVar25._0_4_;
      fVar308 = auVar25._4_4_;
      auVar50._4_4_ = auVar202._4_4_ * fVar308;
      auVar50._0_4_ = auVar202._0_4_ * fVar343;
      fVar272 = auVar25._8_4_;
      auVar50._8_4_ = auVar202._8_4_ * fVar272;
      fVar287 = auVar25._12_4_;
      auVar50._12_4_ = auVar202._12_4_ * fVar287;
      fVar291 = auVar25._16_4_;
      auVar50._16_4_ = auVar202._16_4_ * fVar291;
      fVar295 = auVar25._20_4_;
      auVar50._20_4_ = auVar202._20_4_ * fVar295;
      fVar299 = auVar25._24_4_;
      auVar50._24_4_ = auVar202._24_4_ * fVar299;
      auVar50._28_4_ = fStack_204;
      auVar339._8_4_ = 0x3f800000;
      auVar339._0_8_ = &DAT_3f8000003f800000;
      auVar339._12_4_ = 0x3f800000;
      auVar339._16_4_ = 0x3f800000;
      auVar339._20_4_ = 0x3f800000;
      auVar339._24_4_ = 0x3f800000;
      auVar339._28_4_ = 0x3f800000;
      auVar397 = vsubps_avx(auVar339,auVar50);
      auVar317._8_4_ = 0x7fffffff;
      auVar317._0_8_ = 0x7fffffff7fffffff;
      auVar317._12_4_ = 0x7fffffff;
      auVar317._16_4_ = 0x7fffffff;
      auVar317._20_4_ = 0x7fffffff;
      auVar317._24_4_ = 0x7fffffff;
      auVar317._28_4_ = 0x7fffffff;
      auVar25 = vandps_avx(auVar202,auVar317);
      auVar396._8_4_ = 0x219392ef;
      auVar396._0_8_ = 0x219392ef219392ef;
      auVar396._12_4_ = 0x219392ef;
      auVar396._16_4_ = 0x219392ef;
      auVar396._20_4_ = 0x219392ef;
      auVar396._24_4_ = 0x219392ef;
      auVar396._28_4_ = 0x219392ef;
      auVar27 = vcmpps_avx(auVar25,auVar396,1);
      auVar358 = ZEXT3264(CONCAT428(0x80000000,
                                    CONCAT424(0x80000000,
                                              CONCAT420(0x80000000,
                                                        CONCAT416(0x80000000,
                                                                  CONCAT412(0x80000000,
                                                                            CONCAT48(0x80000000,
                                                                                                                                                                          
                                                  0x8000000080000000)))))));
      auVar51._4_4_ =
           (fVar308 + fVar308 * auVar397._4_4_) *
           -(fVar424 * fVar286 + fVar372 * fVar385 + fVar399 * fVar248);
      auVar51._0_4_ =
           (fVar343 + fVar343 * auVar397._0_4_) *
           -(fVar421 * fVar271 + fVar367 * fVar379 + fVar391 * fVar227);
      auVar51._8_4_ =
           (fVar272 + fVar272 * auVar397._8_4_) *
           -(fVar425 * fVar290 + fVar373 * fVar386 + fVar401 * fVar267);
      auVar51._12_4_ =
           (fVar287 + fVar287 * auVar397._12_4_) *
           -(fVar426 * fVar294 + fVar374 * fVar387 + fVar403 * fVar289);
      auVar51._16_4_ =
           (fVar291 + fVar291 * auVar397._16_4_) *
           -(fVar427 * fVar298 + fVar375 * fVar388 + fVar405 * fVar300);
      auVar51._20_4_ =
           (fVar295 + fVar295 * auVar397._20_4_) *
           -(fVar428 * fVar302 + fVar376 * fVar389 + fVar407 * fVar319);
      auVar51._24_4_ =
           (fVar299 + fVar299 * auVar397._24_4_) *
           -(fVar429 * fVar306 + fVar377 * fVar390 + fVar409 * fVar328);
      auVar51._28_4_ = -(fVar303 + fVar331 + fVar303);
      auVar75 = ZEXT812(0);
      auVar25 = vcmpps_avx(auVar202,ZEXT1232(auVar75) << 0x20,1);
      auVar25 = vorps_avx(auVar27,auVar25);
      auVar370._8_4_ = 0xff800000;
      auVar370._0_8_ = 0xff800000ff800000;
      auVar370._12_4_ = 0xff800000;
      auVar370._16_4_ = 0xff800000;
      auVar370._20_4_ = 0xff800000;
      auVar370._24_4_ = 0xff800000;
      auVar370._28_4_ = 0xff800000;
      auVar371 = ZEXT3264(auVar370);
      auVar25 = vblendvps_avx(auVar51,auVar370,auVar25);
      auVar397 = vcmpps_avx(auVar202,ZEXT1232(auVar75) << 0x20,6);
      auVar27 = vorps_avx(auVar27,auVar397);
      auVar383._8_4_ = 0x7f800000;
      auVar383._0_8_ = 0x7f8000007f800000;
      auVar383._12_4_ = 0x7f800000;
      auVar383._16_4_ = 0x7f800000;
      auVar383._20_4_ = 0x7f800000;
      auVar383._24_4_ = 0x7f800000;
      auVar383._28_4_ = 0x7f800000;
      auVar384 = ZEXT3264(auVar383);
      auVar27 = vblendvps_avx(auVar51,auVar383,auVar27);
      auVar397 = vmaxps_avx(local_2a0,local_9c0);
      auVar397 = vmaxps_avx(auVar397,auVar25);
      auVar27 = vminps_avx(auVar169,auVar27);
      auVar341 = ZEXT1232(auVar75) << 0x20;
      auVar25 = vsubps_avx(auVar341,_local_ae0);
      auVar165 = vsubps_avx(auVar341,auVar165);
      auVar52._4_4_ = auVar165._4_4_ * -fVar400;
      auVar52._0_4_ = auVar165._0_4_ * -fVar392;
      auVar52._8_4_ = auVar165._8_4_ * -fVar402;
      auVar52._12_4_ = auVar165._12_4_ * -fVar404;
      auVar52._16_4_ = auVar165._16_4_ * -fVar406;
      auVar52._20_4_ = auVar165._20_4_ * -fVar408;
      auVar52._24_4_ = auVar165._24_4_ * -fVar410;
      auVar52._28_4_ = auVar165._28_4_;
      auVar366 = ZEXT3264(auVar23);
      auVar53._4_4_ = fVar415 * auVar25._4_4_;
      auVar53._0_4_ = fVar411 * auVar25._0_4_;
      auVar53._8_4_ = fVar416 * auVar25._8_4_;
      auVar53._12_4_ = fVar417 * auVar25._12_4_;
      auVar53._16_4_ = fVar418 * auVar25._16_4_;
      auVar53._20_4_ = fVar419 * auVar25._20_4_;
      auVar53._24_4_ = fVar420 * auVar25._24_4_;
      auVar53._28_4_ = auVar25._28_4_;
      auVar25 = vsubps_avx(auVar52,auVar53);
      auVar165 = vsubps_avx(auVar341,local_7a0);
      auVar318 = ZEXT3264(auVar131);
      auVar54._4_4_ = fVar247 * auVar165._4_4_;
      auVar54._0_4_ = fVar226 * auVar165._0_4_;
      auVar54._8_4_ = fVar265 * auVar165._8_4_;
      auVar54._12_4_ = fVar288 * auVar165._12_4_;
      auVar54._16_4_ = fVar297 * auVar165._16_4_;
      auVar54._20_4_ = fVar309 * auVar165._20_4_;
      uVar8 = auVar165._28_4_;
      auVar54._24_4_ = fVar326 * auVar165._24_4_;
      auVar54._28_4_ = uVar8;
      auVar23 = vsubps_avx(auVar25,auVar54);
      auVar55._4_4_ = (float)local_920._4_4_ * -fVar400;
      auVar55._0_4_ = (float)local_920._0_4_ * -fVar392;
      auVar55._8_4_ = fStack_918 * -fVar402;
      auVar55._12_4_ = fStack_914 * -fVar404;
      auVar55._16_4_ = fStack_910 * -fVar406;
      auVar55._20_4_ = fStack_90c * -fVar408;
      auVar55._24_4_ = fStack_908 * -fVar410;
      auVar55._28_4_ = uVar100 ^ 0x80000000;
      auVar56._4_4_ = (float)local_b00._4_4_ * fVar415;
      auVar56._0_4_ = (float)local_b00._0_4_ * fVar411;
      auVar56._8_4_ = fStack_af8 * fVar416;
      auVar56._12_4_ = fStack_af4 * fVar417;
      auVar56._16_4_ = fStack_af0 * fVar418;
      auVar56._20_4_ = fStack_aec * fVar419;
      auVar56._24_4_ = fStack_ae8 * fVar420;
      auVar56._28_4_ = uVar8;
      auVar25 = vsubps_avx(auVar55,auVar56);
      auVar57._4_4_ = (float)local_840._4_4_ * fVar247;
      auVar57._0_4_ = (float)local_840._0_4_ * fVar226;
      auVar57._8_4_ = fStack_838 * fVar265;
      auVar57._12_4_ = fStack_834 * fVar288;
      auVar57._16_4_ = fStack_830 * fVar297;
      auVar57._20_4_ = fStack_82c * fVar309;
      auVar57._24_4_ = fStack_828 * fVar326;
      auVar57._28_4_ = uVar8;
      auVar169 = vsubps_avx(auVar25,auVar57);
      auVar25 = vrcpps_avx(auVar169);
      fVar226 = auVar25._0_4_;
      fVar227 = auVar25._4_4_;
      auVar58._4_4_ = auVar169._4_4_ * fVar227;
      auVar58._0_4_ = auVar169._0_4_ * fVar226;
      fVar247 = auVar25._8_4_;
      auVar58._8_4_ = auVar169._8_4_ * fVar247;
      fVar248 = auVar25._12_4_;
      auVar58._12_4_ = auVar169._12_4_ * fVar248;
      fVar265 = auVar25._16_4_;
      auVar58._16_4_ = auVar169._16_4_ * fVar265;
      fVar267 = auVar25._20_4_;
      auVar58._20_4_ = auVar169._20_4_ * fVar267;
      fVar288 = auVar25._24_4_;
      auVar58._24_4_ = auVar169._24_4_ * fVar288;
      auVar58._28_4_ = fStack_824;
      auVar168 = vsubps_avx(auVar339,auVar58);
      auVar128._8_4_ = 0x7fffffff;
      auVar128._0_8_ = 0x7fffffff7fffffff;
      auVar128._12_4_ = 0x7fffffff;
      auVar128._16_4_ = 0x7fffffff;
      auVar128._20_4_ = 0x7fffffff;
      auVar128._24_4_ = 0x7fffffff;
      auVar128._28_4_ = 0x7fffffff;
      auVar25 = vandps_avx(auVar169,auVar128);
      auVar129._8_4_ = 0x219392ef;
      auVar129._0_8_ = 0x219392ef219392ef;
      auVar129._12_4_ = 0x219392ef;
      auVar129._16_4_ = 0x219392ef;
      auVar129._20_4_ = 0x219392ef;
      auVar129._24_4_ = 0x219392ef;
      auVar129._28_4_ = 0x219392ef;
      auVar165 = vcmpps_avx(auVar25,auVar129,1);
      auVar283 = ZEXT3264(auVar165);
      auVar59._4_4_ = (fVar227 + fVar227 * auVar168._4_4_) * -auVar23._4_4_;
      auVar59._0_4_ = (fVar226 + fVar226 * auVar168._0_4_) * -auVar23._0_4_;
      auVar59._8_4_ = (fVar247 + fVar247 * auVar168._8_4_) * -auVar23._8_4_;
      auVar59._12_4_ = (fVar248 + fVar248 * auVar168._12_4_) * -auVar23._12_4_;
      auVar59._16_4_ = (fVar265 + fVar265 * auVar168._16_4_) * -auVar23._16_4_;
      auVar59._20_4_ = (fVar267 + fVar267 * auVar168._20_4_) * -auVar23._20_4_;
      auVar59._24_4_ = (fVar288 + fVar288 * auVar168._24_4_) * -auVar23._24_4_;
      auVar59._28_4_ = auVar23._28_4_ ^ 0x80000000;
      auVar25 = vcmpps_avx(auVar169,auVar341,1);
      auVar25 = vorps_avx(auVar165,auVar25);
      auVar25 = vblendvps_avx(auVar59,auVar370,auVar25);
      local_8a0 = vmaxps_avx(auVar397,auVar25);
      auVar397 = ZEXT1232(auVar75) << 0x20;
      auVar25 = vcmpps_avx(auVar169,auVar397,6);
      auVar25 = vorps_avx(auVar165,auVar25);
      auVar165 = vblendvps_avx(auVar59,auVar383,auVar25);
      auVar25 = vandps_avx(auVar131,local_480);
      local_2e0 = vminps_avx(auVar27,auVar165);
      auVar165 = vcmpps_avx(local_8a0,local_2e0,2);
      auVar23 = auVar25 & auVar165;
      if ((((((((auVar23 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar23 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar23 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar23 >> 0x7f,0) != '\0') ||
            (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar23 >> 0xbf,0) != '\0') ||
          (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar23[0x1f] < '\0') {
        auVar23 = vminps_avx(_local_c80,auVar127);
        auVar27 = vminps_avx(_local_800,local_820);
        auVar23 = vminps_avx(auVar23,auVar27);
        auVar23 = vsubps_avx(auVar23,auVar167);
        auVar25 = vandps_avx(auVar165,auVar25);
        auVar95._4_4_ = local_640[1];
        auVar95._0_4_ = local_640[0];
        auVar95._8_4_ = local_640[2];
        auVar95._12_4_ = local_640[3];
        auVar95._16_4_ = fStack_630;
        auVar95._20_4_ = fStack_62c;
        auVar95._24_4_ = fStack_628;
        auVar95._28_4_ = fStack_624;
        auVar167 = vminps_avx(auVar95,auVar339);
        auVar167 = vmaxps_avx(auVar167,ZEXT832(0) << 0x20);
        local_640[0] = fVar189 + fVar330 * (auVar167._0_4_ + 0.0) * 0.125;
        local_640[1] = fVar210 + fVar184 * (auVar167._4_4_ + 1.0) * 0.125;
        local_640[2] = fVar211 + fVar186 * (auVar167._8_4_ + 2.0) * 0.125;
        local_640[3] = fVar212 + fVar188 * (auVar167._12_4_ + 3.0) * 0.125;
        fStack_630 = fVar189 + fVar330 * (auVar167._16_4_ + 4.0) * 0.125;
        fStack_62c = fVar210 + fVar184 * (auVar167._20_4_ + 5.0) * 0.125;
        fStack_628 = fVar211 + fVar186 * (auVar167._24_4_ + 6.0) * 0.125;
        fStack_624 = fVar212 + auVar167._28_4_ + 7.0;
        auVar94._4_4_ = local_660[1];
        auVar94._0_4_ = local_660[0];
        auVar94._8_4_ = local_660[2];
        auVar94._12_4_ = local_660[3];
        auVar94._16_4_ = fStack_650;
        auVar94._20_4_ = fStack_64c;
        auVar94._24_4_ = fStack_648;
        auVar94._28_4_ = fStack_644;
        auVar167 = vminps_avx(auVar94,auVar339);
        auVar167 = vmaxps_avx(auVar167,ZEXT832(0) << 0x20);
        local_660[0] = fVar189 + fVar330 * (auVar167._0_4_ + 0.0) * 0.125;
        local_660[1] = fVar210 + fVar184 * (auVar167._4_4_ + 1.0) * 0.125;
        local_660[2] = fVar211 + fVar186 * (auVar167._8_4_ + 2.0) * 0.125;
        local_660[3] = fVar212 + fVar188 * (auVar167._12_4_ + 3.0) * 0.125;
        fStack_650 = fVar189 + fVar330 * (auVar167._16_4_ + 4.0) * 0.125;
        fStack_64c = fVar210 + fVar184 * (auVar167._20_4_ + 5.0) * 0.125;
        fStack_648 = fVar211 + fVar186 * (auVar167._24_4_ + 6.0) * 0.125;
        fStack_644 = fVar212 + auVar167._28_4_ + 7.0;
        auVar60._4_4_ = auVar23._4_4_ * 0.99999976;
        auVar60._0_4_ = auVar23._0_4_ * 0.99999976;
        auVar60._8_4_ = auVar23._8_4_ * 0.99999976;
        auVar60._12_4_ = auVar23._12_4_ * 0.99999976;
        auVar60._16_4_ = auVar23._16_4_ * 0.99999976;
        auVar60._20_4_ = auVar23._20_4_ * 0.99999976;
        auVar60._24_4_ = auVar23._24_4_ * 0.99999976;
        auVar60._28_4_ = 0x3f7ffffc;
        auVar167 = vmaxps_avx(auVar397,auVar60);
        auVar61._4_4_ = auVar167._4_4_ * auVar167._4_4_;
        auVar61._0_4_ = auVar167._0_4_ * auVar167._0_4_;
        auVar61._8_4_ = auVar167._8_4_ * auVar167._8_4_;
        auVar61._12_4_ = auVar167._12_4_ * auVar167._12_4_;
        auVar61._16_4_ = auVar167._16_4_ * auVar167._16_4_;
        auVar61._20_4_ = auVar167._20_4_ * auVar167._20_4_;
        auVar61._24_4_ = auVar167._24_4_ * auVar167._24_4_;
        auVar61._28_4_ = auVar167._28_4_;
        auVar165 = vsubps_avx(auVar28,auVar61);
        auVar62._4_4_ = auVar165._4_4_ * fVar347 * 4.0;
        auVar62._0_4_ = auVar165._0_4_ * fVar345 * 4.0;
        auVar62._8_4_ = auVar165._8_4_ * fVar349 * 4.0;
        auVar62._12_4_ = auVar165._12_4_ * fVar351 * 4.0;
        auVar62._16_4_ = auVar165._16_4_ * fVar359 * 4.0;
        auVar62._20_4_ = auVar165._20_4_ * fVar360 * 4.0;
        auVar62._24_4_ = auVar165._24_4_ * fVar361 * 4.0;
        auVar62._28_4_ = auVar167._28_4_;
        auVar23 = vsubps_avx(auVar44,auVar62);
        _local_880 = ZEXT432(0) << 0x20;
        auVar167 = vcmpps_avx(auVar23,ZEXT832(0) << 0x20,5);
        if ((((((((auVar167 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar167 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar167 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar167 >> 0x7f,0) == '\0') &&
              (auVar167 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar167 >> 0xbf,0) == '\0') &&
            (auVar167 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar167[0x1f]) {
          auVar169 = SUB6432(ZEXT864(0),0) << 0x20;
          _local_780 = ZEXT832(0) << 0x20;
          auVar221 = ZEXT1228(ZEXT812(0)) << 0x20;
          auVar337 = ZEXT828(0) << 0x20;
          auVar242._8_4_ = 0x7f800000;
          auVar242._0_8_ = 0x7f8000007f800000;
          auVar242._12_4_ = 0x7f800000;
          auVar242._16_4_ = 0x7f800000;
          auVar242._20_4_ = 0x7f800000;
          auVar242._24_4_ = 0x7f800000;
          auVar242._28_4_ = 0x7f800000;
          auVar256._8_4_ = 0xff800000;
          auVar256._0_8_ = 0xff800000ff800000;
          auVar256._12_4_ = 0xff800000;
          auVar256._16_4_ = 0xff800000;
          auVar256._20_4_ = 0xff800000;
          auVar256._24_4_ = 0xff800000;
          auVar256._28_4_ = 0xff800000;
          auVar10 = local_7e0;
          _local_760 = _local_780;
        }
        else {
          auVar169 = vsqrtps_avx(auVar23);
          auVar223._0_4_ = fVar345 + fVar345;
          auVar223._4_4_ = fVar347 + fVar347;
          auVar223._8_4_ = fVar349 + fVar349;
          auVar223._12_4_ = fVar351 + fVar351;
          auVar223._16_4_ = fVar359 + fVar359;
          auVar223._20_4_ = fVar360 + fVar360;
          auVar223._24_4_ = fVar361 + fVar361;
          auVar223._28_4_ = fVar150 + fVar150;
          auVar27 = vrcpps_avx(auVar223);
          fVar150 = auVar27._0_4_;
          fVar226 = auVar27._4_4_;
          auVar63._4_4_ = auVar223._4_4_ * fVar226;
          auVar63._0_4_ = auVar223._0_4_ * fVar150;
          fVar227 = auVar27._8_4_;
          auVar63._8_4_ = auVar223._8_4_ * fVar227;
          fVar247 = auVar27._12_4_;
          auVar63._12_4_ = auVar223._12_4_ * fVar247;
          fVar248 = auVar27._16_4_;
          auVar63._16_4_ = auVar223._16_4_ * fVar248;
          fVar265 = auVar27._20_4_;
          auVar63._20_4_ = auVar223._20_4_ * fVar265;
          fVar267 = auVar27._24_4_;
          auVar63._24_4_ = auVar223._24_4_ * fVar267;
          auVar63._28_4_ = auVar223._28_4_;
          auVar28 = vsubps_avx(auVar339,auVar63);
          fVar150 = fVar150 + fVar150 * auVar28._0_4_;
          fVar226 = fVar226 + fVar226 * auVar28._4_4_;
          fVar227 = fVar227 + fVar227 * auVar28._8_4_;
          fVar247 = fVar247 + fVar247 * auVar28._12_4_;
          fVar248 = fVar248 + fVar248 * auVar28._16_4_;
          fVar265 = fVar265 + fVar265 * auVar28._20_4_;
          fVar267 = fVar267 + fVar267 * auVar28._24_4_;
          fVar288 = auVar27._28_4_ + auVar28._28_4_;
          auVar257._0_8_ = local_2c0._0_8_ ^ 0x8000000080000000;
          auVar257._8_4_ = -local_2c0._8_4_;
          auVar257._12_4_ = -local_2c0._12_4_;
          auVar257._16_4_ = -local_2c0._16_4_;
          auVar257._20_4_ = -local_2c0._20_4_;
          auVar257._24_4_ = -local_2c0._24_4_;
          auVar257._28_4_ = -local_2c0._28_4_;
          auVar27 = vsubps_avx(auVar257,auVar169);
          fVar331 = auVar27._0_4_ * fVar150;
          fVar343 = auVar27._4_4_ * fVar226;
          auVar64._4_4_ = fVar343;
          auVar64._0_4_ = fVar331;
          fVar345 = auVar27._8_4_ * fVar227;
          auVar64._8_4_ = fVar345;
          fVar347 = auVar27._12_4_ * fVar247;
          auVar64._12_4_ = fVar347;
          fVar349 = auVar27._16_4_ * fVar248;
          auVar64._16_4_ = fVar349;
          fVar351 = auVar27._20_4_ * fVar265;
          auVar64._20_4_ = fVar351;
          fVar330 = auVar27._24_4_ * fVar267;
          auVar64._24_4_ = fVar330;
          auVar64._28_4_ = auVar131._28_4_;
          auVar318 = ZEXT3264(auVar64);
          auVar131 = vsubps_avx(auVar169,local_2c0);
          fVar150 = auVar131._0_4_ * fVar150;
          fVar226 = auVar131._4_4_ * fVar226;
          auVar65._4_4_ = fVar226;
          auVar65._0_4_ = fVar150;
          fVar227 = auVar131._8_4_ * fVar227;
          auVar65._8_4_ = fVar227;
          fVar247 = auVar131._12_4_ * fVar247;
          auVar65._12_4_ = fVar247;
          fVar248 = auVar131._16_4_ * fVar248;
          auVar65._16_4_ = fVar248;
          fVar265 = auVar131._20_4_ * fVar265;
          auVar65._20_4_ = fVar265;
          fVar267 = auVar131._24_4_ * fVar267;
          auVar65._24_4_ = fVar267;
          auVar65._28_4_ = 0x7f800000;
          auVar384 = ZEXT3264(auVar65);
          fVar289 = (fVar331 * (float)local_ac0._0_4_ + (float)local_9e0._0_4_) * fVar353;
          fVar297 = (fVar343 * (float)local_ac0._4_4_ + local_9e0._4_4_) * fVar355;
          fVar300 = (fVar345 * fStack_ab8 + local_9e0._8_4_) * fVar362;
          fVar309 = (fVar347 * fStack_ab4 + local_9e0._12_4_) * fVar363;
          fVar319 = (fVar349 * fStack_ab0 + local_9e0._16_4_) * fVar266;
          fVar326 = (fVar351 * fStack_aac + local_9e0._20_4_) * fVar268;
          fVar328 = (fVar330 * fStack_aa8 + local_9e0._24_4_) * fVar270;
          auVar170._0_4_ = fVar332 + fVar213 * fVar289;
          auVar170._4_4_ = fVar344 + fVar246 * fVar297;
          auVar170._8_4_ = fVar346 + fVar264 * fVar300;
          auVar170._12_4_ = fVar348 + fVar285 * fVar309;
          auVar170._16_4_ = fVar350 + fVar296 * fVar319;
          auVar170._20_4_ = fVar352 + fVar305 * fVar326;
          auVar170._24_4_ = fVar354 + fVar324 * fVar328;
          auVar170._28_4_ = fVar356 + auVar131._28_4_ + local_9e0._28_4_;
          auVar66._4_4_ = (float)local_840._4_4_ * fVar343;
          auVar66._0_4_ = (float)local_840._0_4_ * fVar331;
          auVar66._8_4_ = fStack_838 * fVar345;
          auVar66._12_4_ = fStack_834 * fVar347;
          auVar66._16_4_ = fStack_830 * fVar349;
          auVar66._20_4_ = fStack_82c * fVar351;
          auVar66._24_4_ = fStack_828 * fVar330;
          auVar66._28_4_ = fVar288;
          auVar169 = vsubps_avx(auVar66,auVar170);
          auVar10._4_4_ = fStack_93c;
          auVar10._0_4_ = local_940;
          auVar10._8_4_ = fStack_938;
          auVar10._12_4_ = fStack_934;
          auVar10._16_4_ = fStack_930;
          auVar10._20_4_ = fStack_92c;
          auVar10._24_4_ = fStack_928;
          auVar10._28_4_ = fStack_924;
          auVar224._0_4_ = local_940 + fVar185 * fVar289;
          auVar224._4_4_ = fStack_93c + fVar228 * fVar297;
          auVar224._8_4_ = fStack_938 + fVar249 * fVar300;
          auVar224._12_4_ = fStack_934 + fVar284 * fVar309;
          auVar224._16_4_ = fStack_930 + fVar292 * fVar319;
          auVar224._20_4_ = fStack_92c + fVar301 * fVar326;
          auVar224._24_4_ = fStack_928 + fVar320 * fVar328;
          auVar224._28_4_ = fStack_924 + fVar288;
          auVar67._4_4_ = (float)local_b00._4_4_ * fVar343;
          auVar67._0_4_ = (float)local_b00._0_4_ * fVar331;
          auVar67._8_4_ = fStack_af8 * fVar345;
          auVar67._12_4_ = fStack_af4 * fVar347;
          auVar67._16_4_ = fStack_af0 * fVar349;
          auVar67._20_4_ = fStack_aec * fVar351;
          auVar67._24_4_ = fStack_ae8 * fVar330;
          auVar67._28_4_ = fVar212;
          auVar28 = vsubps_avx(auVar67,auVar224);
          auVar258._0_4_ = fVar107 + fVar187 * fVar289;
          auVar258._4_4_ = fVar143 + fVar229 * fVar297;
          auVar258._8_4_ = fVar144 + fVar263 * fVar300;
          auVar258._12_4_ = fVar145 + fVar269 * fVar309;
          auVar258._16_4_ = fVar146 + fVar293 * fVar319;
          auVar258._20_4_ = fVar147 + fVar304 * fVar326;
          auVar258._24_4_ = fVar148 + fVar322 * fVar328;
          auVar258._28_4_ = fVar378 + auVar27._28_4_;
          auVar68._4_4_ = (float)local_920._4_4_ * fVar343;
          auVar68._0_4_ = (float)local_920._0_4_ * fVar331;
          auVar68._8_4_ = fStack_918 * fVar345;
          auVar68._12_4_ = fStack_914 * fVar347;
          auVar68._16_4_ = fStack_910 * fVar349;
          auVar68._20_4_ = fStack_90c * fVar351;
          auVar68._24_4_ = fStack_908 * fVar330;
          auVar68._28_4_ = fVar212;
          local_960 = vsubps_avx(auVar68,auVar258);
          fVar353 = (fVar150 * (float)local_ac0._0_4_ + (float)local_9e0._0_4_) * fVar353;
          fVar355 = (fVar226 * (float)local_ac0._4_4_ + local_9e0._4_4_) * fVar355;
          fVar362 = (fVar227 * fStack_ab8 + local_9e0._8_4_) * fVar362;
          fVar363 = (fVar247 * fStack_ab4 + local_9e0._12_4_) * fVar363;
          fVar266 = (fVar248 * fStack_ab0 + local_9e0._16_4_) * fVar266;
          fVar268 = (fVar265 * fStack_aac + local_9e0._20_4_) * fVar268;
          fVar270 = (fVar267 * fStack_aa8 + local_9e0._24_4_) * fVar270;
          auVar281._0_4_ = fVar332 + fVar213 * fVar353;
          auVar281._4_4_ = fVar344 + fVar246 * fVar355;
          auVar281._8_4_ = fVar346 + fVar264 * fVar362;
          auVar281._12_4_ = fVar348 + fVar285 * fVar363;
          auVar281._16_4_ = fVar350 + fVar296 * fVar266;
          auVar281._20_4_ = fVar352 + fVar305 * fVar268;
          auVar281._24_4_ = fVar354 + fVar324 * fVar270;
          auVar281._28_4_ = fVar356 + fVar212;
          auVar69._4_4_ = (float)local_840._4_4_ * fVar226;
          auVar69._0_4_ = (float)local_840._0_4_ * fVar150;
          auVar69._8_4_ = fStack_838 * fVar227;
          auVar69._12_4_ = fStack_834 * fVar247;
          auVar69._16_4_ = fStack_830 * fVar248;
          auVar69._20_4_ = fStack_82c * fVar265;
          auVar69._24_4_ = fStack_828 * fVar267;
          auVar69._28_4_ = fStack_824;
          _local_880 = vsubps_avx(auVar69,auVar281);
          auVar282._0_4_ = local_940 + fVar185 * fVar353;
          auVar282._4_4_ = fStack_93c + fVar228 * fVar355;
          auVar282._8_4_ = fStack_938 + fVar249 * fVar362;
          auVar282._12_4_ = fStack_934 + fVar284 * fVar363;
          auVar282._16_4_ = fStack_930 + fVar292 * fVar266;
          auVar282._20_4_ = fStack_92c + fVar301 * fVar268;
          auVar282._24_4_ = fStack_928 + fVar320 * fVar270;
          auVar282._28_4_ = fStack_924 + local_880._28_4_;
          auVar70._4_4_ = (float)local_b00._4_4_ * fVar226;
          auVar70._0_4_ = (float)local_b00._0_4_ * fVar150;
          auVar70._8_4_ = fStack_af8 * fVar227;
          auVar70._12_4_ = fStack_af4 * fVar247;
          auVar70._16_4_ = fStack_af0 * fVar248;
          auVar70._20_4_ = fStack_aec * fVar265;
          auVar70._24_4_ = fStack_ae8 * fVar267;
          auVar70._28_4_ = fStack_824;
          _local_760 = vsubps_avx(auVar70,auVar282);
          auVar259._0_4_ = fVar107 + fVar187 * fVar353;
          auVar259._4_4_ = fVar143 + fVar229 * fVar355;
          auVar259._8_4_ = fVar144 + fVar263 * fVar362;
          auVar259._12_4_ = fVar145 + fVar269 * fVar363;
          auVar259._16_4_ = fVar146 + fVar293 * fVar266;
          auVar259._20_4_ = fVar147 + fVar304 * fVar268;
          auVar259._24_4_ = fVar148 + fVar322 * fVar270;
          auVar259._28_4_ = fVar378 + local_960._28_4_ + local_9e0._28_4_;
          auVar71._4_4_ = (float)local_920._4_4_ * fVar226;
          auVar71._0_4_ = (float)local_920._0_4_ * fVar150;
          auVar71._8_4_ = fStack_918 * fVar227;
          auVar71._12_4_ = fStack_914 * fVar247;
          auVar71._16_4_ = fStack_910 * fVar248;
          auVar71._20_4_ = fStack_90c * fVar265;
          auVar71._24_4_ = fStack_908 * fVar267;
          auVar71._28_4_ = local_760._28_4_;
          _local_780 = vsubps_avx(auVar71,auVar259);
          auVar23 = vcmpps_avx(auVar23,auVar397,5);
          auVar243._8_4_ = 0x7f800000;
          auVar243._0_8_ = 0x7f8000007f800000;
          auVar243._12_4_ = 0x7f800000;
          auVar243._16_4_ = 0x7f800000;
          auVar243._20_4_ = 0x7f800000;
          auVar243._24_4_ = 0x7f800000;
          auVar243._28_4_ = 0x7f800000;
          auVar242 = vblendvps_avx(auVar243,auVar64,auVar23);
          auVar340._8_4_ = 0x7fffffff;
          auVar340._0_8_ = 0x7fffffff7fffffff;
          auVar340._12_4_ = 0x7fffffff;
          auVar340._16_4_ = 0x7fffffff;
          auVar340._20_4_ = 0x7fffffff;
          auVar340._24_4_ = 0x7fffffff;
          auVar340._28_4_ = 0x7fffffff;
          auVar131 = vandps_avx(auVar340,auVar43);
          auVar131 = vmaxps_avx(local_4a0,auVar131);
          auVar72._4_4_ = auVar131._4_4_ * 1.9073486e-06;
          auVar72._0_4_ = auVar131._0_4_ * 1.9073486e-06;
          auVar72._8_4_ = auVar131._8_4_ * 1.9073486e-06;
          auVar72._12_4_ = auVar131._12_4_ * 1.9073486e-06;
          auVar72._16_4_ = auVar131._16_4_ * 1.9073486e-06;
          auVar72._20_4_ = auVar131._20_4_ * 1.9073486e-06;
          auVar72._24_4_ = auVar131._24_4_ * 1.9073486e-06;
          auVar72._28_4_ = auVar131._28_4_;
          auVar131 = vandps_avx(auVar340,auVar29);
          auVar131 = vcmpps_avx(auVar131,auVar72,1);
          auVar260._8_4_ = 0xff800000;
          auVar260._0_8_ = 0xff800000ff800000;
          auVar260._12_4_ = 0xff800000;
          auVar260._16_4_ = 0xff800000;
          auVar260._20_4_ = 0xff800000;
          auVar260._24_4_ = 0xff800000;
          auVar260._28_4_ = 0xff800000;
          auVar256 = vblendvps_avx(auVar260,auVar65,auVar23);
          auVar27 = auVar23 & auVar131;
          if ((((((((auVar27 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar27 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar27 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar27 >> 0x7f,0) != '\0') ||
                (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar27 >> 0xbf,0) != '\0') ||
              (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar27[0x1f] < '\0') {
            auVar131 = vandps_avx(auVar131,auVar23);
            auVar158 = vpackssdw_avx(auVar131._0_16_,auVar131._16_16_);
            auVar167 = vcmpps_avx(auVar165,auVar397,2);
            auVar414._8_4_ = 0xff800000;
            auVar414._0_8_ = 0xff800000ff800000;
            auVar414._12_4_ = 0xff800000;
            auVar414._16_4_ = 0xff800000;
            auVar414._20_4_ = 0xff800000;
            auVar414._24_4_ = 0xff800000;
            auVar414._28_4_ = 0xff800000;
            auVar423._8_4_ = 0x7f800000;
            auVar423._0_8_ = 0x7f8000007f800000;
            auVar423._12_4_ = 0x7f800000;
            auVar423._16_4_ = 0x7f800000;
            auVar423._20_4_ = 0x7f800000;
            auVar423._24_4_ = 0x7f800000;
            auVar423._28_4_ = 0x7f800000;
            auVar126 = vblendvps_avx(auVar423,auVar414,auVar167);
            auVar119 = vpmovsxwd_avx(auVar158);
            auVar384 = ZEXT1664(auVar119);
            auVar158 = vpunpckhwd_avx(auVar158,auVar158);
            auVar342._16_16_ = auVar158;
            auVar342._0_16_ = auVar119;
            auVar242 = vblendvps_avx(auVar242,auVar126,auVar342);
            auVar126 = vblendvps_avx(auVar414,auVar423,auVar167);
            auVar256 = vblendvps_avx(auVar256,auVar126,auVar342);
            auVar165 = vcmpps_avx(auVar397,auVar397,0xf);
            auVar141._0_4_ = auVar165._0_4_ ^ auVar131._0_4_;
            auVar141._4_4_ = auVar165._4_4_ ^ auVar131._4_4_;
            auVar141._8_4_ = auVar165._8_4_ ^ auVar131._8_4_;
            auVar141._12_4_ = auVar165._12_4_ ^ auVar131._12_4_;
            auVar141._16_4_ = auVar165._16_4_ ^ auVar131._16_4_;
            auVar141._20_4_ = auVar165._20_4_ ^ auVar131._20_4_;
            auVar141._24_4_ = auVar165._24_4_ ^ auVar131._24_4_;
            auVar141._28_4_ = auVar165._28_4_ ^ auVar131._28_4_;
            auVar131 = vorps_avx(auVar167,auVar141);
            auVar167 = vandps_avx(auVar23,auVar131);
          }
          auVar371 = ZEXT3264(auVar126);
          auVar221 = auVar28._0_28_;
          auVar337 = local_960._0_28_;
          _local_ae0 = auVar169;
        }
        auVar366 = ZEXT3264(auVar25);
        auVar358 = ZEXT3264(auVar10);
        _local_340 = local_8a0;
        local_320 = vminps_avx(local_2e0,auVar242);
        auVar126 = vmaxps_avx(local_8a0,auVar256);
        _local_300 = auVar126;
        auVar131 = vcmpps_avx(local_8a0,local_320,2);
        local_680 = vandps_avx(auVar25,auVar131);
        auVar131 = vcmpps_avx(auVar126,local_2e0,2);
        local_720 = vandps_avx(auVar25,auVar131);
        auVar283 = ZEXT3264(local_720);
        auVar131 = vorps_avx(local_720,local_680);
        if ((((((((auVar131 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar131 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar131 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar131 >> 0x7f,0) != '\0') ||
              (auVar131 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar131 >> 0xbf,0) != '\0') ||
            (auVar131 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar131[0x1f] < '\0') {
          local_a00 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
          local_6e0._0_4_ = auVar167._0_4_ ^ local_a00._0_4_;
          local_6e0._4_4_ = auVar167._4_4_ ^ local_a00._4_4_;
          local_6e0._8_4_ = auVar167._8_4_ ^ local_a00._8_4_;
          local_6e0._12_4_ = auVar167._12_4_ ^ local_a00._12_4_;
          local_6e0._16_4_ = auVar167._16_4_ ^ local_a00._16_4_;
          local_6e0._20_4_ = auVar167._20_4_ ^ local_a00._20_4_;
          local_6e0._24_4_ = auVar167._24_4_ ^ local_a00._24_4_;
          local_6e0._28_4_ = (uint)auVar167._28_4_ ^ local_a00._28_4_;
          auVar318 = ZEXT3264(local_6e0);
          auVar130._0_4_ =
               auVar169._0_4_ * (float)local_840._0_4_ +
               (float)local_b00._0_4_ * auVar221._0_4_ + (float)local_920._0_4_ * auVar337._0_4_;
          auVar130._4_4_ =
               auVar169._4_4_ * (float)local_840._4_4_ +
               (float)local_b00._4_4_ * auVar221._4_4_ + (float)local_920._4_4_ * auVar337._4_4_;
          auVar130._8_4_ =
               auVar169._8_4_ * fStack_838 +
               fStack_af8 * auVar221._8_4_ + fStack_918 * auVar337._8_4_;
          auVar130._12_4_ =
               auVar169._12_4_ * fStack_834 +
               fStack_af4 * auVar221._12_4_ + fStack_914 * auVar337._12_4_;
          auVar130._16_4_ =
               auVar169._16_4_ * fStack_830 +
               fStack_af0 * auVar221._16_4_ + fStack_910 * auVar337._16_4_;
          auVar130._20_4_ =
               auVar169._20_4_ * fStack_82c +
               fStack_aec * auVar221._20_4_ + fStack_90c * auVar337._20_4_;
          auVar130._24_4_ =
               auVar169._24_4_ * fStack_828 +
               fStack_ae8 * auVar221._24_4_ + fStack_908 * auVar337._24_4_;
          auVar130._28_4_ = auVar167._28_4_ + auVar169._28_4_ + fStack_ae4;
          auVar171._8_4_ = 0x7fffffff;
          auVar171._0_8_ = 0x7fffffff7fffffff;
          auVar171._12_4_ = 0x7fffffff;
          auVar171._16_4_ = 0x7fffffff;
          auVar171._20_4_ = 0x7fffffff;
          auVar171._24_4_ = 0x7fffffff;
          auVar171._28_4_ = 0x7fffffff;
          auVar131 = vandps_avx(auVar130,auVar171);
          auVar172._8_4_ = 0x3e99999a;
          auVar172._0_8_ = 0x3e99999a3e99999a;
          auVar172._12_4_ = 0x3e99999a;
          auVar172._16_4_ = 0x3e99999a;
          auVar172._20_4_ = 0x3e99999a;
          auVar172._24_4_ = 0x3e99999a;
          auVar172._28_4_ = 0x3e99999a;
          auVar131 = vcmpps_avx(auVar131,auVar172,1);
          auVar131 = vorps_avx(auVar131,local_6e0);
          auVar173._8_4_ = 3;
          auVar173._0_8_ = 0x300000003;
          auVar173._12_4_ = 3;
          auVar173._16_4_ = 3;
          auVar173._20_4_ = 3;
          auVar173._24_4_ = 3;
          auVar173._28_4_ = 3;
          auVar203._8_4_ = 2;
          auVar203._0_8_ = 0x200000002;
          auVar203._12_4_ = 2;
          auVar203._16_4_ = 2;
          auVar203._20_4_ = 2;
          auVar203._24_4_ = 2;
          auVar203._28_4_ = 2;
          auVar131 = vblendvps_avx(auVar203,auVar173,auVar131);
          local_6c0 = ZEXT432((uint)uVar105);
          local_8c0 = vpshufd_avx(ZEXT416((uint)uVar105),0);
          auVar158 = vpcmpgtd_avx(auVar131._16_16_,local_8c0);
          auStack_8b0 = auVar26._16_16_;
          auVar119 = vpcmpgtd_avx(auVar131._0_16_,local_8c0);
          auVar174._16_16_ = auVar158;
          auVar174._0_16_ = auVar119;
          auVar131 = vblendps_avx(ZEXT1632(auVar119),auVar174,0xf0);
          local_700 = vandnps_avx(auVar131,local_680);
          auVar142 = ZEXT3264(local_700);
          auVar25 = local_680 & ~auVar131;
          auVar245 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
          auStack_738 = auVar127._8_24_;
          local_740 = uVar105;
          fVar150 = (float)local_b00._0_4_;
          fVar185 = (float)local_b00._4_4_;
          fVar187 = fStack_af8;
          fVar213 = fStack_af4;
          fVar226 = fStack_af0;
          fVar227 = fStack_aec;
          fVar228 = fStack_ae8;
          local_6a0 = auVar131;
          if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar25 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar25 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar25 >> 0x7f,0) != '\0') ||
                (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar25 >> 0xbf,0) != '\0') ||
              (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar25[0x1f] < '\0') {
            local_860._4_4_ = local_8a0._4_4_ + (float)local_9a0._4_4_;
            local_860._0_4_ = local_8a0._0_4_ + (float)local_9a0._0_4_;
            fStack_858 = local_8a0._8_4_ + fStack_998;
            fStack_854 = local_8a0._12_4_ + fStack_994;
            fStack_850 = local_8a0._16_4_ + fStack_990;
            fStack_84c = local_8a0._20_4_ + fStack_98c;
            fStack_848 = local_8a0._24_4_ + fStack_988;
            fStack_844 = local_8a0._28_4_ + fStack_984;
            local_a80 = local_720;
            do {
              auVar233 = auVar245._0_16_;
              auVar175._8_4_ = 0x7f800000;
              auVar175._0_8_ = 0x7f8000007f800000;
              auVar175._12_4_ = 0x7f800000;
              auVar175._16_4_ = 0x7f800000;
              auVar175._20_4_ = 0x7f800000;
              auVar175._24_4_ = 0x7f800000;
              auVar175._28_4_ = 0x7f800000;
              auVar131 = auVar142._0_32_;
              auVar25 = vblendvps_avx(auVar175,local_8a0,auVar131);
              auVar167 = vshufps_avx(auVar25,auVar25,0xb1);
              auVar167 = vminps_avx(auVar25,auVar167);
              auVar165 = vshufpd_avx(auVar167,auVar167,5);
              auVar167 = vminps_avx(auVar167,auVar165);
              auVar165 = vperm2f128_avx(auVar167,auVar167,1);
              auVar167 = vminps_avx(auVar167,auVar165);
              auVar25 = vcmpps_avx(auVar25,auVar167,0);
              auVar167 = auVar131 & auVar25;
              if ((((((((auVar167 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar167 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar167 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar167 >> 0x7f,0) != '\0') ||
                    (auVar167 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar167 >> 0xbf,0) != '\0') ||
                  (auVar167 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar167[0x1f] < '\0') {
                auVar131 = vandps_avx(auVar25,auVar131);
              }
              local_820._0_8_ = uVar104;
              uVar97 = vmovmskps_avx(auVar131);
              uVar100 = 0;
              if (uVar97 != 0) {
                for (; (uVar97 >> uVar100 & 1) == 0; uVar100 = uVar100 + 1) {
                }
              }
              uVar105 = (ulong)uVar100;
              *(undefined4 *)(local_700 + uVar105 * 4) = 0;
              fVar150 = local_640[uVar105];
              uVar100 = *(uint *)(local_340 + uVar105 * 4);
              fVar185 = auVar155._0_4_;
              if ((float)local_980._0_4_ < 0.0) {
                fVar185 = sqrtf((float)local_980._0_4_);
                auVar233._8_4_ = 0x7fffffff;
                auVar233._0_8_ = 0x7fffffff7fffffff;
                auVar233._12_4_ = 0x7fffffff;
              }
              auVar371 = ZEXT464(uVar100);
              auVar358 = ZEXT464((uint)fVar150);
              auVar119 = vminps_avx(_local_b10,_local_b30);
              auVar158 = vmaxps_avx(_local_b10,_local_b30);
              auVar114 = vminps_avx(_local_b20,_local_b40);
              auVar121 = vminps_avx(auVar119,auVar114);
              auVar119 = vmaxps_avx(_local_b20,_local_b40);
              auVar114 = vmaxps_avx(auVar158,auVar119);
              auVar158 = vandps_avx(auVar121,auVar233);
              auVar119 = vandps_avx(auVar114,auVar233);
              auVar158 = vmaxps_avx(auVar158,auVar119);
              auVar119 = vmovshdup_avx(auVar158);
              auVar119 = vmaxss_avx(auVar119,auVar158);
              auVar158 = vshufpd_avx(auVar158,auVar158,1);
              auVar158 = vmaxss_avx(auVar158,auVar119);
              local_940 = auVar158._0_4_ * 1.9073486e-06;
              local_7a0._0_4_ = fVar185 * 1.9073486e-06;
              _local_800 = vshufps_avx(auVar114,auVar114,0xff);
              lVar106 = 5;
              do {
                fVar229 = auVar358._0_4_;
                fVar213 = 1.0 - fVar229;
                fVar150 = fVar213 * fVar213 * fVar213;
                fVar185 = fVar229 * fVar229 * fVar229;
                fVar187 = fVar229 * fVar213;
                auVar158 = vshufps_avx(ZEXT416((uint)(fVar185 * 0.16666667)),
                                       ZEXT416((uint)(fVar185 * 0.16666667)),0);
                auVar119 = ZEXT416((uint)((fVar185 * 4.0 + fVar150 +
                                          fVar229 * fVar187 * 12.0 + fVar213 * fVar187 * 6.0) *
                                         0.16666667));
                auVar119 = vshufps_avx(auVar119,auVar119,0);
                auVar114 = ZEXT416((uint)((fVar150 * 4.0 + fVar185 +
                                          fVar213 * fVar187 * 12.0 + fVar229 * fVar187 * 6.0) *
                                         0.16666667));
                auVar114 = vshufps_avx(auVar114,auVar114,0);
                auVar121 = vshufps_avx(auVar371._0_16_,auVar371._0_16_,0);
                auVar194._0_4_ = auVar121._0_4_ * (float)local_970._0_4_ + 0.0;
                auVar194._4_4_ = auVar121._4_4_ * (float)local_970._4_4_ + 0.0;
                auVar194._8_4_ = auVar121._8_4_ * fStack_968 + 0.0;
                auVar194._12_4_ = auVar121._12_4_ * fStack_964 + 0.0;
                auVar121 = vshufps_avx(ZEXT416((uint)(fVar150 * 0.16666667)),
                                       ZEXT416((uint)(fVar150 * 0.16666667)),0);
                auVar112._0_4_ =
                     auVar121._0_4_ * (float)local_b10._0_4_ +
                     auVar114._0_4_ * (float)local_b30._0_4_ +
                     auVar158._0_4_ * (float)local_b40._0_4_ +
                     auVar119._0_4_ * (float)local_b20._0_4_;
                auVar112._4_4_ =
                     auVar121._4_4_ * (float)local_b10._4_4_ +
                     auVar114._4_4_ * (float)local_b30._4_4_ +
                     auVar158._4_4_ * (float)local_b40._4_4_ +
                     auVar119._4_4_ * (float)local_b20._4_4_;
                auVar112._8_4_ =
                     auVar121._8_4_ * fStack_b08 +
                     auVar114._8_4_ * fStack_b28 +
                     auVar158._8_4_ * fStack_b38 + auVar119._8_4_ * fStack_b18;
                auVar112._12_4_ =
                     auVar121._12_4_ * fStack_b04 +
                     auVar114._12_4_ * fStack_b24 +
                     auVar158._12_4_ * fStack_b34 + auVar119._12_4_ * fStack_b14;
                local_960._0_16_ = auVar112;
                auVar158 = vsubps_avx(auVar194,auVar112);
                _local_ae0 = auVar158;
                auVar158 = vdpps_avx(auVar158,auVar158,0x7f);
                fVar246 = auVar158._0_4_;
                if (fVar246 < 0.0) {
                  local_aa0._0_4_ = fVar187;
                  fVar150 = sqrtf(fVar246);
                  fVar187 = (float)local_aa0._0_4_;
                }
                else {
                  auVar119 = vsqrtss_avx(auVar158,auVar158);
                  fVar150 = auVar119._0_4_;
                }
                auVar119 = ZEXT416((uint)(fVar229 * fVar229 * 0.5));
                auVar119 = vshufps_avx(auVar119,auVar119,0);
                auVar114 = ZEXT416((uint)((fVar213 * fVar213 + fVar187 * 4.0) * 0.5));
                auVar114 = vshufps_avx(auVar114,auVar114,0);
                auVar121 = ZEXT416((uint)((fVar229 * -fVar229 - fVar187 * 4.0) * 0.5));
                auVar121 = vshufps_avx(auVar121,auVar121,0);
                auVar113 = ZEXT416((uint)(fVar213 * -fVar213 * 0.5));
                auVar113 = vshufps_avx(auVar113,auVar113,0);
                auVar335._0_4_ =
                     (float)local_b10._0_4_ * auVar113._0_4_ +
                     (float)local_b30._0_4_ * auVar121._0_4_ +
                     (float)local_b40._0_4_ * auVar119._0_4_ +
                     (float)local_b20._0_4_ * auVar114._0_4_;
                auVar335._4_4_ =
                     (float)local_b10._4_4_ * auVar113._4_4_ +
                     (float)local_b30._4_4_ * auVar121._4_4_ +
                     (float)local_b40._4_4_ * auVar119._4_4_ +
                     (float)local_b20._4_4_ * auVar114._4_4_;
                auVar335._8_4_ =
                     fStack_b08 * auVar113._8_4_ +
                     fStack_b28 * auVar121._8_4_ +
                     fStack_b38 * auVar119._8_4_ + fStack_b18 * auVar114._8_4_;
                auVar335._12_4_ =
                     fStack_b04 * auVar113._12_4_ +
                     fStack_b24 * auVar121._12_4_ +
                     fStack_b34 * auVar119._12_4_ + fStack_b14 * auVar114._12_4_;
                auVar119 = vshufps_avx(auVar358._0_16_,auVar358._0_16_,0);
                auVar114 = ZEXT416((uint)(fVar213 - (fVar229 + fVar229)));
                auVar121 = vshufps_avx(auVar114,auVar114,0);
                auVar114 = ZEXT416((uint)(fVar229 - (fVar213 + fVar213)));
                auVar113 = vshufps_avx(auVar114,auVar114,0);
                auVar120 = vshufps_avx(ZEXT416((uint)fVar213),ZEXT416((uint)fVar213),0);
                auVar114 = vdpps_avx(auVar335,auVar335,0x7f);
                auVar156._0_4_ =
                     (float)local_b10._0_4_ * auVar120._0_4_ +
                     (float)local_b30._0_4_ * auVar113._0_4_ +
                     (float)local_b40._0_4_ * auVar119._0_4_ +
                     (float)local_b20._0_4_ * auVar121._0_4_;
                auVar156._4_4_ =
                     (float)local_b10._4_4_ * auVar120._4_4_ +
                     (float)local_b30._4_4_ * auVar113._4_4_ +
                     (float)local_b40._4_4_ * auVar119._4_4_ +
                     (float)local_b20._4_4_ * auVar121._4_4_;
                auVar156._8_4_ =
                     fStack_b08 * auVar120._8_4_ +
                     fStack_b28 * auVar113._8_4_ +
                     fStack_b38 * auVar119._8_4_ + fStack_b18 * auVar121._8_4_;
                auVar156._12_4_ =
                     fStack_b04 * auVar120._12_4_ +
                     fStack_b24 * auVar113._12_4_ +
                     fStack_b34 * auVar119._12_4_ + fStack_b14 * auVar121._12_4_;
                auVar119 = vblendps_avx(auVar114,_DAT_01feba10,0xe);
                auVar121 = vrsqrtss_avx(auVar119,auVar119);
                fVar187 = auVar121._0_4_;
                fVar185 = auVar114._0_4_;
                auVar121 = vdpps_avx(auVar335,auVar156,0x7f);
                auVar113 = vshufps_avx(auVar114,auVar114,0);
                auVar157._0_4_ = auVar156._0_4_ * auVar113._0_4_;
                auVar157._4_4_ = auVar156._4_4_ * auVar113._4_4_;
                auVar157._8_4_ = auVar156._8_4_ * auVar113._8_4_;
                auVar157._12_4_ = auVar156._12_4_ * auVar113._12_4_;
                auVar121 = vshufps_avx(auVar121,auVar121,0);
                auVar234._0_4_ = auVar335._0_4_ * auVar121._0_4_;
                auVar234._4_4_ = auVar335._4_4_ * auVar121._4_4_;
                auVar234._8_4_ = auVar335._8_4_ * auVar121._8_4_;
                auVar234._12_4_ = auVar335._12_4_ * auVar121._12_4_;
                auVar120 = vsubps_avx(auVar157,auVar234);
                auVar121 = vrcpss_avx(auVar119,auVar119);
                auVar119 = vmaxss_avx(ZEXT416((uint)local_940),
                                      ZEXT416((uint)(auVar371._0_4_ * (float)local_7a0._0_4_)));
                auVar384 = ZEXT1664(auVar119);
                auVar121 = ZEXT416((uint)(auVar121._0_4_ * (2.0 - fVar185 * auVar121._0_4_)));
                auVar121 = vshufps_avx(auVar121,auVar121,0);
                uVar105 = CONCAT44(auVar335._4_4_,auVar335._0_4_);
                auVar252._0_8_ = uVar105 ^ 0x8000000080000000;
                auVar252._8_4_ = -auVar335._8_4_;
                auVar252._12_4_ = -auVar335._12_4_;
                auVar113 = ZEXT416((uint)(fVar187 * 1.5 +
                                         fVar185 * -0.5 * fVar187 * fVar187 * fVar187));
                auVar113 = vshufps_avx(auVar113,auVar113,0);
                auVar217._0_4_ = auVar113._0_4_ * auVar120._0_4_ * auVar121._0_4_;
                auVar217._4_4_ = auVar113._4_4_ * auVar120._4_4_ * auVar121._4_4_;
                auVar217._8_4_ = auVar113._8_4_ * auVar120._8_4_ * auVar121._8_4_;
                auVar217._12_4_ = auVar113._12_4_ * auVar120._12_4_ * auVar121._12_4_;
                auVar276._0_4_ = auVar335._0_4_ * auVar113._0_4_;
                auVar276._4_4_ = auVar335._4_4_ * auVar113._4_4_;
                auVar276._8_4_ = auVar335._8_4_ * auVar113._8_4_;
                auVar276._12_4_ = auVar335._12_4_ * auVar113._12_4_;
                if (fVar185 < 0.0) {
                  local_aa0._0_16_ = auVar252;
                  local_9c0._0_16_ = auVar276;
                  _local_ac0 = auVar217;
                  fVar185 = sqrtf(fVar185);
                  auVar384 = ZEXT464(auVar119._0_4_);
                  auVar217 = _local_ac0;
                  auVar252 = local_aa0._0_16_;
                  auVar276 = local_9c0._0_16_;
                }
                else {
                  auVar114 = vsqrtss_avx(auVar114,auVar114);
                  fVar185 = auVar114._0_4_;
                }
                auVar114 = vdpps_avx(_local_ae0,auVar276,0x7f);
                fVar247 = (local_940 / fVar185) * (fVar150 + 1.0) +
                          auVar384._0_4_ + fVar150 * local_940;
                auVar121 = vdpps_avx(auVar252,auVar276,0x7f);
                auVar113 = vdpps_avx(_local_ae0,auVar217,0x7f);
                auVar120 = vdpps_avx(_local_970,auVar276,0x7f);
                auVar19 = vdpps_avx(_local_ae0,auVar252,0x7f);
                fVar150 = auVar121._0_4_ + auVar113._0_4_;
                fVar185 = auVar114._0_4_;
                auVar115._0_4_ = fVar185 * fVar185;
                auVar115._4_4_ = auVar114._4_4_ * auVar114._4_4_;
                auVar115._8_4_ = auVar114._8_4_ * auVar114._8_4_;
                auVar115._12_4_ = auVar114._12_4_ * auVar114._12_4_;
                auVar113 = vsubps_avx(auVar158,auVar115);
                auVar121 = vdpps_avx(_local_ae0,_local_970,0x7f);
                fVar187 = auVar19._0_4_ - fVar185 * fVar150;
                fVar213 = auVar121._0_4_ - fVar185 * auVar120._0_4_;
                auVar121 = vrsqrtss_avx(auVar113,auVar113);
                fVar226 = auVar113._0_4_;
                fVar185 = auVar121._0_4_;
                fVar185 = fVar185 * 1.5 + fVar226 * -0.5 * fVar185 * fVar185 * fVar185;
                if (fVar226 < 0.0) {
                  local_aa0._0_16_ = auVar114;
                  local_9c0._0_4_ = fVar247;
                  local_9e0._0_4_ = fVar187;
                  local_7c0._0_4_ = fVar213;
                  local_7e0._0_4_ = fVar185;
                  _local_ac0 = auVar120;
                  fVar226 = sqrtf(fVar226);
                  auVar384 = ZEXT464(auVar119._0_4_);
                  fVar185 = (float)local_7e0._0_4_;
                  fVar187 = (float)local_9e0._0_4_;
                  fVar213 = (float)local_7c0._0_4_;
                  auVar120 = _local_ac0;
                  auVar114 = local_aa0._0_16_;
                  fVar247 = (float)local_9c0._0_4_;
                }
                else {
                  auVar119 = vsqrtss_avx(auVar113,auVar113);
                  fVar226 = auVar119._0_4_;
                }
                auVar318 = ZEXT1664(auVar158);
                auVar366 = ZEXT3264(_local_920);
                auVar113 = vpermilps_avx(local_960._0_16_,0xff);
                auVar19 = vshufps_avx(auVar335,auVar335,0xff);
                fVar187 = fVar187 * fVar185 - auVar19._0_4_;
                auVar235._0_8_ = auVar120._0_8_ ^ 0x8000000080000000;
                auVar235._8_4_ = auVar120._8_4_ ^ 0x80000000;
                auVar235._12_4_ = auVar120._12_4_ ^ 0x80000000;
                auVar253._0_4_ = -fVar187;
                auVar253._4_4_ = 0x80000000;
                auVar253._8_4_ = 0x80000000;
                auVar253._12_4_ = 0x80000000;
                auVar119 = vinsertps_avx(ZEXT416((uint)(fVar213 * fVar185)),auVar235,0x10);
                auVar121 = vmovsldup_avx(ZEXT416((uint)(fVar150 * fVar213 * fVar185 -
                                                       auVar120._0_4_ * fVar187)));
                auVar119 = vdivps_avx(auVar119,auVar121);
                auVar120 = ZEXT416((uint)(fVar226 - auVar113._0_4_));
                auVar113 = vinsertps_avx(auVar114,auVar120,0x10);
                auVar218._0_4_ = auVar113._0_4_ * auVar119._0_4_;
                auVar218._4_4_ = auVar113._4_4_ * auVar119._4_4_;
                auVar218._8_4_ = auVar113._8_4_ * auVar119._8_4_;
                auVar218._12_4_ = auVar113._12_4_ * auVar119._12_4_;
                auVar119 = vinsertps_avx(auVar253,ZEXT416((uint)fVar150),0x1c);
                auVar119 = vdivps_avx(auVar119,auVar121);
                auVar121 = vhaddps_avx(auVar218,auVar218);
                auVar195._0_4_ = auVar113._0_4_ * auVar119._0_4_;
                auVar195._4_4_ = auVar113._4_4_ * auVar119._4_4_;
                auVar195._8_4_ = auVar113._8_4_ * auVar119._8_4_;
                auVar195._12_4_ = auVar113._12_4_ * auVar119._12_4_;
                auVar119 = vhaddps_avx(auVar195,auVar195);
                fVar229 = fVar229 - auVar121._0_4_;
                fVar248 = auVar371._0_4_ - auVar119._0_4_;
                auVar236._8_4_ = 0x7fffffff;
                auVar236._0_8_ = 0x7fffffff7fffffff;
                auVar236._12_4_ = 0x7fffffff;
                auVar245 = ZEXT1664(auVar236);
                auVar119 = vandps_avx(auVar114,auVar236);
                bVar73 = true;
                auVar422 = local_920._0_28_;
                fVar150 = (float)local_b00._0_4_;
                fVar185 = (float)local_b00._4_4_;
                fVar187 = fStack_af8;
                fVar213 = fStack_af4;
                fVar226 = fStack_af0;
                fVar227 = fStack_aec;
                fVar228 = fStack_ae8;
                if (fVar247 <= auVar119._0_4_) {
LAB_010171b4:
                  auVar283 = ZEXT3264(local_a80);
                  auVar371 = ZEXT464((uint)fVar248);
                }
                else {
                  auVar119 = vandps_avx(auVar120,auVar236);
                  auVar283 = ZEXT3264(local_a80);
                  if ((float)local_800._0_4_ * 1.9073486e-06 + auVar384._0_4_ + fVar247 <=
                      auVar119._0_4_) goto LAB_010171b4;
                  fVar248 = fVar248 + (float)local_8f0._0_4_;
                  if (fVar248 < fVar149) {
                    bVar73 = false;
                    uVar98 = 0;
                    goto LAB_010171b4;
                  }
                  fVar247 = *(float *)(ray + k * 4 + 0x100);
                  auVar384 = ZEXT464((uint)fVar247);
                  auVar119 = ZEXT416((uint)fVar248);
                  bVar73 = false;
                  if (fVar248 <= fVar247) {
                    auVar371 = ZEXT1664(auVar119);
                    if ((fVar229 < 0.0) || (1.0 < fVar229)) {
                      uVar98 = 0;
                    }
                    else {
                      auVar158 = vrsqrtss_avx(auVar158,auVar158);
                      fVar249 = auVar158._0_4_;
                      pGVar12 = (context->scene->geometries).items[local_a38].ptr;
                      if ((pGVar12->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                        uVar98 = 0;
                      }
                      else {
                        if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                           (pGVar12->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                          auVar158 = ZEXT416((uint)(fVar249 * 1.5 +
                                                   fVar246 * -0.5 * fVar249 * fVar249 * fVar249));
                          auVar158 = vshufps_avx(auVar158,auVar158,0);
                          auVar159._0_4_ = auVar158._0_4_ * (float)local_ae0._0_4_;
                          auVar159._4_4_ = auVar158._4_4_ * (float)local_ae0._4_4_;
                          auVar159._8_4_ = auVar158._8_4_ * fStack_ad8;
                          auVar159._12_4_ = auVar158._12_4_ * fStack_ad4;
                          auVar318 = ZEXT1664(auVar335);
                          auVar116._0_4_ = auVar335._0_4_ + auVar19._0_4_ * auVar159._0_4_;
                          auVar116._4_4_ = auVar335._4_4_ + auVar19._4_4_ * auVar159._4_4_;
                          auVar116._8_4_ = auVar335._8_4_ + auVar19._8_4_ * auVar159._8_4_;
                          auVar116._12_4_ = auVar335._12_4_ + auVar19._12_4_ * auVar159._12_4_;
                          auVar158 = vshufps_avx(auVar159,auVar159,0xc9);
                          auVar114 = vshufps_avx(auVar335,auVar335,0xc9);
                          auVar160._0_4_ = auVar114._0_4_ * auVar159._0_4_;
                          auVar160._4_4_ = auVar114._4_4_ * auVar159._4_4_;
                          auVar160._8_4_ = auVar114._8_4_ * auVar159._8_4_;
                          auVar160._12_4_ = auVar114._12_4_ * auVar159._12_4_;
                          auVar196._0_4_ = auVar335._0_4_ * auVar158._0_4_;
                          auVar196._4_4_ = auVar335._4_4_ * auVar158._4_4_;
                          auVar196._8_4_ = auVar335._8_4_ * auVar158._8_4_;
                          auVar196._12_4_ = auVar335._12_4_ * auVar158._12_4_;
                          auVar121 = vsubps_avx(auVar196,auVar160);
                          auVar158 = vshufps_avx(auVar121,auVar121,0xc9);
                          auVar114 = vshufps_avx(auVar116,auVar116,0xc9);
                          auVar197._0_4_ = auVar114._0_4_ * auVar158._0_4_;
                          auVar197._4_4_ = auVar114._4_4_ * auVar158._4_4_;
                          auVar197._8_4_ = auVar114._8_4_ * auVar158._8_4_;
                          auVar197._12_4_ = auVar114._12_4_ * auVar158._12_4_;
                          auVar158 = vshufps_avx(auVar121,auVar121,0xd2);
                          auVar117._0_4_ = auVar116._0_4_ * auVar158._0_4_;
                          auVar117._4_4_ = auVar116._4_4_ * auVar158._4_4_;
                          auVar117._8_4_ = auVar116._8_4_ * auVar158._8_4_;
                          auVar117._12_4_ = auVar116._12_4_ * auVar158._12_4_;
                          auVar158 = vsubps_avx(auVar197,auVar117);
                          pRVar16 = context->user;
                          local_590 = vshufps_avx(ZEXT416((uint)fVar229),ZEXT416((uint)fVar229),0);
                          auStack_5f0 = vshufps_avx(auVar158,auVar158,0x55);
                          local_5d0 = vshufps_avx(auVar158,auVar158,0xaa);
                          local_5b0 = vshufps_avx(auVar158,auVar158,0);
                          local_600 = (RTCHitN  [16])auStack_5f0;
                          local_5e0 = local_5d0;
                          local_5c0 = local_5b0;
                          local_5a0 = local_590;
                          local_580 = ZEXT832(0) << 0x20;
                          local_560 = local_4e0._0_8_;
                          uStack_558 = local_4e0._8_8_;
                          uStack_550 = local_4e0._16_8_;
                          uStack_548 = local_4e0._24_8_;
                          local_540 = local_4c0._0_8_;
                          uStack_538 = local_4c0._8_8_;
                          uStack_530 = local_4c0._16_8_;
                          uStack_528 = local_4c0._24_8_;
                          local_a40[1] = local_a00;
                          *local_a40 = local_a00;
                          local_520 = pRVar16->instID[0];
                          uStack_51c = local_520;
                          uStack_518 = local_520;
                          uStack_514 = local_520;
                          uStack_510 = local_520;
                          uStack_50c = local_520;
                          uStack_508 = local_520;
                          uStack_504 = local_520;
                          local_500 = pRVar16->instPrimID[0];
                          uStack_4fc = local_500;
                          uStack_4f8 = local_500;
                          uStack_4f4 = local_500;
                          uStack_4f0 = local_500;
                          uStack_4ec = local_500;
                          uStack_4e8 = local_500;
                          uStack_4e4 = local_500;
                          *(float *)(ray + k * 4 + 0x100) = fVar248;
                          local_b60 = *local_a48;
                          uStack_b58 = local_a48[1];
                          local_b50 = *local_a50;
                          uStack_b48 = local_a50[1];
                          local_a30.valid = (int *)&local_b60;
                          local_a30.geometryUserPtr = pGVar12->userPtr;
                          local_a30.context = context->user;
                          local_a30.hit = local_600;
                          local_a30.N = 8;
                          local_a30.ray = (RTCRayN *)ray;
                          if (pGVar12->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                            auVar318 = ZEXT1664(auVar335);
                            auVar366 = ZEXT1664(local_920._0_16_);
                            (*pGVar12->occlusionFilterN)(&local_a30);
                            auVar283 = ZEXT3264(local_a80);
                            auVar422 = local_920._0_28_;
                            auVar245 = ZEXT1664(CONCAT412(0x7fffffff,
                                                          CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                          }
                          auVar85._8_8_ = uStack_b58;
                          auVar85._0_8_ = local_b60;
                          auVar158 = vpcmpeqd_avx((undefined1  [16])0x0,auVar85);
                          auVar89._8_8_ = uStack_b48;
                          auVar89._0_8_ = local_b50;
                          auVar114 = vpcmpeqd_avx((undefined1  [16])0x0,auVar89);
                          auVar132._16_16_ = auVar114;
                          auVar132._0_16_ = auVar158;
                          auVar131 = local_a00 & ~auVar132;
                          fVar150 = (float)local_b00._0_4_;
                          fVar185 = (float)local_b00._4_4_;
                          fVar187 = fStack_af8;
                          fVar213 = fStack_af4;
                          fVar226 = fStack_af0;
                          fVar227 = fStack_aec;
                          fVar228 = fStack_ae8;
                          if ((((((((auVar131 >> 0x1f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0 &&
                                   (auVar131 >> 0x3f & (undefined1  [32])0x1) ==
                                   (undefined1  [32])0x0) &&
                                  (auVar131 >> 0x5f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) && SUB321(auVar131 >> 0x7f,0) == '\0') &&
                                (auVar131 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0)
                               && SUB321(auVar131 >> 0xbf,0) == '\0') &&
                              (auVar131 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0)
                              && -1 < auVar131[0x1f]) {
                            auVar133._0_4_ = auVar158._0_4_ ^ local_a00._0_4_;
                            auVar133._4_4_ = auVar158._4_4_ ^ local_a00._4_4_;
                            auVar133._8_4_ = auVar158._8_4_ ^ local_a00._8_4_;
                            auVar133._12_4_ = auVar158._12_4_ ^ local_a00._12_4_;
                            auVar133._16_4_ = auVar114._0_4_ ^ local_a00._16_4_;
                            auVar133._20_4_ = auVar114._4_4_ ^ local_a00._20_4_;
                            auVar133._24_4_ = auVar114._8_4_ ^ local_a00._24_4_;
                            auVar133._28_4_ = auVar114._12_4_ ^ local_a00._28_4_;
                          }
                          else {
                            p_Var17 = context->args->filter;
                            if ((p_Var17 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar12->field_8).field_0x2 & 0x40) != 0)))) {
                              auVar318 = ZEXT1664(auVar318._0_16_);
                              auVar366 = ZEXT1664(auVar366._0_16_);
                              (*p_Var17)(&local_a30);
                              auVar283 = ZEXT3264(local_a80);
                              auVar422 = local_920._0_28_;
                              auVar245 = ZEXT1664(CONCAT412(0x7fffffff,
                                                            CONCAT48(0x7fffffff,0x7fffffff7fffffff))
                                                 );
                              fVar150 = (float)local_b00._0_4_;
                              fVar185 = (float)local_b00._4_4_;
                              fVar187 = fStack_af8;
                              fVar213 = fStack_af4;
                              fVar226 = fStack_af0;
                              fVar227 = fStack_aec;
                              fVar228 = fStack_ae8;
                            }
                            auVar86._8_8_ = uStack_b58;
                            auVar86._0_8_ = local_b60;
                            auVar158 = vpcmpeqd_avx((undefined1  [16])0x0,auVar86);
                            auVar90._8_8_ = uStack_b48;
                            auVar90._0_8_ = local_b50;
                            auVar114 = vpcmpeqd_avx((undefined1  [16])0x0,auVar90);
                            auVar176._16_16_ = auVar114;
                            auVar176._0_16_ = auVar158;
                            auVar133._0_4_ = auVar158._0_4_ ^ local_a00._0_4_;
                            auVar133._4_4_ = auVar158._4_4_ ^ local_a00._4_4_;
                            auVar133._8_4_ = auVar158._8_4_ ^ local_a00._8_4_;
                            auVar133._12_4_ = auVar158._12_4_ ^ local_a00._12_4_;
                            auVar133._16_4_ = auVar114._0_4_ ^ local_a00._16_4_;
                            auVar133._20_4_ = auVar114._4_4_ ^ local_a00._20_4_;
                            auVar133._24_4_ = auVar114._8_4_ ^ local_a00._24_4_;
                            auVar133._28_4_ = auVar114._12_4_ ^ local_a00._28_4_;
                            auVar204._8_4_ = 0xff800000;
                            auVar204._0_8_ = 0xff800000ff800000;
                            auVar204._12_4_ = 0xff800000;
                            auVar204._16_4_ = 0xff800000;
                            auVar204._20_4_ = 0xff800000;
                            auVar204._24_4_ = 0xff800000;
                            auVar204._28_4_ = 0xff800000;
                            auVar131 = vblendvps_avx(auVar204,*(undefined1 (*) [32])
                                                               (local_a30.ray + 0x100),auVar176);
                            *(undefined1 (*) [32])(local_a30.ray + 0x100) = auVar131;
                          }
                          auVar371 = ZEXT1664(auVar119);
                          auVar384 = ZEXT464((uint)fVar247);
                          bVar80 = (auVar133 >> 0x1f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0;
                          bVar81 = (auVar133 >> 0x3f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0;
                          bVar79 = (auVar133 >> 0x5f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0;
                          bVar78 = SUB321(auVar133 >> 0x7f,0) != '\0';
                          bVar77 = (auVar133 & (undefined1  [32])0x100000000) !=
                                   (undefined1  [32])0x0;
                          bVar76 = SUB321(auVar133 >> 0xbf,0) != '\0';
                          bVar74 = (auVar133 & (undefined1  [32])0x100000000) !=
                                   (undefined1  [32])0x0;
                          bVar73 = auVar133[0x1f] < '\0';
                          uVar98 = (ulong)(((((((bVar80 || bVar81) || bVar79) || bVar78) || bVar77)
                                            || bVar76) || bVar74) || bVar73);
                          if (((((((!bVar80 && !bVar81) && !bVar79) && !bVar78) && !bVar77) &&
                               !bVar76) && !bVar74) && !bVar73) {
                            *(float *)(ray + k * 4 + 0x100) = fVar247;
                          }
                          bVar73 = false;
                          goto LAB_010171b9;
                        }
                        uVar98 = 1;
                      }
                      bVar73 = false;
                    }
                  }
                  else {
                    uVar98 = 0;
                    auVar371 = ZEXT1664(auVar119);
                  }
                }
LAB_010171b9:
                auVar358 = ZEXT464((uint)fVar229);
                bVar101 = (byte)uVar98;
                if (!bVar73) goto LAB_010175cc;
                lVar106 = lVar106 + -1;
              } while (lVar106 != 0);
              bVar101 = 0;
              auVar283 = ZEXT3264(local_a80);
              fVar150 = (float)local_b00._0_4_;
              fVar185 = (float)local_b00._4_4_;
              fVar187 = fStack_af8;
              fVar213 = fStack_af4;
              fVar226 = fStack_af0;
              fVar227 = fStack_aec;
              fVar228 = fStack_ae8;
LAB_010175cc:
              uVar98 = (ulong)(bVar101 & 1);
              uVar104 = CONCAT71(local_820._1_7_,local_820[0] | bVar101 & 1);
              uVar8 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar134._4_4_ = uVar8;
              auVar134._0_4_ = uVar8;
              auVar134._8_4_ = uVar8;
              auVar134._12_4_ = uVar8;
              auVar134._16_4_ = uVar8;
              auVar134._20_4_ = uVar8;
              auVar134._24_4_ = uVar8;
              auVar134._28_4_ = uVar8;
              auVar131 = vcmpps_avx(_local_860,auVar134,2);
              auVar25 = vandps_avx(auVar131,local_700);
              auVar142 = ZEXT3264(auVar25);
              auVar167 = local_700 & auVar131;
              uVar105 = local_740;
              local_700 = auVar25;
            } while ((((((((auVar167 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar167 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar167 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar167 >> 0x7f,0) != '\0') ||
                       (auVar167 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar167 >> 0xbf,0) != '\0') ||
                     (auVar167 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar167[0x1f] < '\0');
          }
          auVar135._0_4_ =
               (float)local_880._0_4_ * (float)local_840._0_4_ +
               fVar150 * (float)local_760._0_4_ + auVar422._0_4_ * (float)local_780._0_4_;
          auVar135._4_4_ =
               (float)local_880._4_4_ * (float)local_840._4_4_ +
               fVar185 * (float)local_760._4_4_ + auVar422._4_4_ * (float)local_780._4_4_;
          auVar135._8_4_ =
               fStack_878 * fStack_838 + fVar187 * fStack_758 + auVar422._8_4_ * fStack_778;
          auVar135._12_4_ =
               fStack_874 * fStack_834 + fVar213 * fStack_754 + auVar422._12_4_ * fStack_774;
          auVar135._16_4_ =
               fStack_870 * fStack_830 + fVar226 * fStack_750 + auVar422._16_4_ * fStack_770;
          auVar135._20_4_ =
               fStack_86c * fStack_82c + fVar227 * fStack_74c + auVar422._20_4_ * fStack_76c;
          auVar135._24_4_ =
               fStack_868 * fStack_828 + fVar228 * fStack_748 + auVar422._24_4_ * fStack_768;
          auVar135._28_4_ = fStack_864 + auVar131._28_4_ + auVar142._28_4_;
          auVar177._8_4_ = 0x7fffffff;
          auVar177._0_8_ = 0x7fffffff7fffffff;
          auVar177._12_4_ = 0x7fffffff;
          auVar177._16_4_ = 0x7fffffff;
          auVar177._20_4_ = 0x7fffffff;
          auVar177._24_4_ = 0x7fffffff;
          auVar177._28_4_ = 0x7fffffff;
          auVar131 = vandps_avx(auVar135,auVar177);
          auVar178._8_4_ = 0x3e99999a;
          auVar178._0_8_ = 0x3e99999a3e99999a;
          auVar178._12_4_ = 0x3e99999a;
          auVar178._16_4_ = 0x3e99999a;
          auVar178._20_4_ = 0x3e99999a;
          auVar178._24_4_ = 0x3e99999a;
          auVar178._28_4_ = 0x3e99999a;
          auVar131 = vcmpps_avx(auVar131,auVar178,1);
          auVar25 = vorps_avx(auVar131,local_6e0);
          auVar179._0_4_ = (float)local_9a0._0_4_ + auVar126._0_4_;
          auVar179._4_4_ = (float)local_9a0._4_4_ + auVar126._4_4_;
          auVar179._8_4_ = fStack_998 + auVar126._8_4_;
          auVar179._12_4_ = fStack_994 + auVar126._12_4_;
          auVar179._16_4_ = fStack_990 + auVar126._16_4_;
          auVar179._20_4_ = fStack_98c + auVar126._20_4_;
          auVar179._24_4_ = fStack_988 + auVar126._24_4_;
          auVar179._28_4_ = fStack_984 + auVar126._28_4_;
          uVar8 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar205._4_4_ = uVar8;
          auVar205._0_4_ = uVar8;
          auVar205._8_4_ = uVar8;
          auVar205._12_4_ = uVar8;
          auVar205._16_4_ = uVar8;
          auVar205._20_4_ = uVar8;
          auVar205._24_4_ = uVar8;
          auVar205._28_4_ = uVar8;
          auVar131 = vcmpps_avx(auVar179,auVar205,2);
          _local_860 = vandps_avx(auVar131,auVar283._0_32_);
          auVar180._8_4_ = 3;
          auVar180._0_8_ = 0x300000003;
          auVar180._12_4_ = 3;
          auVar180._16_4_ = 3;
          auVar180._20_4_ = 3;
          auVar180._24_4_ = 3;
          auVar180._28_4_ = 3;
          auVar206._8_4_ = 2;
          auVar206._0_8_ = 0x200000002;
          auVar206._12_4_ = 2;
          auVar206._16_4_ = 2;
          auVar206._20_4_ = 2;
          auVar206._24_4_ = 2;
          auVar206._28_4_ = 2;
          auVar131 = vblendvps_avx(auVar206,auVar180,auVar25);
          auVar158 = vpcmpgtd_avx(auVar131._16_16_,local_8c0);
          auVar119 = vpshufd_avx(local_6c0._0_16_,0);
          auVar119 = vpcmpgtd_avx(auVar131._0_16_,auVar119);
          auVar181._16_16_ = auVar158;
          auVar181._0_16_ = auVar119;
          _local_880 = vblendps_avx(ZEXT1632(auVar119),auVar181,0xf0);
          auVar131 = vandnps_avx(_local_880,_local_860);
          auVar126 = _local_860 & ~_local_880;
          if ((((((((auVar126 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar126 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar126 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar126 >> 0x7f,0) != '\0') ||
                (auVar126 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar126 >> 0xbf,0) != '\0') ||
              (auVar126 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar126[0x1f] < '\0') {
            local_7e0 = _local_300;
            local_800._4_4_ = (float)local_9a0._4_4_ + (float)local_300._4_4_;
            local_800._0_4_ = (float)local_9a0._0_4_ + (float)local_300._0_4_;
            fStack_7f8 = fStack_998 + fStack_2f8;
            fStack_7f4 = fStack_994 + fStack_2f4;
            fStack_7f0 = fStack_990 + fStack_2f0;
            fStack_7ec = fStack_98c + fStack_2ec;
            fStack_7e8 = fStack_988 + fStack_2e8;
            fStack_7e4 = fStack_984 + fStack_2e4;
            do {
              auVar237 = auVar245._0_16_;
              auVar182._8_4_ = 0x7f800000;
              auVar182._0_8_ = 0x7f8000007f800000;
              auVar182._12_4_ = 0x7f800000;
              auVar182._16_4_ = 0x7f800000;
              auVar182._20_4_ = 0x7f800000;
              auVar182._24_4_ = 0x7f800000;
              auVar182._28_4_ = 0x7f800000;
              auVar126 = vblendvps_avx(auVar182,local_7e0,auVar131);
              auVar25 = vshufps_avx(auVar126,auVar126,0xb1);
              auVar25 = vminps_avx(auVar126,auVar25);
              auVar167 = vshufpd_avx(auVar25,auVar25,5);
              auVar25 = vminps_avx(auVar25,auVar167);
              auVar167 = vperm2f128_avx(auVar25,auVar25,1);
              auVar25 = vminps_avx(auVar25,auVar167);
              auVar25 = vcmpps_avx(auVar126,auVar25,0);
              auVar167 = auVar131 & auVar25;
              auVar126 = auVar131;
              if ((((((((auVar167 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar167 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar167 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar167 >> 0x7f,0) != '\0') ||
                    (auVar167 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar167 >> 0xbf,0) != '\0') ||
                  (auVar167 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar167[0x1f] < '\0') {
                auVar126 = vandps_avx(auVar25,auVar131);
              }
              local_820._0_8_ = uVar104;
              uVar97 = vmovmskps_avx(auVar126);
              uVar100 = 0;
              if (uVar97 != 0) {
                for (; (uVar97 >> uVar100 & 1) == 0; uVar100 = uVar100 + 1) {
                }
              }
              uVar105 = (ulong)uVar100;
              local_720 = auVar131;
              *(undefined4 *)(local_720 + uVar105 * 4) = 0;
              fVar150 = local_660[uVar105];
              uVar100 = *(uint *)(local_2e0 + uVar105 * 4);
              fVar185 = auVar18._0_4_;
              if ((float)local_980._0_4_ < 0.0) {
                fVar185 = sqrtf((float)local_980._0_4_);
                auVar237._8_4_ = 0x7fffffff;
                auVar237._0_8_ = 0x7fffffff7fffffff;
                auVar237._12_4_ = 0x7fffffff;
              }
              auVar371 = ZEXT464(uVar100);
              auVar358 = ZEXT464((uint)fVar150);
              auVar119 = vminps_avx(_local_b10,_local_b30);
              auVar158 = vmaxps_avx(_local_b10,_local_b30);
              auVar114 = vminps_avx(_local_b20,_local_b40);
              auVar121 = vminps_avx(auVar119,auVar114);
              auVar119 = vmaxps_avx(_local_b20,_local_b40);
              auVar114 = vmaxps_avx(auVar158,auVar119);
              auVar158 = vandps_avx(auVar121,auVar237);
              auVar119 = vandps_avx(auVar114,auVar237);
              auVar158 = vmaxps_avx(auVar158,auVar119);
              auVar119 = vmovshdup_avx(auVar158);
              auVar119 = vmaxss_avx(auVar119,auVar158);
              auVar158 = vshufpd_avx(auVar158,auVar158,1);
              auVar158 = vmaxss_avx(auVar158,auVar119);
              local_940 = auVar158._0_4_ * 1.9073486e-06;
              local_7a0._0_4_ = fVar185 * 1.9073486e-06;
              local_7c0._0_16_ = vshufps_avx(auVar114,auVar114,0xff);
              lVar106 = 5;
              do {
                fVar226 = auVar358._0_4_;
                fVar213 = 1.0 - fVar226;
                fVar150 = fVar213 * fVar213 * fVar213;
                fVar185 = fVar226 * fVar226 * fVar226;
                fVar187 = fVar226 * fVar213;
                auVar158 = vshufps_avx(ZEXT416((uint)(fVar185 * 0.16666667)),
                                       ZEXT416((uint)(fVar185 * 0.16666667)),0);
                auVar119 = ZEXT416((uint)((fVar185 * 4.0 + fVar150 +
                                          fVar226 * fVar187 * 12.0 + fVar213 * fVar187 * 6.0) *
                                         0.16666667));
                auVar119 = vshufps_avx(auVar119,auVar119,0);
                auVar114 = ZEXT416((uint)((fVar150 * 4.0 + fVar185 +
                                          fVar213 * fVar187 * 12.0 + fVar226 * fVar187 * 6.0) *
                                         0.16666667));
                auVar114 = vshufps_avx(auVar114,auVar114,0);
                auVar121 = vshufps_avx(auVar371._0_16_,auVar371._0_16_,0);
                auVar198._0_4_ = auVar121._0_4_ * (float)local_970._0_4_ + 0.0;
                auVar198._4_4_ = auVar121._4_4_ * (float)local_970._4_4_ + 0.0;
                auVar198._8_4_ = auVar121._8_4_ * fStack_968 + 0.0;
                auVar198._12_4_ = auVar121._12_4_ * fStack_964 + 0.0;
                auVar121 = vshufps_avx(ZEXT416((uint)(fVar150 * 0.16666667)),
                                       ZEXT416((uint)(fVar150 * 0.16666667)),0);
                auVar118._0_4_ =
                     auVar121._0_4_ * (float)local_b10._0_4_ +
                     auVar114._0_4_ * (float)local_b30._0_4_ +
                     auVar158._0_4_ * (float)local_b40._0_4_ +
                     auVar119._0_4_ * (float)local_b20._0_4_;
                auVar118._4_4_ =
                     auVar121._4_4_ * (float)local_b10._4_4_ +
                     auVar114._4_4_ * (float)local_b30._4_4_ +
                     auVar158._4_4_ * (float)local_b40._4_4_ +
                     auVar119._4_4_ * (float)local_b20._4_4_;
                auVar118._8_4_ =
                     auVar121._8_4_ * fStack_b08 +
                     auVar114._8_4_ * fStack_b28 +
                     auVar158._8_4_ * fStack_b38 + auVar119._8_4_ * fStack_b18;
                auVar118._12_4_ =
                     auVar121._12_4_ * fStack_b04 +
                     auVar114._12_4_ * fStack_b24 +
                     auVar158._12_4_ * fStack_b34 + auVar119._12_4_ * fStack_b14;
                local_960._0_16_ = auVar118;
                auVar158 = vsubps_avx(auVar198,auVar118);
                _local_ae0 = auVar158;
                auVar158 = vdpps_avx(auVar158,auVar158,0x7f);
                fVar150 = auVar158._0_4_;
                if (fVar150 < 0.0) {
                  auVar283._0_4_ = sqrtf(fVar150);
                  auVar283._4_60_ = extraout_var;
                  auVar119 = auVar283._0_16_;
                }
                else {
                  auVar119 = vsqrtss_avx(auVar158,auVar158);
                }
                auVar366 = ZEXT1664(auVar119);
                auVar114 = ZEXT416((uint)(fVar226 * fVar226 * 0.5));
                auVar114 = vshufps_avx(auVar114,auVar114,0);
                auVar121 = ZEXT416((uint)((fVar213 * fVar213 + fVar187 * 4.0) * 0.5));
                auVar121 = vshufps_avx(auVar121,auVar121,0);
                auVar113 = ZEXT416((uint)((fVar226 * -fVar226 - fVar187 * 4.0) * 0.5));
                auVar113 = vshufps_avx(auVar113,auVar113,0);
                auVar120 = ZEXT416((uint)(fVar213 * -fVar213 * 0.5));
                auVar120 = vshufps_avx(auVar120,auVar120,0);
                auVar336._0_4_ =
                     (float)local_b10._0_4_ * auVar120._0_4_ +
                     (float)local_b30._0_4_ * auVar113._0_4_ +
                     (float)local_b40._0_4_ * auVar114._0_4_ +
                     (float)local_b20._0_4_ * auVar121._0_4_;
                auVar336._4_4_ =
                     (float)local_b10._4_4_ * auVar120._4_4_ +
                     (float)local_b30._4_4_ * auVar113._4_4_ +
                     (float)local_b40._4_4_ * auVar114._4_4_ +
                     (float)local_b20._4_4_ * auVar121._4_4_;
                auVar336._8_4_ =
                     fStack_b08 * auVar120._8_4_ +
                     fStack_b28 * auVar113._8_4_ +
                     fStack_b38 * auVar114._8_4_ + fStack_b18 * auVar121._8_4_;
                auVar336._12_4_ =
                     fStack_b04 * auVar120._12_4_ +
                     fStack_b24 * auVar113._12_4_ +
                     fStack_b34 * auVar114._12_4_ + fStack_b14 * auVar121._12_4_;
                auVar114 = vshufps_avx(auVar358._0_16_,auVar358._0_16_,0);
                auVar121 = ZEXT416((uint)(fVar213 - (fVar226 + fVar226)));
                auVar113 = vshufps_avx(auVar121,auVar121,0);
                auVar121 = ZEXT416((uint)(fVar226 - (fVar213 + fVar213)));
                auVar120 = vshufps_avx(auVar121,auVar121,0);
                auVar19 = vshufps_avx(ZEXT416((uint)fVar213),ZEXT416((uint)fVar213),0);
                auVar121 = vdpps_avx(auVar336,auVar336,0x7f);
                auVar161._0_4_ =
                     (float)local_b10._0_4_ * auVar19._0_4_ +
                     (float)local_b30._0_4_ * auVar120._0_4_ +
                     (float)local_b40._0_4_ * auVar114._0_4_ +
                     (float)local_b20._0_4_ * auVar113._0_4_;
                auVar161._4_4_ =
                     (float)local_b10._4_4_ * auVar19._4_4_ +
                     (float)local_b30._4_4_ * auVar120._4_4_ +
                     (float)local_b40._4_4_ * auVar114._4_4_ +
                     (float)local_b20._4_4_ * auVar113._4_4_;
                auVar161._8_4_ =
                     fStack_b08 * auVar19._8_4_ +
                     fStack_b28 * auVar120._8_4_ +
                     fStack_b38 * auVar114._8_4_ + fStack_b18 * auVar113._8_4_;
                auVar161._12_4_ =
                     fStack_b04 * auVar19._12_4_ +
                     fStack_b24 * auVar120._12_4_ +
                     fStack_b34 * auVar114._12_4_ + fStack_b14 * auVar113._12_4_;
                auVar114 = vblendps_avx(auVar121,_DAT_01feba10,0xe);
                auVar113 = vrsqrtss_avx(auVar114,auVar114);
                fVar187 = auVar113._0_4_;
                fVar185 = auVar121._0_4_;
                auVar113 = vdpps_avx(auVar336,auVar161,0x7f);
                auVar120 = vshufps_avx(auVar121,auVar121,0);
                auVar162._0_4_ = auVar161._0_4_ * auVar120._0_4_;
                auVar162._4_4_ = auVar161._4_4_ * auVar120._4_4_;
                auVar162._8_4_ = auVar161._8_4_ * auVar120._8_4_;
                auVar162._12_4_ = auVar161._12_4_ * auVar120._12_4_;
                auVar113 = vshufps_avx(auVar113,auVar113,0);
                auVar238._0_4_ = auVar336._0_4_ * auVar113._0_4_;
                auVar238._4_4_ = auVar336._4_4_ * auVar113._4_4_;
                auVar238._8_4_ = auVar336._8_4_ * auVar113._8_4_;
                auVar238._12_4_ = auVar336._12_4_ * auVar113._12_4_;
                auVar19 = vsubps_avx(auVar162,auVar238);
                auVar113 = vrcpss_avx(auVar114,auVar114);
                auVar114 = vmaxss_avx(ZEXT416((uint)local_940),
                                      ZEXT416((uint)(auVar371._0_4_ * (float)local_7a0._0_4_)));
                auVar384 = ZEXT1664(auVar114);
                auVar113 = ZEXT416((uint)(auVar113._0_4_ * (2.0 - fVar185 * auVar113._0_4_)));
                auVar113 = vshufps_avx(auVar113,auVar113,0);
                uVar105 = CONCAT44(auVar336._4_4_,auVar336._0_4_);
                auVar254._0_8_ = uVar105 ^ 0x8000000080000000;
                auVar254._8_4_ = -auVar336._8_4_;
                auVar254._12_4_ = -auVar336._12_4_;
                auVar120 = ZEXT416((uint)(fVar187 * 1.5 +
                                         fVar185 * -0.5 * fVar187 * fVar187 * fVar187));
                auVar120 = vshufps_avx(auVar120,auVar120,0);
                auVar219._0_4_ = auVar120._0_4_ * auVar19._0_4_ * auVar113._0_4_;
                auVar219._4_4_ = auVar120._4_4_ * auVar19._4_4_ * auVar113._4_4_;
                auVar219._8_4_ = auVar120._8_4_ * auVar19._8_4_ * auVar113._8_4_;
                auVar219._12_4_ = auVar120._12_4_ * auVar19._12_4_ * auVar113._12_4_;
                auVar277._0_4_ = auVar336._0_4_ * auVar120._0_4_;
                auVar277._4_4_ = auVar336._4_4_ * auVar120._4_4_;
                auVar277._8_4_ = auVar336._8_4_ * auVar120._8_4_;
                auVar277._12_4_ = auVar336._12_4_ * auVar120._12_4_;
                if (fVar185 < 0.0) {
                  local_a80._0_16_ = auVar277;
                  local_aa0._0_16_ = auVar219;
                  fVar185 = sqrtf(fVar185);
                  auVar366 = ZEXT464(auVar119._0_4_);
                  auVar384 = ZEXT464(auVar114._0_4_);
                  auVar219 = local_aa0._0_16_;
                  auVar277 = local_a80._0_16_;
                }
                else {
                  auVar119 = vsqrtss_avx(auVar121,auVar121);
                  fVar185 = auVar119._0_4_;
                }
                auVar119 = vdpps_avx(_local_ae0,auVar277,0x7f);
                fVar185 = (local_940 / fVar185) * (auVar366._0_4_ + 1.0) +
                          auVar384._0_4_ + auVar366._0_4_ * local_940;
                auVar121 = vdpps_avx(auVar254,auVar277,0x7f);
                auVar113 = vdpps_avx(_local_ae0,auVar219,0x7f);
                auVar120 = vdpps_avx(_local_970,auVar277,0x7f);
                auVar19 = vdpps_avx(_local_ae0,auVar254,0x7f);
                fVar187 = auVar121._0_4_ + auVar113._0_4_;
                fVar213 = auVar119._0_4_;
                auVar122._0_4_ = fVar213 * fVar213;
                auVar122._4_4_ = auVar119._4_4_ * auVar119._4_4_;
                auVar122._8_4_ = auVar119._8_4_ * auVar119._8_4_;
                auVar122._12_4_ = auVar119._12_4_ * auVar119._12_4_;
                auVar113 = vsubps_avx(auVar158,auVar122);
                auVar121 = vdpps_avx(_local_ae0,_local_970,0x7f);
                fVar227 = auVar19._0_4_ - fVar213 * fVar187;
                fVar228 = auVar121._0_4_ - fVar213 * auVar120._0_4_;
                auVar121 = vrsqrtss_avx(auVar113,auVar113);
                fVar229 = auVar113._0_4_;
                fVar213 = auVar121._0_4_;
                fVar213 = fVar213 * 1.5 + fVar229 * -0.5 * fVar213 * fVar213 * fVar213;
                if (fVar229 < 0.0) {
                  local_a80._0_4_ = fVar185;
                  local_aa0._0_16_ = auVar120;
                  local_9c0._0_4_ = fVar227;
                  local_ac0._0_4_ = fVar228;
                  local_9e0._0_4_ = fVar213;
                  auVar366 = ZEXT1664(auVar366._0_16_);
                  fVar229 = sqrtf(fVar229);
                  auVar384 = ZEXT464(auVar114._0_4_);
                  fVar213 = (float)local_9e0._0_4_;
                  fVar227 = (float)local_9c0._0_4_;
                  fVar228 = (float)local_ac0._0_4_;
                  auVar120 = local_aa0._0_16_;
                  fVar185 = (float)local_a80._0_4_;
                }
                else {
                  auVar114 = vsqrtss_avx(auVar113,auVar113);
                  fVar229 = auVar114._0_4_;
                }
                auVar318 = ZEXT1664(auVar158);
                auVar113 = vpermilps_avx(local_960._0_16_,0xff);
                auVar19 = vshufps_avx(auVar336,auVar336,0xff);
                fVar246 = fVar227 * fVar213 - auVar19._0_4_;
                auVar239._0_8_ = auVar120._0_8_ ^ 0x8000000080000000;
                auVar239._8_4_ = auVar120._8_4_ ^ 0x80000000;
                auVar239._12_4_ = auVar120._12_4_ ^ 0x80000000;
                auVar255._0_4_ = -fVar246;
                auVar255._4_4_ = 0x80000000;
                auVar255._8_4_ = 0x80000000;
                auVar255._12_4_ = 0x80000000;
                fVar227 = fVar187 * fVar228 * fVar213;
                auVar283 = ZEXT464((uint)fVar227);
                auVar114 = vinsertps_avx(ZEXT416((uint)(fVar228 * fVar213)),auVar239,0x10);
                auVar121 = vmovsldup_avx(ZEXT416((uint)(fVar227 - auVar120._0_4_ * fVar246)));
                auVar114 = vdivps_avx(auVar114,auVar121);
                auVar120 = ZEXT416((uint)(fVar229 - auVar113._0_4_));
                auVar113 = vinsertps_avx(auVar119,auVar120,0x10);
                auVar220._0_4_ = auVar113._0_4_ * auVar114._0_4_;
                auVar220._4_4_ = auVar113._4_4_ * auVar114._4_4_;
                auVar220._8_4_ = auVar113._8_4_ * auVar114._8_4_;
                auVar220._12_4_ = auVar113._12_4_ * auVar114._12_4_;
                auVar114 = vinsertps_avx(auVar255,ZEXT416((uint)fVar187),0x1c);
                auVar114 = vdivps_avx(auVar114,auVar121);
                auVar121 = vhaddps_avx(auVar220,auVar220);
                auVar199._0_4_ = auVar113._0_4_ * auVar114._0_4_;
                auVar199._4_4_ = auVar113._4_4_ * auVar114._4_4_;
                auVar199._8_4_ = auVar113._8_4_ * auVar114._8_4_;
                auVar199._12_4_ = auVar113._12_4_ * auVar114._12_4_;
                auVar114 = vhaddps_avx(auVar199,auVar199);
                fVar226 = fVar226 - auVar121._0_4_;
                fVar187 = auVar371._0_4_ - auVar114._0_4_;
                auVar371 = ZEXT464((uint)fVar187);
                auVar240._8_4_ = 0x7fffffff;
                auVar240._0_8_ = 0x7fffffff7fffffff;
                auVar240._12_4_ = 0x7fffffff;
                auVar245 = ZEXT1664(auVar240);
                auVar119 = vandps_avx(auVar119,auVar240);
                bVar73 = true;
                if (auVar119._0_4_ < fVar185) {
                  auVar119 = vandps_avx(auVar120,auVar240);
                  if (auVar119._0_4_ <
                      (float)local_7c0._0_4_ * 1.9073486e-06 + auVar384._0_4_ + fVar185) {
                    fVar187 = fVar187 + (float)local_8f0._0_4_;
                    auVar371 = ZEXT464((uint)fVar187);
                    if ((((fVar149 <= fVar187) &&
                         (fVar185 = *(float *)(ray + k * 4 + 0x100), fVar187 <= fVar185)) &&
                        (0.0 <= fVar226)) && (fVar226 <= 1.0)) {
                      auVar119 = vrsqrtss_avx(auVar158,auVar158);
                      fVar213 = auVar119._0_4_;
                      pGVar12 = (context->scene->geometries).items[local_a38].ptr;
                      if ((pGVar12->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar12->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                          uVar98 = 1;
                        }
                        else {
                          auVar119 = ZEXT416((uint)(fVar213 * 1.5 +
                                                   fVar150 * -0.5 * fVar213 * fVar213 * fVar213));
                          auVar119 = vshufps_avx(auVar119,auVar119,0);
                          auVar163._0_4_ = auVar119._0_4_ * (float)local_ae0._0_4_;
                          auVar163._4_4_ = auVar119._4_4_ * (float)local_ae0._4_4_;
                          auVar163._8_4_ = auVar119._8_4_ * fStack_ad8;
                          auVar163._12_4_ = auVar119._12_4_ * fStack_ad4;
                          auVar123._0_4_ = auVar336._0_4_ + auVar19._0_4_ * auVar163._0_4_;
                          auVar123._4_4_ = auVar336._4_4_ + auVar19._4_4_ * auVar163._4_4_;
                          auVar123._8_4_ = auVar336._8_4_ + auVar19._8_4_ * auVar163._8_4_;
                          auVar123._12_4_ = auVar336._12_4_ + auVar19._12_4_ * auVar163._12_4_;
                          auVar119 = vshufps_avx(auVar163,auVar163,0xc9);
                          auVar114 = vshufps_avx(auVar336,auVar336,0xc9);
                          auVar164._0_4_ = auVar114._0_4_ * auVar163._0_4_;
                          auVar164._4_4_ = auVar114._4_4_ * auVar163._4_4_;
                          auVar164._8_4_ = auVar114._8_4_ * auVar163._8_4_;
                          auVar164._12_4_ = auVar114._12_4_ * auVar163._12_4_;
                          auVar200._0_4_ = auVar336._0_4_ * auVar119._0_4_;
                          auVar200._4_4_ = auVar336._4_4_ * auVar119._4_4_;
                          auVar200._8_4_ = auVar336._8_4_ * auVar119._8_4_;
                          auVar200._12_4_ = auVar336._12_4_ * auVar119._12_4_;
                          auVar121 = vsubps_avx(auVar200,auVar164);
                          auVar119 = vshufps_avx(auVar121,auVar121,0xc9);
                          auVar114 = vshufps_avx(auVar123,auVar123,0xc9);
                          auVar201._0_4_ = auVar114._0_4_ * auVar119._0_4_;
                          auVar201._4_4_ = auVar114._4_4_ * auVar119._4_4_;
                          auVar201._8_4_ = auVar114._8_4_ * auVar119._8_4_;
                          auVar201._12_4_ = auVar114._12_4_ * auVar119._12_4_;
                          auVar119 = vshufps_avx(auVar121,auVar121,0xd2);
                          auVar124._0_4_ = auVar123._0_4_ * auVar119._0_4_;
                          auVar124._4_4_ = auVar123._4_4_ * auVar119._4_4_;
                          auVar124._8_4_ = auVar123._8_4_ * auVar119._8_4_;
                          auVar124._12_4_ = auVar123._12_4_ * auVar119._12_4_;
                          auVar119 = vsubps_avx(auVar201,auVar124);
                          pRVar16 = context->user;
                          local_590 = vshufps_avx(ZEXT416((uint)fVar226),ZEXT416((uint)fVar226),0);
                          auStack_5f0 = vshufps_avx(auVar119,auVar119,0x55);
                          local_5d0 = vshufps_avx(auVar119,auVar119,0xaa);
                          local_5b0 = vshufps_avx(auVar119,auVar119,0);
                          local_600 = (RTCHitN  [16])auStack_5f0;
                          local_5e0 = local_5d0;
                          local_5c0 = local_5b0;
                          local_5a0 = local_590;
                          local_580 = ZEXT832(0) << 0x20;
                          local_560 = local_4e0._0_8_;
                          uStack_558 = local_4e0._8_8_;
                          uStack_550 = local_4e0._16_8_;
                          uStack_548 = local_4e0._24_8_;
                          local_540 = local_4c0._0_8_;
                          uStack_538 = local_4c0._8_8_;
                          uStack_530 = local_4c0._16_8_;
                          uStack_528 = local_4c0._24_8_;
                          local_a40[1] = local_a00;
                          *local_a40 = local_a00;
                          local_520 = pRVar16->instID[0];
                          uStack_51c = local_520;
                          uStack_518 = local_520;
                          uStack_514 = local_520;
                          uStack_510 = local_520;
                          uStack_50c = local_520;
                          uStack_508 = local_520;
                          uStack_504 = local_520;
                          local_500 = pRVar16->instPrimID[0];
                          uStack_4fc = local_500;
                          uStack_4f8 = local_500;
                          uStack_4f4 = local_500;
                          uStack_4f0 = local_500;
                          uStack_4ec = local_500;
                          uStack_4e8 = local_500;
                          uStack_4e4 = local_500;
                          *(float *)(ray + k * 4 + 0x100) = fVar187;
                          local_b60 = *local_a48;
                          uStack_b58 = local_a48[1];
                          local_b50 = *local_a50;
                          uStack_b48 = local_a50[1];
                          local_a30.valid = (int *)&local_b60;
                          local_a30.geometryUserPtr = pGVar12->userPtr;
                          local_a30.context = context->user;
                          local_a30.hit = local_600;
                          local_a30.N = 8;
                          local_a30.ray = (RTCRayN *)ray;
                          if (pGVar12->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                            auVar283 = ZEXT464((uint)fVar227);
                            auVar318 = ZEXT1664(auVar158);
                            auVar366 = ZEXT1664(auVar366._0_16_);
                            auVar384 = ZEXT1664(auVar384._0_16_);
                            (*pGVar12->occlusionFilterN)(&local_a30);
                            auVar245 = ZEXT1664(CONCAT412(0x7fffffff,
                                                          CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                          }
                          auVar87._8_8_ = uStack_b58;
                          auVar87._0_8_ = local_b60;
                          auVar158 = vpcmpeqd_avx((undefined1  [16])0x0,auVar87);
                          auVar91._8_8_ = uStack_b48;
                          auVar91._0_8_ = local_b50;
                          auVar119 = vpcmpeqd_avx((undefined1  [16])0x0,auVar91);
                          auVar136._16_16_ = auVar119;
                          auVar136._0_16_ = auVar158;
                          auVar131 = local_a00 & ~auVar136;
                          if ((((((((auVar131 >> 0x1f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0 &&
                                   (auVar131 >> 0x3f & (undefined1  [32])0x1) ==
                                   (undefined1  [32])0x0) &&
                                  (auVar131 >> 0x5f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) && SUB321(auVar131 >> 0x7f,0) == '\0') &&
                                (auVar131 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0)
                               && SUB321(auVar131 >> 0xbf,0) == '\0') &&
                              (auVar131 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0)
                              && -1 < auVar131[0x1f]) {
                            auVar137._0_4_ = auVar158._0_4_ ^ local_a00._0_4_;
                            auVar137._4_4_ = auVar158._4_4_ ^ local_a00._4_4_;
                            auVar137._8_4_ = auVar158._8_4_ ^ local_a00._8_4_;
                            auVar137._12_4_ = auVar158._12_4_ ^ local_a00._12_4_;
                            auVar137._16_4_ = auVar119._0_4_ ^ local_a00._16_4_;
                            auVar137._20_4_ = auVar119._4_4_ ^ local_a00._20_4_;
                            auVar137._24_4_ = auVar119._8_4_ ^ local_a00._24_4_;
                            auVar137._28_4_ = auVar119._12_4_ ^ local_a00._28_4_;
                          }
                          else {
                            p_Var17 = context->args->filter;
                            if ((p_Var17 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar12->field_8).field_0x2 & 0x40) != 0)))) {
                              auVar283 = ZEXT1664(auVar283._0_16_);
                              auVar318 = ZEXT1664(auVar318._0_16_);
                              auVar366 = ZEXT1664(auVar366._0_16_);
                              auVar384 = ZEXT1664(auVar384._0_16_);
                              (*p_Var17)(&local_a30);
                              auVar245 = ZEXT1664(CONCAT412(0x7fffffff,
                                                            CONCAT48(0x7fffffff,0x7fffffff7fffffff))
                                                 );
                            }
                            auVar88._8_8_ = uStack_b58;
                            auVar88._0_8_ = local_b60;
                            auVar158 = vpcmpeqd_avx((undefined1  [16])0x0,auVar88);
                            auVar92._8_8_ = uStack_b48;
                            auVar92._0_8_ = local_b50;
                            auVar119 = vpcmpeqd_avx((undefined1  [16])0x0,auVar92);
                            auVar183._16_16_ = auVar119;
                            auVar183._0_16_ = auVar158;
                            auVar137._0_4_ = auVar158._0_4_ ^ local_a00._0_4_;
                            auVar137._4_4_ = auVar158._4_4_ ^ local_a00._4_4_;
                            auVar137._8_4_ = auVar158._8_4_ ^ local_a00._8_4_;
                            auVar137._12_4_ = auVar158._12_4_ ^ local_a00._12_4_;
                            auVar137._16_4_ = auVar119._0_4_ ^ local_a00._16_4_;
                            auVar137._20_4_ = auVar119._4_4_ ^ local_a00._20_4_;
                            auVar137._24_4_ = auVar119._8_4_ ^ local_a00._24_4_;
                            auVar137._28_4_ = auVar119._12_4_ ^ local_a00._28_4_;
                            auVar207._8_4_ = 0xff800000;
                            auVar207._0_8_ = 0xff800000ff800000;
                            auVar207._12_4_ = 0xff800000;
                            auVar207._16_4_ = 0xff800000;
                            auVar207._20_4_ = 0xff800000;
                            auVar207._24_4_ = 0xff800000;
                            auVar207._28_4_ = 0xff800000;
                            auVar131 = vblendvps_avx(auVar207,*(undefined1 (*) [32])
                                                               (local_a30.ray + 0x100),auVar183);
                            *(undefined1 (*) [32])(local_a30.ray + 0x100) = auVar131;
                          }
                          bVar80 = (auVar137 >> 0x1f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0;
                          bVar81 = (auVar137 >> 0x3f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0;
                          bVar79 = (auVar137 >> 0x5f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0;
                          bVar78 = SUB321(auVar137 >> 0x7f,0) != '\0';
                          bVar77 = (auVar137 & (undefined1  [32])0x100000000) !=
                                   (undefined1  [32])0x0;
                          bVar76 = SUB321(auVar137 >> 0xbf,0) != '\0';
                          bVar74 = (auVar137 & (undefined1  [32])0x100000000) !=
                                   (undefined1  [32])0x0;
                          bVar73 = auVar137[0x1f] < '\0';
                          uVar98 = (ulong)(((((((bVar80 || bVar81) || bVar79) || bVar78) || bVar77)
                                            || bVar76) || bVar74) || bVar73);
                          if (((((((!bVar80 && !bVar81) && !bVar79) && !bVar78) && !bVar77) &&
                               !bVar76) && !bVar74) && !bVar73) {
                            *(float *)(ray + k * 4 + 0x100) = fVar185;
                          }
                        }
                        auVar371 = ZEXT464((uint)fVar187);
                        bVar73 = false;
                        goto LAB_01017e19;
                      }
                    }
                    bVar73 = false;
                    uVar98 = 0;
                  }
                }
LAB_01017e19:
                auVar358 = ZEXT464((uint)fVar226);
                bVar101 = (byte)uVar98;
                if (!bVar73) goto LAB_0101818c;
                lVar106 = lVar106 + -1;
              } while (lVar106 != 0);
              bVar101 = 0;
LAB_0101818c:
              uVar98 = (ulong)(bVar101 & 1);
              uVar104 = CONCAT71(local_820._1_7_,local_820[0] | bVar101 & 1);
              uVar8 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar138._4_4_ = uVar8;
              auVar138._0_4_ = uVar8;
              auVar138._8_4_ = uVar8;
              auVar138._12_4_ = uVar8;
              auVar138._16_4_ = uVar8;
              auVar138._20_4_ = uVar8;
              auVar138._24_4_ = uVar8;
              auVar138._28_4_ = uVar8;
              auVar126 = vcmpps_avx(_local_800,auVar138,2);
              auVar131 = vandps_avx(auVar126,local_720);
              local_720 = local_720 & auVar126;
              uVar105 = local_740;
            } while ((((((((local_720 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (local_720 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (local_720 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(local_720 >> 0x7f,0) != '\0') ||
                       (local_720 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(local_720 >> 0xbf,0) != '\0') ||
                     (local_720 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     local_720[0x1f] < '\0');
          }
          auVar131 = vandps_avx(local_6a0,local_680);
          auVar126 = vandps_avx(_local_880,_local_860);
          auVar208._0_4_ = (float)local_9a0._0_4_ + local_340._0_4_;
          auVar208._4_4_ = (float)local_9a0._4_4_ + local_340._4_4_;
          auVar208._8_4_ = fStack_998 + local_340._8_4_;
          auVar208._12_4_ = fStack_994 + local_340._12_4_;
          auVar208._16_4_ = fStack_990 + local_340._16_4_;
          auVar208._20_4_ = fStack_98c + local_340._20_4_;
          auVar208._24_4_ = fStack_988 + local_340._24_4_;
          auVar208._28_4_ = fStack_984 + local_340._28_4_;
          uVar8 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar244._4_4_ = uVar8;
          auVar244._0_4_ = uVar8;
          auVar244._8_4_ = uVar8;
          auVar244._12_4_ = uVar8;
          auVar244._16_4_ = uVar8;
          auVar244._20_4_ = uVar8;
          auVar244._24_4_ = uVar8;
          auVar244._28_4_ = uVar8;
          auVar25 = vcmpps_avx(auVar208,auVar244,2);
          auVar131 = vandps_avx(auVar25,auVar131);
          auVar261._0_4_ = (float)local_9a0._0_4_ + local_300._0_4_;
          auVar261._4_4_ = (float)local_9a0._4_4_ + local_300._4_4_;
          auVar261._8_4_ = fStack_998 + local_300._8_4_;
          auVar261._12_4_ = fStack_994 + local_300._12_4_;
          auVar261._16_4_ = fStack_990 + local_300._16_4_;
          auVar261._20_4_ = fStack_98c + local_300._20_4_;
          auVar261._24_4_ = fStack_988 + local_300._24_4_;
          auVar261._28_4_ = fStack_984 + local_300._28_4_;
          auVar25 = vcmpps_avx(auVar261,auVar244,2);
          auVar126 = vandps_avx(auVar25,auVar126);
          auVar126 = vorps_avx(auVar131,auVar126);
          if ((((((((auVar126 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar126 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar126 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar126 >> 0x7f,0) != '\0') ||
                (auVar126 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar126 >> 0xbf,0) != '\0') ||
              (auVar126 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar126[0x1f] < '\0') {
            uVar99 = (ulong)uVar96;
            *(undefined1 (*) [32])(auStack_180 + uVar99 * 0x60) = auVar126;
            auVar131 = vblendvps_avx(_local_300,_local_340,auVar131);
            *(undefined1 (*) [32])(auStack_160 + uVar99 * 0x60) = auVar131;
            uVar9 = vmovlps_avx(local_8e0);
            *(undefined8 *)(afStack_140 + uVar99 * 0x18) = uVar9;
            auStack_138[uVar99 * 0x18] = (int)uVar105 + 1;
            uVar96 = uVar96 + 1;
          }
        }
      }
    }
    do {
      if (uVar96 == 0) {
        if ((uVar104 & 1) != 0) {
          return local_c89;
        }
        uVar8 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar125._4_4_ = uVar8;
        auVar125._0_4_ = uVar8;
        auVar125._8_4_ = uVar8;
        auVar125._12_4_ = uVar8;
        auVar155 = vcmpps_avx(local_610,auVar125,2);
        uVar96 = vmovmskps_avx(auVar155);
        uVar96 = (uint)local_8c8 - 1 & (uint)local_8c8 & uVar96;
        local_c89 = uVar96 != 0;
        if (!local_c89) {
          return local_c89;
        }
        goto LAB_01015759;
      }
      uVar100 = uVar96 - 1;
      uVar99 = (ulong)uVar100;
      lVar106 = uVar99 * 0x60;
      auVar131 = *(undefined1 (*) [32])(auStack_160 + lVar106);
      auVar139._0_4_ = (float)local_9a0._0_4_ + auVar131._0_4_;
      auVar139._4_4_ = (float)local_9a0._4_4_ + auVar131._4_4_;
      auVar139._8_4_ = fStack_998 + auVar131._8_4_;
      auVar139._12_4_ = fStack_994 + auVar131._12_4_;
      auVar139._16_4_ = fStack_990 + auVar131._16_4_;
      auVar139._20_4_ = fStack_98c + auVar131._20_4_;
      auVar139._24_4_ = fStack_988 + auVar131._24_4_;
      auVar139._28_4_ = fStack_984 + auVar131._28_4_;
      uVar8 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar225._4_4_ = uVar8;
      auVar225._0_4_ = uVar8;
      auVar225._8_4_ = uVar8;
      auVar225._12_4_ = uVar8;
      auVar225._16_4_ = uVar8;
      auVar225._20_4_ = uVar8;
      auVar225._24_4_ = uVar8;
      auVar225._28_4_ = uVar8;
      auVar25 = vcmpps_avx(auVar139,auVar225,2);
      auVar126 = vandps_avx(auVar25,*(undefined1 (*) [32])(auStack_180 + lVar106));
      _local_600 = auVar126;
      auVar25 = *(undefined1 (*) [32])(auStack_180 + lVar106) & auVar25;
      bVar80 = (auVar25 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar81 = (auVar25 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar79 = (auVar25 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar78 = SUB321(auVar25 >> 0x7f,0) == '\0';
      bVar77 = (auVar25 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar76 = SUB321(auVar25 >> 0xbf,0) == '\0';
      bVar74 = (auVar25 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar73 = -1 < auVar25[0x1f];
      if (((((((!bVar80 || !bVar81) || !bVar79) || !bVar78) || !bVar77) || !bVar76) || !bVar74) ||
          !bVar73) {
        auVar209._8_4_ = 0x7f800000;
        auVar209._0_8_ = 0x7f8000007f800000;
        auVar209._12_4_ = 0x7f800000;
        auVar209._16_4_ = 0x7f800000;
        auVar209._20_4_ = 0x7f800000;
        auVar209._24_4_ = 0x7f800000;
        auVar209._28_4_ = 0x7f800000;
        auVar131 = vblendvps_avx(auVar209,auVar131,auVar126);
        auVar25 = vshufps_avx(auVar131,auVar131,0xb1);
        auVar25 = vminps_avx(auVar131,auVar25);
        auVar167 = vshufpd_avx(auVar25,auVar25,5);
        auVar25 = vminps_avx(auVar25,auVar167);
        auVar167 = vperm2f128_avx(auVar25,auVar25,1);
        auVar25 = vminps_avx(auVar25,auVar167);
        auVar131 = vcmpps_avx(auVar131,auVar25,0);
        auVar25 = auVar126 & auVar131;
        if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar25 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar25 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar25 >> 0x7f,0) != '\0') ||
              (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar25 >> 0xbf,0) != '\0') ||
            (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar25[0x1f] < '\0') {
          auVar126 = vandps_avx(auVar131,auVar126);
        }
        fVar150 = afStack_140[uVar99 * 0x18 + 1];
        uVar105 = (ulong)auStack_138[uVar99 * 0x18];
        uVar102 = vmovmskps_avx(auVar126);
        uVar97 = 0;
        if (uVar102 != 0) {
          for (; (uVar102 >> uVar97 & 1) == 0; uVar97 = uVar97 + 1) {
          }
        }
        fVar185 = afStack_140[uVar99 * 0x18];
        *(undefined4 *)(local_600 + (ulong)uVar97 * 4) = 0;
        *(undefined1 (*) [32])(auStack_180 + lVar106) = _local_600;
        if ((((((((_local_600 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (_local_600 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (_local_600 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(_local_600 >> 0x7f,0) != '\0') ||
              (_local_600 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(_local_600 >> 0xbf,0) != '\0') ||
            (_local_600 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            local_600[0x1f] < '\0') {
          uVar100 = uVar96;
        }
        auVar158 = vshufps_avx(ZEXT416((uint)(fVar150 - fVar185)),ZEXT416((uint)(fVar150 - fVar185))
                               ,0);
        local_340._4_4_ = fVar185 + auVar158._4_4_ * 0.14285715;
        local_340._0_4_ = fVar185 + auVar158._0_4_ * 0.0;
        fStack_338 = fVar185 + auVar158._8_4_ * 0.2857143;
        fStack_334 = fVar185 + auVar158._12_4_ * 0.42857146;
        fStack_330 = fVar185 + auVar158._0_4_ * 0.5714286;
        fStack_32c = fVar185 + auVar158._4_4_ * 0.71428573;
        fStack_328 = fVar185 + auVar158._8_4_ * 0.8571429;
        fStack_324 = fVar185 + auVar158._12_4_;
        local_8e0._8_8_ = 0;
        local_8e0._0_8_ = *(ulong *)(local_340 + (ulong)uVar97 * 4);
      }
      uVar96 = uVar100;
    } while (((((((bVar80 && bVar81) && bVar79) && bVar78) && bVar77) && bVar76) && bVar74) &&
             bVar73);
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }